

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Deconvolution_x86_avx::forward
          (Deconvolution_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  undefined4 uVar20;
  uint uVar21;
  _func_int *p_Var22;
  int *piVar23;
  void *pvVar24;
  size_t sVar25;
  size_t sVar26;
  size_t sVar27;
  size_t sVar28;
  _func_int **pp_Var29;
  _func_int **pp_Var30;
  _func_int **pp_Var31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  Mat *pMVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  _func_int *p_Var55;
  long lVar56;
  ulong uVar57;
  long lVar58;
  int iVar59;
  int iVar60;
  int w;
  int iVar61;
  int y_1;
  ulong uVar62;
  ulong uVar63;
  void *pvVar64;
  long lVar65;
  Allocator *pAVar66;
  ulong uVar67;
  int y;
  uint uVar68;
  ulong uVar69;
  int y_6;
  int iVar70;
  ulong uVar71;
  void *pvVar72;
  float fVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  float fVar86;
  float fVar115;
  float fVar116;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar117;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar148 [28];
  undefined1 auVar149 [28];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar150 [28];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar166;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar216;
  float fVar220;
  float fVar221;
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar222;
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar208 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar213 [32];
  float fVar214;
  float fVar215;
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 in_ZMM3 [64];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [64];
  undefined1 auVar239 [16];
  float fVar238;
  float fVar281;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  float fVar279;
  float fVar280;
  float fVar282;
  undefined1 in_ZMM7 [64];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [64];
  float fVar295;
  undefined1 auVar294 [64];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [64];
  float fVar310;
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  int outw_1;
  int outh_2;
  int outw;
  int outh;
  int h;
  int h_2;
  long local_1a0;
  Allocator *local_178;
  long local_160;
  uint local_154;
  void *local_140;
  Allocator *local_128;
  Mat local_c8;
  ulong local_78;
  _func_int **local_70;
  ulong local_68;
  int local_5c;
  Mat *local_58;
  Allocator *local_50;
  long local_48;
  long local_40;
  Option *local_38;
  undefined1 auVar204 [32];
  undefined1 auVar207 [32];
  undefined1 auVar209 [32];
  undefined1 auVar212 [32];
  undefined1 auVar268 [32];
  undefined1 auVar273 [32];
  undefined1 auVar278 [32];
  undefined1 auVar307 [64];
  undefined1 auVar308 [64];
  undefined1 auVar309 [64];
  
  iVar14 = bottom_blob->w;
  iVar15 = bottom_blob->h;
  uVar63 = bottom_blob->elemsize;
  iVar16 = bottom_blob->elempack;
  p_Var55 = this->_vptr_Deconvolution_x86_avx[-3];
  local_154 = 1;
  if (opt->use_packing_layout == true) {
    local_154 = 8;
    if ((*(uint *)(&this->field_0xd0 + (long)p_Var55) & 7) != 0) {
      local_154 = (uint)((*(uint *)(&this->field_0xd0 + (long)p_Var55) & 3) == 0) * 3 + 1;
    }
  }
  iVar60 = *(int *)(&this->field_0xd4 + (long)p_Var55);
  local_5c = *(int *)(&this->field_0xdc + (long)p_Var55);
  iVar54 = *(int *)(&this->field_0xe4 + (long)p_Var55);
  iVar59 = (*(int *)(&this->field_0xd8 + (long)p_Var55) + -1) *
           *(int *)(&this->field_0xe0 + (long)p_Var55);
  iVar17 = *(int *)(&this->field_0xe8 + (long)p_Var55);
  iVar70 = *(int *)(&this->field_0xfc + (long)p_Var55);
  iVar51 = *(int *)(&this->field_0x100 + (long)p_Var55);
  local_c8.cstep = 0;
  local_c8.data = (Allocator *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elempack = 0;
  p_Var22 = this->_vptr_Deconvolution_x86_avx[-3];
  p_Var55 = (_func_int *)((long)&this->_vptr_Deconvolution_x86_avx + (long)p_Var22);
  lVar65 = 0x10;
  local_c8.elemsize._4_4_ = (int)local_c8.refcount;
  local_c8.allocator = (Allocator *)local_c8.data;
  local_c8.dims = (int)local_c8.refcount;
  local_c8.w = local_c8.refcount._4_4_;
  local_c8.h = (int)local_c8.elemsize;
  local_c8.d = (int)local_c8.refcount;
  local_c8.c = local_c8.elempack;
  if (((((*(int *)(&this->field_0xec + (long)p_Var22) < 1) && (*(int *)(p_Var55 + 0xf0) < 1)) &&
       (*(int *)(p_Var55 + 0xf4) < 1)) && (*(int *)(p_Var55 + 0xf8) < 1)) &&
     ((*(int *)(p_Var55 + 0x104) < 1 || (*(int *)(p_Var55 + 0x108) < 1)))) {
    if (&local_c8 != top_blob) {
      piVar23 = top_blob->refcount;
      if (piVar23 != (int *)0x0) {
        LOCK();
        *piVar23 = *piVar23 + 1;
        UNLOCK();
      }
      local_c8.data = top_blob->data;
      local_c8.refcount._0_4_ = (int)top_blob->refcount;
      local_c8.refcount._4_4_ = (uint)((ulong)top_blob->refcount >> 0x20);
      local_c8.elemsize._0_4_ = (int)top_blob->elemsize;
      local_c8.elemsize._4_4_ = (int)(top_blob->elemsize >> 0x20);
      local_c8.elempack = top_blob->elempack;
      local_c8.allocator = top_blob->allocator;
      uVar10 = top_blob->dims;
      uVar11 = top_blob->w;
      uVar12 = top_blob->h;
      uVar13 = top_blob->d;
      local_c8.c = top_blob->c;
      local_c8.cstep = top_blob->cstep;
      local_c8.dims = uVar10;
      local_c8.w = uVar11;
      local_c8.h = uVar12;
      local_c8.d = uVar13;
    }
    p_Var55 = (_func_int *)
              ((long)&this->_vptr_Deconvolution_x86_avx +
              (long)this->_vptr_Deconvolution_x86_avx[-3]);
    lVar65 = 8;
  }
  local_5c = (iVar60 + -1) * local_5c;
  local_58 = top_blob;
  local_38 = opt;
  Mat::create(&local_c8,iVar70 + (iVar14 + -1) * iVar54 + local_5c + 1,
              iVar51 + (iVar15 + -1) * iVar17 + iVar59 + 1,*(int *)(p_Var55 + 0xd0) / (int)local_154
              ,(uVar63 / (ulong)(long)iVar16) * (ulong)local_154,local_154,
              *(Allocator **)(&opt->lightmode + lVar65));
  iVar15 = local_c8.h;
  iVar14 = local_c8.w;
  iVar60 = -100;
  if (((Allocator *)local_c8.data != (Allocator *)0x0) && ((long)local_c8.c * local_c8.cstep != 0))
  {
    local_70 = this->_vptr_Deconvolution_x86_avx;
    p_Var55 = local_70[-3];
    uVar18 = *(uint *)(&this->field_0xd4 + (long)p_Var55);
    local_68 = (ulong)uVar18;
    uVar19 = *(uint *)(&this->field_0xd8 + (long)p_Var55);
    local_78 = (ulong)uVar19;
    if ((iVar16 == 8) && ((local_154 == 8 && (0 < (long)local_c8.c)))) {
      iVar60 = *(int *)(&this->field_0xdc + (long)p_Var55);
      iVar54 = *(int *)(&this->field_0xe0 + (long)p_Var55);
      iVar17 = *(int *)(&this->field_0xe4 + (long)p_Var55);
      iVar70 = *(int *)(&this->field_0xe8 + (long)p_Var55);
      uVar20 = *(undefined4 *)(&this->field_0x114 + (long)p_Var55);
      lVar65 = *(long *)(&this->field_0x1a8 + (long)p_Var55);
      local_160 = 0;
      auVar293 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar294 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar237 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      do {
        if (0 < local_c8.h) {
          iVar51 = bottom_blob->w;
          iVar52 = bottom_blob->h;
          pAVar66 = (Allocator *)
                    ((long)local_c8.data +
                    local_c8.cstep * local_160 *
                    CONCAT44(local_c8.elemsize._4_4_,(int)local_c8.elemsize));
          uVar21 = bottom_blob->c;
          iVar61 = 0;
          do {
            if (0 < local_c8.w) {
              uVar68 = 0;
              iVar53 = (1 - uVar18) * iVar60;
              do {
                if (lVar65 == 0) {
                  auVar306 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar306 = ZEXT3264(*(undefined1 (*) [32])(lVar65 + local_160 * 0x20));
                }
                if (0 < (int)uVar21) {
                  pvVar72 = (void *)((this->weight_data_tm).cstep * local_160 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar24 = bottom_blob->data;
                  uVar63 = 0;
                  do {
                    if (0 < (int)uVar19) {
                      uVar71 = 0;
                      uVar69 = 0;
                      do {
                        iVar47 = (((int)uVar69 - uVar19) + 1) * iVar54 + iVar61;
                        if ((((-1 < iVar47) && (iVar48 = iVar47 / iVar70, iVar47 % iVar70 == 0)) &&
                            (0 < (int)uVar18)) && (iVar48 < iVar52)) {
                          lVar58 = (long)iVar48 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar63;
                          uVar62 = uVar71;
                          uVar67 = local_68;
                          iVar47 = iVar53;
                          do {
                            if (((-1 < iVar47) && (iVar48 = iVar47 / iVar17, iVar47 % iVar17 == 0))
                               && (iVar48 < iVar51)) {
                              lVar56 = (long)(iVar48 << 3);
                              fVar73 = *(float *)((long)pvVar24 + lVar56 * 4 + lVar58);
                              fVar86 = *(float *)((long)pvVar24 + lVar56 * 4 + lVar58 + 4);
                              fVar115 = *(float *)((long)pvVar24 + lVar56 * 4 + lVar58 + 8);
                              fVar116 = *(float *)((long)pvVar24 + lVar56 * 4 + lVar58 + 0xc);
                              fVar222 = *(float *)((long)pvVar24 + lVar56 * 4 + lVar58 + 0x10);
                              fVar117 = *(float *)((long)pvVar24 + lVar56 * 4 + lVar58 + 0x14);
                              fVar219 = *(float *)((long)pvVar24 + lVar56 * 4 + lVar58 + 0x18);
                              fVar221 = *(float *)((long)pvVar24 + lVar56 * 4 + lVar58 + 0x1c);
                              uVar57 = uVar62 & 0xffffffff;
                              pfVar1 = (float *)((long)pvVar72 + uVar57 * 4);
                              pfVar2 = (float *)((long)pvVar72 + uVar57 * 4 + 0x20);
                              pfVar3 = (float *)((long)pvVar72 + uVar57 * 4 + 0x40);
                              pfVar4 = (float *)((long)pvVar72 + uVar57 * 4 + 0x60);
                              pfVar5 = (float *)((long)pvVar72 + uVar57 * 4 + 0x80);
                              in_ZMM7 = ZEXT3264(CONCAT428(fVar116,CONCAT424(fVar222 * pfVar5[6],
                                                                             CONCAT420(fVar222 * 
                                                  pfVar5[5],
                                                  CONCAT416(fVar222 * pfVar5[4],
                                                            CONCAT412(fVar222 * pfVar5[3],
                                                                      CONCAT48(fVar222 * pfVar5[2],
                                                                               CONCAT44(fVar222 * 
                                                  pfVar5[1],fVar222 * *pfVar5))))))));
                              pfVar6 = (float *)((long)pvVar72 + uVar57 * 4 + 0xa0);
                              fVar220 = fVar115 + fVar116 + fVar115;
                              pfVar7 = (float *)((long)pvVar72 + uVar57 * 4 + 0xc0);
                              pfVar8 = (float *)((long)pvVar72 + uVar57 * 4 + 0xe0);
                              fVar166 = fVar219 * *pfVar7 + fVar221 * *pfVar8;
                              fVar214 = fVar219 * pfVar7[1] + fVar221 * pfVar8[1];
                              fVar215 = fVar219 * pfVar7[2] + fVar221 * pfVar8[2];
                              fVar216 = fVar219 * pfVar7[3] + fVar221 * pfVar8[3];
                              fVar217 = fVar219 * pfVar7[4] + fVar221 * pfVar8[4];
                              fVar218 = fVar219 * pfVar7[5] + fVar221 * pfVar8[5];
                              fVar219 = fVar219 * pfVar7[6] + fVar221 * pfVar8[6];
                              fVar221 = fVar220 + fVar115;
                              in_ZMM3 = ZEXT3264(CONCAT428(fVar221,CONCAT424(fVar219,CONCAT420(
                                                  fVar218,CONCAT416(fVar217,CONCAT412(fVar216,
                                                  CONCAT48(fVar215,CONCAT44(fVar214,fVar166))))))));
                              auVar306 = ZEXT3264(CONCAT428(auVar306._28_4_ + fVar73 +
                                                            fVar86 + fVar115 + fVar220 + fVar221,
                                                            CONCAT424(auVar306._24_4_ +
                                                                      fVar73 * pfVar1[6] +
                                                                      fVar86 * pfVar2[6] +
                                                                      fVar115 * pfVar3[6] +
                                                                      fVar116 * pfVar4[6] +
                                                                      fVar222 * pfVar5[6] +
                                                                      fVar117 * pfVar6[6] + fVar219,
                                                                      CONCAT420(auVar306._20_4_ +
                                                                                fVar73 * pfVar1[5] +
                                                                                fVar86 * pfVar2[5] +
                                                                                fVar115 * pfVar3[5]
                                                                                + fVar116 * pfVar4[5
                                                  ] + fVar222 * pfVar5[5] + fVar117 * pfVar6[5] +
                                                  fVar218,CONCAT416(auVar306._16_4_ +
                                                                    fVar73 * pfVar1[4] +
                                                                    fVar86 * pfVar2[4] +
                                                                    fVar115 * pfVar3[4] +
                                                                    fVar116 * pfVar4[4] +
                                                                    fVar222 * pfVar5[4] +
                                                                    fVar117 * pfVar6[4] + fVar217,
                                                                    CONCAT412(auVar306._12_4_ +
                                                                              fVar73 * pfVar1[3] +
                                                                              fVar86 * pfVar2[3] +
                                                                              fVar115 * pfVar3[3] +
                                                                              fVar116 * pfVar4[3] +
                                                                              fVar222 * pfVar5[3] +
                                                                              fVar117 * pfVar6[3] +
                                                                              fVar216,CONCAT48(
                                                  auVar306._8_4_ + fVar73 * pfVar1[2] +
                                                  fVar86 * pfVar2[2] + fVar115 * pfVar3[2] +
                                                  fVar116 * pfVar4[2] + fVar222 * pfVar5[2] +
                                                  fVar117 * pfVar6[2] + fVar215,
                                                  CONCAT44(auVar306._4_4_ + fVar73 * pfVar1[1] +
                                                           fVar86 * pfVar2[1] + fVar115 * pfVar3[1]
                                                           + fVar116 * pfVar4[1] +
                                                             fVar222 * pfVar5[1] +
                                                             fVar117 * pfVar6[1] + fVar214,
                                                           auVar306._0_4_ + fVar73 * *pfVar1 +
                                                           fVar86 * *pfVar2 + fVar115 * *pfVar3 +
                                                           fVar116 * *pfVar4 + fVar222 * *pfVar5 +
                                                           fVar117 * *pfVar6 + fVar166))))))));
                            }
                            uVar62 = uVar62 + 0x40;
                            iVar47 = iVar47 + iVar60;
                            uVar67 = uVar67 - 1;
                          } while (uVar67 != 0);
                        }
                        uVar69 = uVar69 + 1;
                        uVar71 = uVar71 + local_68 * 0x40;
                      } while (uVar69 != local_78);
                    }
                    pvVar72 = (void *)((long)pvVar72 + (long)(int)(uVar18 * uVar19 * 0x40) * 4);
                    uVar63 = uVar63 + 1;
                  } while (uVar63 != uVar21);
                }
                auVar301 = auVar306._0_32_;
                auVar79 = auVar293._0_32_;
                fVar238 = auVar306._8_4_;
                fVar279 = auVar306._12_4_;
                fVar280 = auVar306._16_4_;
                fVar281 = auVar306._20_4_;
                fVar282 = auVar306._24_4_;
                fVar166 = auVar294._0_4_;
                fVar214 = auVar294._4_4_;
                fVar215 = auVar294._8_4_;
                fVar216 = auVar294._12_4_;
                fVar217 = auVar294._16_4_;
                fVar218 = auVar294._20_4_;
                fVar220 = auVar294._24_4_;
                fVar295 = auVar294._28_4_;
                auVar236 = auVar237._0_32_;
                fVar73 = auVar237._0_4_;
                fVar86 = auVar237._4_4_;
                fVar115 = auVar237._8_4_;
                fVar116 = auVar237._12_4_;
                fVar222 = auVar237._16_4_;
                fVar117 = auVar237._20_4_;
                fVar219 = auVar237._24_4_;
                fVar221 = auVar237._28_4_;
                auVar307._28_36_ = auVar306._28_36_;
                switch(uVar20) {
                case 1:
                  auVar301 = vmaxps_avx(auVar301,auVar79);
                  break;
                case 2:
                  auVar236 = vmaxps_avx(auVar301,auVar79);
                  in_ZMM7 = ZEXT3264(auVar236);
                  auVar79 = vminps_avx(auVar301,auVar79);
                  fVar73 = **(float **)(&this->field_0x118 + (long)p_Var55);
                  auVar301._0_4_ = fVar73 * auVar79._0_4_ + auVar236._0_4_;
                  auVar301._4_4_ = fVar73 * auVar79._4_4_ + auVar236._4_4_;
                  auVar301._8_4_ = fVar73 * auVar79._8_4_ + auVar236._8_4_;
                  auVar301._12_4_ = fVar73 * auVar79._12_4_ + auVar236._12_4_;
                  auVar301._16_4_ = fVar73 * auVar79._16_4_ + auVar236._16_4_;
                  auVar301._20_4_ = fVar73 * auVar79._20_4_ + auVar236._20_4_;
                  auVar301._24_4_ = fVar73 * auVar79._24_4_ + auVar236._24_4_;
                  auVar301._28_4_ = auVar79._28_4_ + auVar236._28_4_;
                  break;
                case 3:
                  uVar9 = **(undefined4 **)(&this->field_0x118 + (long)p_Var55);
                  auVar266._4_4_ = uVar9;
                  auVar266._0_4_ = uVar9;
                  auVar266._8_4_ = uVar9;
                  auVar266._12_4_ = uVar9;
                  auVar266._16_4_ = uVar9;
                  auVar266._20_4_ = uVar9;
                  auVar266._24_4_ = uVar9;
                  auVar266._28_4_ = uVar9;
                  uVar9 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var55))[1];
                  auVar323._4_4_ = uVar9;
                  auVar323._0_4_ = uVar9;
                  auVar323._8_4_ = uVar9;
                  auVar323._12_4_ = uVar9;
                  auVar323._16_4_ = uVar9;
                  auVar323._20_4_ = uVar9;
                  auVar323._24_4_ = uVar9;
                  auVar323._28_4_ = uVar9;
                  auVar301 = vmaxps_avx(auVar301,auVar266);
                  in_ZMM7 = ZEXT3264(auVar301);
                  auVar301 = vminps_avx(auVar323,auVar301);
                  break;
                case 4:
                  auVar267._0_8_ = auVar306._0_8_ ^ 0x8000000080000000;
                  auVar267._8_4_ = -fVar238;
                  auVar267._12_4_ = -fVar279;
                  auVar267._16_4_ = -fVar280;
                  auVar267._20_4_ = -fVar281;
                  auVar267._24_4_ = -fVar282;
                  auVar267._28_4_ = -auVar306._28_4_;
                  auVar154._8_4_ = 0x42b0c0a5;
                  auVar154._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar154._12_4_ = 0x42b0c0a5;
                  auVar154._16_4_ = 0x42b0c0a5;
                  auVar154._20_4_ = 0x42b0c0a5;
                  auVar154._24_4_ = 0x42b0c0a5;
                  auVar154._28_4_ = 0x42b0c0a5;
                  auVar301 = vminps_avx(auVar267,auVar154);
                  auVar155._8_4_ = 0xc2b0c0a5;
                  auVar155._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar155._12_4_ = 0xc2b0c0a5;
                  auVar155._16_4_ = 0xc2b0c0a5;
                  auVar155._20_4_ = 0xc2b0c0a5;
                  auVar155._24_4_ = 0xc2b0c0a5;
                  auVar155._28_4_ = 0xc2b0c0a5;
                  auVar79 = vmaxps_avx(auVar301,auVar155);
                  auVar300._0_4_ = auVar79._0_4_ * 1.442695 + fVar166;
                  auVar300._4_4_ = auVar79._4_4_ * 1.442695 + fVar214;
                  auVar300._8_4_ = auVar79._8_4_ * 1.442695 + fVar215;
                  auVar300._12_4_ = auVar79._12_4_ * 1.442695 + fVar216;
                  auVar300._16_4_ = auVar79._16_4_ * 1.442695 + fVar217;
                  auVar300._20_4_ = auVar79._20_4_ * 1.442695 + fVar218;
                  auVar300._24_4_ = auVar79._24_4_ * 1.442695 + fVar220;
                  auVar300._28_4_ = auVar306._28_4_ + fVar295;
                  auVar157 = vroundps_avx(auVar300,1);
                  auVar301 = vcmpps_avx(auVar300,auVar157,1);
                  auVar301 = vandps_avx(auVar301,auVar236);
                  auVar301 = vsubps_avx(auVar157,auVar301);
                  fVar238 = auVar301._0_4_ * -0.6931472 + auVar79._0_4_;
                  fVar279 = auVar301._4_4_ * -0.6931472 + auVar79._4_4_;
                  fVar280 = auVar301._8_4_ * -0.6931472 + auVar79._8_4_;
                  fVar281 = auVar301._12_4_ * -0.6931472 + auVar79._12_4_;
                  fVar282 = auVar301._16_4_ * -0.6931472 + auVar79._16_4_;
                  fVar310 = auVar301._20_4_ * -0.6931472 + auVar79._20_4_;
                  fVar326 = auVar301._24_4_ * -0.6931472 + auVar79._24_4_;
                  in_ZMM3 = ZEXT3264(CONCAT428(0x3ab743ce,
                                               CONCAT424(0x3ab743ce,
                                                         CONCAT420(0x3ab743ce,
                                                                   CONCAT416(0x3ab743ce,
                                                                             CONCAT412(0x3ab743ce,
                                                                                       CONCAT48(
                                                  0x3ab743ce,0x3ab743ce3ab743ce)))))));
                  auVar240._0_4_ = (int)auVar301._0_4_;
                  auVar240._4_4_ = (int)auVar301._4_4_;
                  auVar240._8_4_ = (int)auVar301._8_4_;
                  auVar240._12_4_ = (int)auVar301._12_4_;
                  auVar268._16_4_ = (int)auVar301._16_4_;
                  auVar268._0_16_ = auVar240;
                  auVar268._20_4_ = (int)auVar301._20_4_;
                  auVar268._24_4_ = (int)auVar301._24_4_;
                  auVar268._28_4_ = (int)auVar301._28_4_;
                  auVar239 = vpslld_avx(auVar240,0x17);
                  auVar167 = vpslld_avx(auVar268._16_16_,0x17);
                  auVar74._8_4_ = 0x3f800000;
                  auVar74._0_8_ = 0x3f8000003f800000;
                  auVar74._12_4_ = 0x3f800000;
                  auVar167 = vpaddd_avx(auVar167,auVar74);
                  auVar239 = vpaddd_avx(auVar239,auVar74);
                  auVar156._0_4_ =
                       (fVar238 + fVar73 +
                       fVar238 * fVar238 *
                       (fVar166 +
                       ((((fVar238 * 0.00019875691 + 0.0013981999) * fVar238 + 0.008333452) *
                         fVar238 + 0.041665796) * fVar238 + 0.16666666) * fVar238)) * auVar239._0_4_
                       + fVar73;
                  auVar156._4_4_ =
                       (fVar279 + fVar86 +
                       fVar279 * fVar279 *
                       (fVar214 +
                       ((((fVar279 * 0.00019875691 + 0.0013981999) * fVar279 + 0.008333452) *
                         fVar279 + 0.041665796) * fVar279 + 0.16666666) * fVar279)) * auVar239._4_4_
                       + fVar86;
                  auVar156._8_4_ =
                       (fVar280 + fVar115 +
                       fVar280 * fVar280 *
                       (fVar215 +
                       ((((fVar280 * 0.00019875691 + 0.0013981999) * fVar280 + 0.008333452) *
                         fVar280 + 0.041665796) * fVar280 + 0.16666666) * fVar280)) * auVar239._8_4_
                       + fVar115;
                  auVar156._12_4_ =
                       (fVar281 + fVar116 +
                       fVar281 * fVar281 *
                       (fVar216 +
                       ((((fVar281 * 0.00019875691 + 0.0013981999) * fVar281 + 0.008333452) *
                         fVar281 + 0.041665796) * fVar281 + 0.16666666) * fVar281)) *
                       auVar239._12_4_ + fVar116;
                  auVar156._16_4_ =
                       (fVar282 + fVar222 +
                       fVar282 * fVar282 *
                       (fVar217 +
                       ((((fVar282 * 0.00019875691 + 0.0013981999) * fVar282 + 0.008333452) *
                         fVar282 + 0.041665796) * fVar282 + 0.16666666) * fVar282)) * auVar167._0_4_
                       + fVar222;
                  auVar156._20_4_ =
                       (fVar310 + fVar117 +
                       fVar310 * fVar310 *
                       (fVar218 +
                       ((((fVar310 * 0.00019875691 + 0.0013981999) * fVar310 + 0.008333452) *
                         fVar310 + 0.041665796) * fVar310 + 0.16666666) * fVar310)) * auVar167._4_4_
                       + fVar117;
                  auVar156._24_4_ =
                       (fVar326 + fVar219 +
                       fVar326 * fVar326 *
                       (fVar220 +
                       ((((fVar326 * 0.00019875691 + 0.0013981999) * fVar326 + 0.008333452) *
                         fVar326 + 0.041665796) * fVar326 + 0.16666666) * fVar326)) * auVar167._8_4_
                       + fVar219;
                  auVar156._28_4_ =
                       auVar157._28_4_ + auVar79._28_4_ + fVar221 + fVar295 + 0.21826287 + fVar221;
                  auVar79 = vrcpps_avx(auVar156);
                  in_ZMM7 = ZEXT3264(auVar79);
                  fVar73 = auVar79._0_4_;
                  fVar86 = auVar79._4_4_;
                  auVar35._4_4_ = auVar156._4_4_ * fVar86;
                  auVar35._0_4_ = auVar156._0_4_ * fVar73;
                  fVar115 = auVar79._8_4_;
                  auVar35._8_4_ = auVar156._8_4_ * fVar115;
                  fVar116 = auVar79._12_4_;
                  auVar35._12_4_ = auVar156._12_4_ * fVar116;
                  fVar222 = auVar79._16_4_;
                  auVar35._16_4_ = auVar156._16_4_ * fVar222;
                  fVar117 = auVar79._20_4_;
                  auVar35._20_4_ = auVar156._20_4_ * fVar117;
                  fVar219 = auVar79._24_4_;
                  auVar35._24_4_ = auVar156._24_4_ * fVar219;
                  auVar35._28_4_ = auVar156._28_4_;
                  auVar236 = vsubps_avx(auVar236,auVar35);
                  auVar301._0_4_ = fVar73 + fVar73 * auVar236._0_4_;
                  auVar301._4_4_ = fVar86 + fVar86 * auVar236._4_4_;
                  auVar301._8_4_ = fVar115 + fVar115 * auVar236._8_4_;
                  auVar301._12_4_ = fVar116 + fVar116 * auVar236._12_4_;
                  auVar301._16_4_ = fVar222 + fVar222 * auVar236._16_4_;
                  auVar301._20_4_ = fVar117 + fVar117 * auVar236._20_4_;
                  auVar301._24_4_ = fVar219 + fVar219 * auVar236._24_4_;
                  auVar301._28_4_ = auVar79._28_4_ + auVar236._28_4_;
                  break;
                case 5:
                  auVar287._8_4_ = 0x42b0c0a5;
                  auVar287._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar287._12_4_ = 0x42b0c0a5;
                  auVar287._16_4_ = 0x42b0c0a5;
                  auVar287._20_4_ = 0x42b0c0a5;
                  auVar287._24_4_ = 0x42b0c0a5;
                  auVar287._28_4_ = 0x42b0c0a5;
                  auVar301 = vminps_avx(auVar301,auVar287);
                  auVar290._8_4_ = 0xc2b0c0a5;
                  auVar290._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar290._12_4_ = 0xc2b0c0a5;
                  auVar290._16_4_ = 0xc2b0c0a5;
                  auVar290._20_4_ = 0xc2b0c0a5;
                  auVar290._24_4_ = 0xc2b0c0a5;
                  auVar290._28_4_ = 0xc2b0c0a5;
                  auVar79 = vmaxps_avx(auVar290,auVar301);
                  auVar264._0_4_ = fVar166 + auVar79._0_4_ * 1.442695;
                  auVar264._4_4_ = fVar214 + auVar79._4_4_ * 1.442695;
                  auVar264._8_4_ = fVar215 + auVar79._8_4_ * 1.442695;
                  auVar264._12_4_ = fVar216 + auVar79._12_4_ * 1.442695;
                  auVar264._16_4_ = fVar217 + auVar79._16_4_ * 1.442695;
                  auVar264._20_4_ = fVar218 + auVar79._20_4_ * 1.442695;
                  auVar264._24_4_ = fVar220 + auVar79._24_4_ * 1.442695;
                  auVar264._28_4_ = fVar295 + in_ZMM7._28_4_;
                  auVar157 = vroundps_avx(auVar264,1);
                  auVar301 = vcmpps_avx(auVar264,auVar157,1);
                  auVar301 = vandps_avx(auVar301,auVar236);
                  auVar301 = vsubps_avx(auVar157,auVar301);
                  auVar32._4_4_ = auVar301._4_4_ * 0.6931472;
                  auVar32._0_4_ = auVar301._0_4_ * 0.6931472;
                  auVar32._8_4_ = auVar301._8_4_ * 0.6931472;
                  auVar32._12_4_ = auVar301._12_4_ * 0.6931472;
                  auVar32._16_4_ = auVar301._16_4_ * 0.6931472;
                  auVar32._20_4_ = auVar301._20_4_ * 0.6931472;
                  auVar32._24_4_ = auVar301._24_4_ * 0.6931472;
                  auVar32._28_4_ = auVar157._28_4_;
                  auVar79 = vsubps_avx(auVar79,auVar32);
                  fVar310 = auVar79._0_4_;
                  fVar326 = auVar79._4_4_;
                  fVar327 = auVar79._8_4_;
                  fVar328 = auVar79._12_4_;
                  fVar329 = auVar79._16_4_;
                  fVar330 = auVar79._20_4_;
                  fVar331 = auVar79._24_4_;
                  auVar167._0_4_ = (int)auVar301._0_4_;
                  auVar167._4_4_ = (int)auVar301._4_4_;
                  auVar167._8_4_ = (int)auVar301._8_4_;
                  auVar167._12_4_ = (int)auVar301._12_4_;
                  auVar197._16_4_ = (int)auVar301._16_4_;
                  auVar197._0_16_ = auVar167;
                  auVar197._20_4_ = (int)auVar301._20_4_;
                  auVar197._24_4_ = (int)auVar301._24_4_;
                  auVar197._28_4_ = (int)auVar301._28_4_;
                  auVar239 = vpslld_avx(auVar167,0x17);
                  auVar167 = vpslld_avx(auVar197._16_16_,0x17);
                  auVar297._8_4_ = 0x3f800000;
                  auVar297._0_8_ = 0x3f8000003f800000;
                  auVar297._12_4_ = 0x3f800000;
                  auVar167 = vpaddd_avx(auVar167,auVar297);
                  auVar239 = vpaddd_avx(auVar239,auVar297);
                  auVar265._0_4_ =
                       (fVar310 + fVar73 +
                       fVar310 * fVar310 *
                       (((((fVar310 * 0.00019875691 + 0.0013981999) * fVar310 + 0.008333452) *
                          fVar310 + 0.041665796) * fVar310 + 0.16666666) * fVar310 + fVar166)) *
                       auVar239._0_4_ + fVar73;
                  auVar265._4_4_ =
                       (fVar326 + fVar86 +
                       fVar326 * fVar326 *
                       (((((fVar326 * 0.00019875691 + 0.0013981999) * fVar326 + 0.008333452) *
                          fVar326 + 0.041665796) * fVar326 + 0.16666666) * fVar326 + fVar214)) *
                       auVar239._4_4_ + fVar86;
                  auVar265._8_4_ =
                       (fVar327 + fVar115 +
                       fVar327 * fVar327 *
                       (((((fVar327 * 0.00019875691 + 0.0013981999) * fVar327 + 0.008333452) *
                          fVar327 + 0.041665796) * fVar327 + 0.16666666) * fVar327 + fVar215)) *
                       auVar239._8_4_ + fVar115;
                  auVar265._12_4_ =
                       (fVar328 + fVar116 +
                       fVar328 * fVar328 *
                       (((((fVar328 * 0.00019875691 + 0.0013981999) * fVar328 + 0.008333452) *
                          fVar328 + 0.041665796) * fVar328 + 0.16666666) * fVar328 + fVar216)) *
                       auVar239._12_4_ + fVar116;
                  auVar265._16_4_ =
                       (fVar329 + fVar222 +
                       fVar329 * fVar329 *
                       (((((fVar329 * 0.00019875691 + 0.0013981999) * fVar329 + 0.008333452) *
                          fVar329 + 0.041665796) * fVar329 + 0.16666666) * fVar329 + fVar217)) *
                       auVar167._0_4_ + fVar222;
                  auVar265._20_4_ =
                       (fVar330 + fVar117 +
                       fVar330 * fVar330 *
                       (((((fVar330 * 0.00019875691 + 0.0013981999) * fVar330 + 0.008333452) *
                          fVar330 + 0.041665796) * fVar330 + 0.16666666) * fVar330 + fVar218)) *
                       auVar167._4_4_ + fVar117;
                  auVar265._24_4_ =
                       (fVar331 + fVar219 +
                       fVar331 * fVar331 *
                       (((((fVar331 * 0.00019875691 + 0.0013981999) * fVar331 + 0.008333452) *
                          fVar331 + 0.041665796) * fVar331 + 0.16666666) * fVar331 + fVar220)) *
                       auVar167._8_4_ + fVar219;
                  auVar265._28_4_ =
                       auVar79._28_4_ + fVar221 +
                       in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                       fVar295 + fVar221;
                  auVar151._8_4_ = 0x800000;
                  auVar151._0_8_ = 0x80000000800000;
                  auVar151._12_4_ = 0x800000;
                  auVar151._16_4_ = 0x800000;
                  auVar151._20_4_ = 0x800000;
                  auVar151._24_4_ = 0x800000;
                  auVar151._28_4_ = 0x800000;
                  auVar157 = vmaxps_avx(auVar265,auVar151);
                  auVar167 = vpsrld_avx(auVar157._16_16_,0x17);
                  auVar229._8_4_ = 0x807fffff;
                  auVar229._0_8_ = 0x807fffff807fffff;
                  auVar229._12_4_ = 0x807fffff;
                  auVar229._16_4_ = 0x807fffff;
                  auVar229._20_4_ = 0x807fffff;
                  auVar229._24_4_ = 0x807fffff;
                  auVar229._28_4_ = 0x807fffff;
                  auVar301 = vandps_avx(auVar157,auVar229);
                  auVar203 = vorps_avx(auVar301,auVar294._0_32_);
                  auVar230._8_4_ = 0x3f3504f3;
                  auVar230._0_8_ = 0x3f3504f33f3504f3;
                  auVar230._12_4_ = 0x3f3504f3;
                  auVar230._16_4_ = 0x3f3504f3;
                  auVar230._20_4_ = 0x3f3504f3;
                  auVar230._24_4_ = 0x3f3504f3;
                  auVar230._28_4_ = 0x3f3504f3;
                  auVar79 = vcmpps_avx(auVar230,auVar203,2);
                  auVar301 = vandnps_avx(auVar79,auVar203);
                  fVar310 = auVar203._0_4_ + -1.0 + auVar301._0_4_;
                  fVar326 = auVar203._4_4_ + -1.0 + auVar301._4_4_;
                  fVar327 = auVar203._8_4_ + -1.0 + auVar301._8_4_;
                  fVar328 = auVar203._12_4_ + -1.0 + auVar301._12_4_;
                  fVar329 = auVar203._16_4_ + -1.0 + auVar301._16_4_;
                  fVar330 = auVar203._20_4_ + -1.0 + auVar301._20_4_;
                  fVar331 = auVar203._24_4_ + -1.0 + auVar301._24_4_;
                  auVar167 = vpsubd_avx(auVar167,auVar79._16_16_);
                  auVar239 = vpsrld_avx(auVar157._0_16_,0x17);
                  auVar283._8_4_ = 0xffffff81;
                  auVar283._0_8_ = 0xffffff81ffffff81;
                  auVar283._12_4_ = 0xffffff81;
                  auVar167 = vpaddd_avx(auVar283,auVar167);
                  auVar239 = vpsubd_avx(auVar239,auVar79._0_16_);
                  auVar239 = vpaddd_avx(auVar283,auVar239);
                  auVar152._16_16_ = auVar167;
                  auVar152._0_16_ = auVar239;
                  auVar79 = vcmpps_avx(auVar265,_DAT_00543ba0,2);
                  auVar157 = vcvtdq2ps_avx(auVar152);
                  auVar33._4_4_ =
                       (fVar326 + auVar157._4_4_ * 0.6931472 +
                       fVar326 * fVar326 *
                       (fVar326 * (fVar326 * (fVar326 * (fVar326 * (fVar326 * (fVar326 * (fVar326 * 
                                                  (fVar326 * (fVar326 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar33._0_4_ =
                       (fVar310 + auVar157._0_4_ * 0.6931472 +
                       fVar310 * fVar310 *
                       (fVar310 * (fVar310 * (fVar310 * (fVar310 * (fVar310 * (fVar310 * (fVar310 * 
                                                  (fVar310 * (fVar310 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar33._8_4_ =
                       (fVar327 + auVar157._8_4_ * 0.6931472 +
                       fVar327 * fVar327 *
                       (fVar327 * (fVar327 * (fVar327 * (fVar327 * (fVar327 * (fVar327 * (fVar327 * 
                                                  (fVar327 * (fVar327 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar33._12_4_ =
                       (fVar328 + auVar157._12_4_ * 0.6931472 +
                       fVar328 * fVar328 *
                       (fVar328 * (fVar328 * (fVar328 * (fVar328 * (fVar328 * (fVar328 * (fVar328 * 
                                                  (fVar328 * (fVar328 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar33._16_4_ =
                       (fVar329 + auVar157._16_4_ * 0.6931472 +
                       fVar329 * fVar329 *
                       (fVar329 * (fVar329 * (fVar329 * (fVar329 * (fVar329 * (fVar329 * (fVar329 * 
                                                  (fVar329 * (fVar329 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar33._20_4_ =
                       (fVar330 + auVar157._20_4_ * 0.6931472 +
                       fVar330 * fVar330 *
                       (fVar330 * (fVar330 * (fVar330 * (fVar330 * (fVar330 * (fVar330 * (fVar330 * 
                                                  (fVar330 * (fVar330 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar33._24_4_ =
                       (fVar331 + auVar157._24_4_ * 0.6931472 +
                       fVar331 * fVar331 *
                       (fVar331 * (fVar331 * (fVar331 * (fVar331 * (fVar331 * (fVar331 * (fVar331 * 
                                                  (fVar331 * (fVar331 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar33._28_4_ = auVar203._28_4_ + -1.0 + auVar301._28_4_ + auVar157._28_4_ + 0.0;
                  auVar198._8_4_ = 0x7fffffff;
                  auVar198._0_8_ = 0x7fffffff7fffffff;
                  auVar198._12_4_ = 0x7fffffff;
                  auVar198._16_4_ = 0x7fffffff;
                  auVar198._20_4_ = 0x7fffffff;
                  auVar198._24_4_ = 0x7fffffff;
                  auVar198._28_4_ = 0x7fffffff;
                  auVar301 = vblendvps_avx(auVar33,auVar198,auVar79);
                  auVar199._8_4_ = 0x42b0c0a5;
                  auVar199._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar199._12_4_ = 0x42b0c0a5;
                  auVar199._16_4_ = 0x42b0c0a5;
                  auVar199._20_4_ = 0x42b0c0a5;
                  auVar199._24_4_ = 0x42b0c0a5;
                  auVar199._28_4_ = 0x42b0c0a5;
                  auVar301 = vminps_avx(auVar301,auVar199);
                  auVar200._8_4_ = 0xc2b0c0a5;
                  auVar200._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar200._12_4_ = 0xc2b0c0a5;
                  auVar200._16_4_ = 0xc2b0c0a5;
                  auVar200._20_4_ = 0xc2b0c0a5;
                  auVar200._24_4_ = 0xc2b0c0a5;
                  auVar200._28_4_ = 0xc2b0c0a5;
                  auVar79 = vmaxps_avx(auVar301,auVar200);
                  auVar293 = ZEXT864(0) << 0x20;
                  auVar201._0_4_ = auVar79._0_4_ * 1.442695 + fVar166;
                  auVar201._4_4_ = auVar79._4_4_ * 1.442695 + fVar214;
                  auVar201._8_4_ = auVar79._8_4_ * 1.442695 + fVar215;
                  auVar201._12_4_ = auVar79._12_4_ * 1.442695 + fVar216;
                  auVar201._16_4_ = auVar79._16_4_ * 1.442695 + fVar217;
                  auVar201._20_4_ = auVar79._20_4_ * 1.442695 + fVar218;
                  auVar201._24_4_ = auVar79._24_4_ * 1.442695 + fVar220;
                  auVar201._28_4_ = fVar295 + -88.37626;
                  auVar157 = vroundps_avx(auVar201,1);
                  auVar301 = vcmpps_avx(auVar201,auVar157,1);
                  auVar301 = vandps_avx(auVar301,auVar236);
                  auVar301 = vsubps_avx(auVar157,auVar301);
                  auVar34._4_4_ = auVar301._4_4_ * 0.6931472;
                  auVar34._0_4_ = auVar301._0_4_ * 0.6931472;
                  auVar34._8_4_ = auVar301._8_4_ * 0.6931472;
                  auVar34._12_4_ = auVar301._12_4_ * 0.6931472;
                  auVar34._16_4_ = auVar301._16_4_ * 0.6931472;
                  auVar34._20_4_ = auVar301._20_4_ * 0.6931472;
                  auVar34._24_4_ = auVar301._24_4_ * 0.6931472;
                  auVar34._28_4_ = auVar157._28_4_;
                  auVar79 = vsubps_avx(auVar79,auVar34);
                  fVar310 = auVar79._0_4_;
                  fVar326 = auVar79._4_4_;
                  fVar327 = auVar79._8_4_;
                  fVar328 = auVar79._12_4_;
                  fVar329 = auVar79._16_4_;
                  fVar330 = auVar79._20_4_;
                  fVar331 = auVar79._24_4_;
                  auVar237 = ZEXT3264(auVar236);
                  auVar294 = ZEXT3264(auVar294._0_32_);
                  fVar166 = fVar166 + ((((fVar310 * 0.00019875691 + 0.0013981999) * fVar310 +
                                        0.008333452) * fVar310 + 0.041665796) * fVar310 + 0.16666666
                                      ) * fVar310;
                  fVar214 = fVar214 + ((((fVar326 * 0.00019875691 + 0.0013981999) * fVar326 +
                                        0.008333452) * fVar326 + 0.041665796) * fVar326 + 0.16666666
                                      ) * fVar326;
                  fVar215 = fVar215 + ((((fVar327 * 0.00019875691 + 0.0013981999) * fVar327 +
                                        0.008333452) * fVar327 + 0.041665796) * fVar327 + 0.16666666
                                      ) * fVar327;
                  fVar216 = fVar216 + ((((fVar328 * 0.00019875691 + 0.0013981999) * fVar328 +
                                        0.008333452) * fVar328 + 0.041665796) * fVar328 + 0.16666666
                                      ) * fVar328;
                  fVar217 = fVar217 + ((((fVar329 * 0.00019875691 + 0.0013981999) * fVar329 +
                                        0.008333452) * fVar329 + 0.041665796) * fVar329 + 0.16666666
                                      ) * fVar329;
                  fVar218 = fVar218 + ((((fVar330 * 0.00019875691 + 0.0013981999) * fVar330 +
                                        0.008333452) * fVar330 + 0.041665796) * fVar330 + 0.16666666
                                      ) * fVar330;
                  fVar220 = fVar220 + ((((fVar331 * 0.00019875691 + 0.0013981999) * fVar331 +
                                        0.008333452) * fVar331 + 0.041665796) * fVar331 + 0.16666666
                                      ) * fVar331;
                  in_ZMM7 = ZEXT3264(CONCAT428(fVar295 + auVar265._28_4_ + 0.0013981999 +
                                                         0.008333452 + 0.041665796 + 0.16666666,
                                               CONCAT424(fVar220,CONCAT420(fVar218,CONCAT416(fVar217
                                                  ,CONCAT412(fVar216,CONCAT48(fVar215,CONCAT44(
                                                  fVar214,fVar166))))))));
                  auVar239._0_4_ = (int)auVar301._0_4_;
                  auVar239._4_4_ = (int)auVar301._4_4_;
                  auVar239._8_4_ = (int)auVar301._8_4_;
                  auVar239._12_4_ = (int)auVar301._12_4_;
                  auVar202._16_4_ = (int)auVar301._16_4_;
                  auVar202._0_16_ = auVar239;
                  auVar202._20_4_ = (int)auVar301._20_4_;
                  auVar202._24_4_ = (int)auVar301._24_4_;
                  auVar202._28_4_ = (int)auVar301._28_4_;
                  auVar239 = vpslld_avx(auVar239,0x17);
                  auVar167 = vpslld_avx(auVar202._16_16_,0x17);
                  auVar167 = vpaddd_avx(auVar167,auVar297);
                  auVar239 = vpaddd_avx(auVar239,auVar297);
                  auVar153._0_4_ =
                       (fVar310 + fVar73 + fVar310 * fVar310 * fVar166) * auVar239._0_4_ + fVar73;
                  auVar153._4_4_ =
                       (fVar326 + fVar86 + fVar326 * fVar326 * fVar214) * auVar239._4_4_ + fVar86;
                  auVar153._8_4_ =
                       (fVar327 + fVar115 + fVar327 * fVar327 * fVar215) * auVar239._8_4_ + fVar115;
                  auVar153._12_4_ =
                       (fVar328 + fVar116 + fVar328 * fVar328 * fVar216) * auVar239._12_4_ + fVar116
                  ;
                  auVar153._16_4_ =
                       (fVar329 + fVar222 + fVar329 * fVar329 * fVar217) * auVar167._0_4_ + fVar222;
                  auVar153._20_4_ =
                       (fVar330 + fVar117 + fVar330 * fVar330 * fVar218) * auVar167._4_4_ + fVar117;
                  auVar153._24_4_ =
                       (fVar331 + fVar219 + fVar331 * fVar331 * fVar220) * auVar167._8_4_ + fVar219;
                  auVar153._28_4_ = auVar79._28_4_ + fVar221 + auVar157._28_4_ + fVar221;
                  auVar301 = vrcpps_avx(auVar153);
                  fVar73 = auVar301._0_4_;
                  fVar86 = auVar301._4_4_;
                  fVar115 = auVar301._8_4_;
                  fVar116 = auVar301._12_4_;
                  fVar222 = auVar301._16_4_;
                  fVar117 = auVar301._20_4_;
                  fVar219 = auVar301._24_4_;
                  auVar236._4_4_ = auVar153._4_4_ * (fVar86 + fVar86);
                  auVar236._0_4_ = auVar153._0_4_ * (fVar73 + fVar73);
                  auVar236._8_4_ = auVar153._8_4_ * (fVar115 + fVar115);
                  auVar236._12_4_ = auVar153._12_4_ * (fVar116 + fVar116);
                  auVar236._16_4_ = auVar153._16_4_ * (fVar222 + fVar222);
                  auVar236._20_4_ = auVar153._20_4_ * (fVar117 + fVar117);
                  auVar236._24_4_ = auVar153._24_4_ * (fVar219 + fVar219);
                  auVar236._28_4_ = auVar153._28_4_;
                  auVar79._8_4_ = 0x40000000;
                  auVar79._0_8_ = 0x4000000040000000;
                  auVar79._12_4_ = 0x40000000;
                  auVar79._16_4_ = 0x40000000;
                  auVar79._20_4_ = 0x40000000;
                  auVar79._24_4_ = 0x40000000;
                  auVar79._28_4_ = 0x40000000;
                  auVar236 = vsubps_avx(auVar79,auVar236);
                  auVar203._0_4_ = fVar73 + fVar73 + -1.0;
                  auVar203._4_4_ = fVar86 + fVar86 + -1.0;
                  auVar203._8_4_ = fVar115 + fVar115 + -1.0;
                  auVar203._12_4_ = fVar116 + fVar116 + -1.0;
                  auVar203._16_4_ = fVar222 + fVar222 + -1.0;
                  auVar203._20_4_ = fVar117 + fVar117 + -1.0;
                  auVar203._24_4_ = fVar219 + fVar219 + -1.0;
                  auVar203._28_4_ = auVar301._28_4_ + auVar301._28_4_ + -1.0;
                  auVar148._0_4_ = auVar203._0_4_ + fVar73 * auVar236._0_4_;
                  auVar148._4_4_ = auVar203._4_4_ + fVar86 * auVar236._4_4_;
                  auVar148._8_4_ = auVar203._8_4_ + fVar115 * auVar236._8_4_;
                  auVar148._12_4_ = auVar203._12_4_ + fVar116 * auVar236._12_4_;
                  auVar148._16_4_ = auVar203._16_4_ + fVar222 * auVar236._16_4_;
                  auVar148._20_4_ = auVar203._20_4_ + fVar117 * auVar236._20_4_;
                  auVar148._24_4_ = auVar203._24_4_ + fVar219 * auVar236._24_4_;
                  goto LAB_002b036a;
                case 6:
                  fVar73 = **(float **)(&this->field_0x118 + (long)p_Var55);
                  fVar86 = (*(float **)(&this->field_0x118 + (long)p_Var55))[1];
                  auVar203._4_4_ = fVar86;
                  auVar203._0_4_ = fVar86;
                  auVar203._8_4_ = fVar86;
                  auVar203._12_4_ = fVar86;
                  auVar203._16_4_ = fVar86;
                  auVar203._20_4_ = fVar86;
                  auVar203._24_4_ = fVar86;
                  auVar203._28_4_ = fVar86;
                  auVar157._0_4_ = auVar306._0_4_ * fVar73 + fVar86;
                  auVar157._4_4_ = auVar306._4_4_ * fVar73 + fVar86;
                  auVar157._8_4_ = fVar238 * fVar73 + fVar86;
                  auVar157._12_4_ = fVar279 * fVar73 + fVar86;
                  auVar157._16_4_ = fVar280 * fVar73 + fVar86;
                  auVar157._20_4_ = fVar281 * fVar73 + fVar86;
                  auVar157._24_4_ = fVar282 * fVar73 + fVar86;
                  auVar157._28_4_ = fVar73 + fVar86;
                  auVar301 = vmaxps_avx(auVar79,auVar157);
                  auVar301 = vminps_avx(auVar301,auVar236);
                  auVar148 = auVar301._0_28_;
LAB_002b036a:
                  in_ZMM3 = ZEXT3264(auVar203);
                  auVar307._0_4_ = auVar306._0_4_ * auVar148._0_4_;
                  auVar307._4_4_ = auVar306._4_4_ * auVar148._4_4_;
                  auVar307._8_4_ = fVar238 * auVar148._8_4_;
                  auVar307._12_4_ = fVar279 * auVar148._12_4_;
                  auVar307._16_4_ = fVar280 * auVar148._16_4_;
                  auVar307._20_4_ = fVar281 * auVar148._20_4_;
                  auVar307._24_4_ = fVar282 * auVar148._24_4_;
                  auVar301 = auVar307._0_32_;
                }
                *(undefined1 (*) [32])pAVar66 = auVar301;
                pAVar66 = pAVar66 + 0x20;
                uVar68 = uVar68 + 1;
                iVar53 = iVar53 + 1;
              } while (uVar68 != local_c8.w);
            }
            iVar61 = iVar61 + 1;
          } while (iVar61 != local_c8.h);
        }
        local_160 = local_160 + 1;
      } while (local_160 != local_c8.c);
    }
    if (((iVar16 == 4) && (local_154 == 8)) && (0 < (long)local_c8.c)) {
      p_Var55 = local_70[-3];
      iVar60 = *(int *)(&this->field_0xdc + (long)p_Var55);
      iVar54 = *(int *)(&this->field_0xe0 + (long)p_Var55);
      iVar17 = *(int *)(&this->field_0xe4 + (long)p_Var55);
      iVar70 = *(int *)(&this->field_0xe8 + (long)p_Var55);
      uVar20 = *(undefined4 *)(&this->field_0x114 + (long)p_Var55);
      lVar65 = *(long *)(&this->field_0x1a8 + (long)p_Var55);
      uVar18 = *(uint *)(&this->field_0xd4 + (long)p_Var55);
      uVar19 = *(uint *)(&this->field_0xd8 + (long)p_Var55);
      local_1a0 = 0;
      auVar237 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar294 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar293 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar288._8_4_ = 0x42b0c0a5;
      auVar288._0_8_ = 0x42b0c0a542b0c0a5;
      auVar288._12_4_ = 0x42b0c0a5;
      auVar288._16_4_ = 0x42b0c0a5;
      auVar288._20_4_ = 0x42b0c0a5;
      auVar288._24_4_ = 0x42b0c0a5;
      auVar288._28_4_ = 0x42b0c0a5;
      auVar291._8_4_ = 0xc2b0c0a5;
      auVar291._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar291._12_4_ = 0xc2b0c0a5;
      auVar291._16_4_ = 0xc2b0c0a5;
      auVar291._20_4_ = 0xc2b0c0a5;
      auVar291._24_4_ = 0xc2b0c0a5;
      auVar291._28_4_ = 0xc2b0c0a5;
      do {
        if (0 < local_c8.h) {
          iVar51 = bottom_blob->w;
          iVar52 = bottom_blob->h;
          pAVar66 = (Allocator *)
                    ((long)local_c8.data +
                    local_c8.cstep * local_1a0 *
                    CONCAT44(local_c8.elemsize._4_4_,(int)local_c8.elemsize));
          uVar21 = bottom_blob->c;
          iVar61 = 0;
          do {
            if (0 < local_c8.w) {
              uVar68 = 0;
              iVar53 = (1 - uVar18) * iVar60;
              do {
                if (lVar65 == 0) {
                  auVar306 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar306 = ZEXT3264(*(undefined1 (*) [32])(lVar65 + local_1a0 * 0x20));
                }
                if (0 < (int)uVar21) {
                  pvVar72 = (void *)((this->weight_data_tm).cstep * local_1a0 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar24 = bottom_blob->data;
                  uVar63 = 0;
                  do {
                    if (0 < (int)uVar19) {
                      uVar71 = 0;
                      uVar69 = 0;
                      do {
                        iVar47 = (((int)uVar69 - uVar19) + 1) * iVar54 + iVar61;
                        if ((((-1 < iVar47) && (iVar48 = iVar47 / iVar70, iVar47 % iVar70 == 0)) &&
                            (0 < (int)uVar18)) && (iVar48 < iVar52)) {
                          lVar58 = (long)iVar48 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar63;
                          uVar62 = (ulong)uVar18;
                          uVar67 = uVar71;
                          iVar47 = iVar53;
                          do {
                            if (((-1 < iVar47) && (iVar48 = iVar47 / iVar17, iVar47 % iVar17 == 0))
                               && (iVar48 < iVar51)) {
                              lVar56 = (long)(iVar48 << 2);
                              fVar73 = *(float *)((long)pvVar24 + lVar56 * 4 + lVar58);
                              fVar86 = *(float *)((long)pvVar24 + lVar56 * 4 + lVar58 + 4);
                              fVar115 = *(float *)((long)pvVar24 + lVar56 * 4 + lVar58 + 8);
                              fVar116 = *(float *)((long)pvVar24 + lVar56 * 4 + lVar58 + 0xc);
                              in_ZMM7 = ZEXT3264(CONCAT428(fVar116,CONCAT424(fVar116,CONCAT420(
                                                  fVar116,CONCAT416(fVar116,CONCAT412(fVar116,
                                                  CONCAT48(fVar116,CONCAT44(fVar116,fVar116))))))));
                              uVar57 = uVar67 & 0xffffffff;
                              pfVar1 = (float *)((long)pvVar72 + uVar57 * 4);
                              pfVar2 = (float *)((long)pvVar72 + uVar57 * 4 + 0x20);
                              pfVar3 = (float *)((long)pvVar72 + uVar57 * 4 + 0x40);
                              fVar222 = fVar86 + fVar115;
                              pfVar4 = (float *)((long)pvVar72 + uVar57 * 4 + 0x60);
                              in_ZMM3 = ZEXT3264(CONCAT428(fVar222,CONCAT424(fVar116 * pfVar4[6],
                                                                             CONCAT420(fVar116 * 
                                                  pfVar4[5],
                                                  CONCAT416(fVar116 * pfVar4[4],
                                                            CONCAT412(fVar116 * pfVar4[3],
                                                                      CONCAT48(fVar116 * pfVar4[2],
                                                                               CONCAT44(fVar116 * 
                                                  pfVar4[1],fVar116 * *pfVar4))))))));
                              auVar306 = ZEXT3264(CONCAT428(auVar306._28_4_ + fVar73 + fVar222 +
                                                            fVar222,CONCAT424(auVar306._24_4_ +
                                                                              fVar73 * pfVar1[6] +
                                                                              fVar86 * pfVar2[6] +
                                                                              fVar115 * pfVar3[6] +
                                                                              fVar116 * pfVar4[6],
                                                                              CONCAT420(auVar306.
                                                  _20_4_ + fVar73 * pfVar1[5] +
                                                  fVar86 * pfVar2[5] + fVar115 * pfVar3[5] +
                                                  fVar116 * pfVar4[5],
                                                  CONCAT416(auVar306._16_4_ + fVar73 * pfVar1[4] +
                                                            fVar86 * pfVar2[4] + fVar115 * pfVar3[4]
                                                            + fVar116 * pfVar4[4],
                                                            CONCAT412(auVar306._12_4_ +
                                                                      fVar73 * pfVar1[3] +
                                                                      fVar86 * pfVar2[3] +
                                                                      fVar115 * pfVar3[3] +
                                                                      fVar116 * pfVar4[3],
                                                                      CONCAT48(auVar306._8_4_ +
                                                                               fVar73 * pfVar1[2] +
                                                                               fVar86 * pfVar2[2] +
                                                                               fVar115 * pfVar3[2] +
                                                                               fVar116 * pfVar4[2],
                                                                               CONCAT44(auVar306.
                                                  _4_4_ + fVar73 * pfVar1[1] +
                                                  fVar86 * pfVar2[1] + fVar115 * pfVar3[1] +
                                                  fVar116 * pfVar4[1],
                                                  auVar306._0_4_ + fVar73 * *pfVar1 +
                                                  fVar86 * *pfVar2 + fVar115 * *pfVar3 +
                                                  fVar116 * *pfVar4))))))));
                            }
                            uVar67 = uVar67 + 0x20;
                            iVar47 = iVar47 + iVar60;
                            uVar62 = uVar62 - 1;
                          } while (uVar62 != 0);
                        }
                        uVar69 = uVar69 + 1;
                        uVar71 = uVar71 + (ulong)uVar18 * 0x20;
                      } while (uVar69 != uVar19);
                    }
                    pvVar72 = (void *)((long)pvVar72 + (long)(int)(uVar18 * uVar19 * 0x20) * 4);
                    uVar63 = uVar63 + 1;
                  } while (uVar63 != uVar21);
                }
                auVar303 = auVar306._0_32_;
                fVar238 = auVar306._8_4_;
                fVar279 = auVar306._12_4_;
                fVar280 = auVar306._16_4_;
                fVar281 = auVar306._20_4_;
                fVar282 = auVar306._24_4_;
                fVar166 = auVar294._0_4_;
                fVar214 = auVar294._4_4_;
                fVar215 = auVar294._8_4_;
                fVar216 = auVar294._12_4_;
                fVar217 = auVar294._16_4_;
                fVar218 = auVar294._20_4_;
                fVar220 = auVar294._24_4_;
                fVar295 = auVar294._28_4_;
                auVar301 = auVar293._0_32_;
                fVar73 = auVar293._0_4_;
                fVar86 = auVar293._4_4_;
                fVar115 = auVar293._8_4_;
                fVar116 = auVar293._12_4_;
                fVar222 = auVar293._16_4_;
                fVar117 = auVar293._20_4_;
                fVar219 = auVar293._24_4_;
                fVar221 = auVar293._28_4_;
                auVar308._28_36_ = auVar306._28_36_;
                switch(uVar20) {
                case 1:
                  auVar303 = vmaxps_avx(auVar303,auVar237._0_32_);
                  break;
                case 2:
                  auVar301 = vmaxps_avx(auVar303,ZEXT1632(ZEXT816(0) << 0x40));
                  in_ZMM7 = ZEXT3264(auVar301);
                  auVar237 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar236 = vminps_avx(auVar303,ZEXT1632(ZEXT816(0) << 0x40));
                  fVar73 = **(float **)(&this->field_0x118 + (long)p_Var55);
                  auVar303._0_4_ = fVar73 * auVar236._0_4_ + auVar301._0_4_;
                  auVar303._4_4_ = fVar73 * auVar236._4_4_ + auVar301._4_4_;
                  auVar303._8_4_ = fVar73 * auVar236._8_4_ + auVar301._8_4_;
                  auVar303._12_4_ = fVar73 * auVar236._12_4_ + auVar301._12_4_;
                  auVar303._16_4_ = fVar73 * auVar236._16_4_ + auVar301._16_4_;
                  auVar303._20_4_ = fVar73 * auVar236._20_4_ + auVar301._20_4_;
                  auVar303._24_4_ = fVar73 * auVar236._24_4_ + auVar301._24_4_;
                  auVar303._28_4_ = auVar236._28_4_ + auVar301._28_4_;
                  break;
                case 3:
                  uVar9 = **(undefined4 **)(&this->field_0x118 + (long)p_Var55);
                  auVar271._4_4_ = uVar9;
                  auVar271._0_4_ = uVar9;
                  auVar271._8_4_ = uVar9;
                  auVar271._12_4_ = uVar9;
                  auVar271._16_4_ = uVar9;
                  auVar271._20_4_ = uVar9;
                  auVar271._24_4_ = uVar9;
                  auVar271._28_4_ = uVar9;
                  uVar9 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var55))[1];
                  auVar324._4_4_ = uVar9;
                  auVar324._0_4_ = uVar9;
                  auVar324._8_4_ = uVar9;
                  auVar324._12_4_ = uVar9;
                  auVar324._16_4_ = uVar9;
                  auVar324._20_4_ = uVar9;
                  auVar324._24_4_ = uVar9;
                  auVar324._28_4_ = uVar9;
                  auVar301 = vmaxps_avx(auVar303,auVar271);
                  in_ZMM7 = ZEXT3264(auVar301);
                  auVar303 = vminps_avx(auVar324,auVar301);
                  break;
                case 4:
                  auVar272._0_8_ = auVar306._0_8_ ^ 0x8000000080000000;
                  auVar272._8_4_ = -fVar238;
                  auVar272._12_4_ = -fVar279;
                  auVar272._16_4_ = -fVar280;
                  auVar272._20_4_ = -fVar281;
                  auVar272._24_4_ = -fVar282;
                  auVar272._28_4_ = -auVar306._28_4_;
                  auVar110._8_4_ = 0x42b0c0a5;
                  auVar110._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar110._12_4_ = 0x42b0c0a5;
                  auVar110._16_4_ = 0x42b0c0a5;
                  auVar110._20_4_ = 0x42b0c0a5;
                  auVar110._24_4_ = 0x42b0c0a5;
                  auVar110._28_4_ = 0x42b0c0a5;
                  auVar236 = vminps_avx(auVar272,auVar110);
                  auVar111._8_4_ = 0xc2b0c0a5;
                  auVar111._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar111._12_4_ = 0xc2b0c0a5;
                  auVar111._16_4_ = 0xc2b0c0a5;
                  auVar111._20_4_ = 0xc2b0c0a5;
                  auVar111._24_4_ = 0xc2b0c0a5;
                  auVar111._28_4_ = 0xc2b0c0a5;
                  auVar79 = vmaxps_avx(auVar236,auVar111);
                  auVar302._0_4_ = auVar79._0_4_ * 1.442695 + fVar166;
                  auVar302._4_4_ = auVar79._4_4_ * 1.442695 + fVar214;
                  auVar302._8_4_ = auVar79._8_4_ * 1.442695 + fVar215;
                  auVar302._12_4_ = auVar79._12_4_ * 1.442695 + fVar216;
                  auVar302._16_4_ = auVar79._16_4_ * 1.442695 + fVar217;
                  auVar302._20_4_ = auVar79._20_4_ * 1.442695 + fVar218;
                  auVar302._24_4_ = auVar79._24_4_ * 1.442695 + fVar220;
                  auVar302._28_4_ = auVar306._28_4_ + fVar295;
                  auVar157 = vroundps_avx(auVar302,1);
                  auVar236 = vcmpps_avx(auVar302,auVar157,1);
                  auVar236 = vandps_avx(auVar236,auVar301);
                  auVar236 = vsubps_avx(auVar157,auVar236);
                  fVar238 = auVar236._0_4_ * -0.6931472 + auVar79._0_4_;
                  fVar279 = auVar236._4_4_ * -0.6931472 + auVar79._4_4_;
                  fVar280 = auVar236._8_4_ * -0.6931472 + auVar79._8_4_;
                  fVar281 = auVar236._12_4_ * -0.6931472 + auVar79._12_4_;
                  fVar282 = auVar236._16_4_ * -0.6931472 + auVar79._16_4_;
                  fVar310 = auVar236._20_4_ * -0.6931472 + auVar79._20_4_;
                  fVar326 = auVar236._24_4_ * -0.6931472 + auVar79._24_4_;
                  auVar241._0_4_ = (int)auVar236._0_4_;
                  auVar241._4_4_ = (int)auVar236._4_4_;
                  auVar241._8_4_ = (int)auVar236._8_4_;
                  auVar241._12_4_ = (int)auVar236._12_4_;
                  auVar273._16_4_ = (int)auVar236._16_4_;
                  auVar273._0_16_ = auVar241;
                  auVar273._20_4_ = (int)auVar236._20_4_;
                  auVar273._24_4_ = (int)auVar236._24_4_;
                  auVar273._28_4_ = (int)auVar236._28_4_;
                  auVar239 = vpslld_avx(auVar241,0x17);
                  auVar167 = vpslld_avx(auVar273._16_16_,0x17);
                  auVar88._8_4_ = 0x3f800000;
                  auVar88._0_8_ = 0x3f8000003f800000;
                  auVar88._12_4_ = 0x3f800000;
                  auVar167 = vpaddd_avx(auVar167,auVar88);
                  auVar239 = vpaddd_avx(auVar239,auVar88);
                  auVar160._0_4_ =
                       (fVar238 + fVar73 +
                       fVar238 * fVar238 *
                       (fVar166 +
                       ((((fVar238 * 0.00019875691 + 0.0013981999) * fVar238 + 0.008333452) *
                         fVar238 + 0.041665796) * fVar238 + 0.16666666) * fVar238)) * auVar239._0_4_
                       + fVar73;
                  auVar160._4_4_ =
                       (fVar279 + fVar86 +
                       fVar279 * fVar279 *
                       (fVar214 +
                       ((((fVar279 * 0.00019875691 + 0.0013981999) * fVar279 + 0.008333452) *
                         fVar279 + 0.041665796) * fVar279 + 0.16666666) * fVar279)) * auVar239._4_4_
                       + fVar86;
                  auVar160._8_4_ =
                       (fVar280 + fVar115 +
                       fVar280 * fVar280 *
                       (fVar215 +
                       ((((fVar280 * 0.00019875691 + 0.0013981999) * fVar280 + 0.008333452) *
                         fVar280 + 0.041665796) * fVar280 + 0.16666666) * fVar280)) * auVar239._8_4_
                       + fVar115;
                  auVar160._12_4_ =
                       (fVar281 + fVar116 +
                       fVar281 * fVar281 *
                       (fVar216 +
                       ((((fVar281 * 0.00019875691 + 0.0013981999) * fVar281 + 0.008333452) *
                         fVar281 + 0.041665796) * fVar281 + 0.16666666) * fVar281)) *
                       auVar239._12_4_ + fVar116;
                  auVar160._16_4_ =
                       (fVar282 + fVar222 +
                       fVar282 * fVar282 *
                       (fVar217 +
                       ((((fVar282 * 0.00019875691 + 0.0013981999) * fVar282 + 0.008333452) *
                         fVar282 + 0.041665796) * fVar282 + 0.16666666) * fVar282)) * auVar167._0_4_
                       + fVar222;
                  auVar160._20_4_ =
                       (fVar310 + fVar117 +
                       fVar310 * fVar310 *
                       (fVar218 +
                       ((((fVar310 * 0.00019875691 + 0.0013981999) * fVar310 + 0.008333452) *
                         fVar310 + 0.041665796) * fVar310 + 0.16666666) * fVar310)) * auVar167._4_4_
                       + fVar117;
                  auVar160._24_4_ =
                       (fVar326 + fVar219 +
                       fVar326 * fVar326 *
                       (fVar220 +
                       ((((fVar326 * 0.00019875691 + 0.0013981999) * fVar326 + 0.008333452) *
                         fVar326 + 0.041665796) * fVar326 + 0.16666666) * fVar326)) * auVar167._8_4_
                       + fVar219;
                  auVar160._28_4_ =
                       auVar157._28_4_ + auVar79._28_4_ + fVar221 + fVar295 + -0.47508308 + fVar221;
                  auVar236 = vrcpps_avx(auVar160);
                  in_ZMM7 = ZEXT3264(auVar236);
                  fVar73 = auVar236._0_4_;
                  fVar86 = auVar236._4_4_;
                  auVar40._4_4_ = auVar160._4_4_ * fVar86;
                  auVar40._0_4_ = auVar160._0_4_ * fVar73;
                  fVar115 = auVar236._8_4_;
                  auVar40._8_4_ = auVar160._8_4_ * fVar115;
                  fVar116 = auVar236._12_4_;
                  auVar40._12_4_ = auVar160._12_4_ * fVar116;
                  fVar222 = auVar236._16_4_;
                  auVar40._16_4_ = auVar160._16_4_ * fVar222;
                  fVar117 = auVar236._20_4_;
                  auVar40._20_4_ = auVar160._20_4_ * fVar117;
                  fVar219 = auVar236._24_4_;
                  auVar40._24_4_ = auVar160._24_4_ * fVar219;
                  auVar40._28_4_ = auVar160._28_4_;
                  auVar301 = vsubps_avx(auVar301,auVar40);
                  auVar303._0_4_ = fVar73 + fVar73 * auVar301._0_4_;
                  auVar303._4_4_ = fVar86 + fVar86 * auVar301._4_4_;
                  auVar303._8_4_ = fVar115 + fVar115 * auVar301._8_4_;
                  auVar303._12_4_ = fVar116 + fVar116 * auVar301._12_4_;
                  auVar303._16_4_ = fVar222 + fVar222 * auVar301._16_4_;
                  auVar303._20_4_ = fVar117 + fVar117 * auVar301._20_4_;
                  auVar303._24_4_ = fVar219 + fVar219 * auVar301._24_4_;
                  auVar303._28_4_ = auVar236._28_4_ + auVar301._28_4_;
                  break;
                case 5:
                  auVar236 = vminps_avx(auVar303,auVar288);
                  auVar79 = vmaxps_avx(auVar291,auVar236);
                  auVar269._0_4_ = fVar166 + auVar79._0_4_ * 1.442695;
                  auVar269._4_4_ = fVar214 + auVar79._4_4_ * 1.442695;
                  auVar269._8_4_ = fVar215 + auVar79._8_4_ * 1.442695;
                  auVar269._12_4_ = fVar216 + auVar79._12_4_ * 1.442695;
                  auVar269._16_4_ = fVar217 + auVar79._16_4_ * 1.442695;
                  auVar269._20_4_ = fVar218 + auVar79._20_4_ * 1.442695;
                  auVar269._24_4_ = fVar220 + auVar79._24_4_ * 1.442695;
                  auVar269._28_4_ = fVar295 + in_ZMM7._28_4_;
                  auVar157 = vroundps_avx(auVar269,1);
                  auVar236 = vcmpps_avx(auVar269,auVar157,1);
                  auVar236 = vandps_avx(auVar236,auVar301);
                  auVar236 = vsubps_avx(auVar157,auVar236);
                  auVar36._4_4_ = auVar236._4_4_ * 0.6931472;
                  auVar36._0_4_ = auVar236._0_4_ * 0.6931472;
                  auVar36._8_4_ = auVar236._8_4_ * 0.6931472;
                  auVar36._12_4_ = auVar236._12_4_ * 0.6931472;
                  auVar36._16_4_ = auVar236._16_4_ * 0.6931472;
                  auVar36._20_4_ = auVar236._20_4_ * 0.6931472;
                  auVar36._24_4_ = auVar236._24_4_ * 0.6931472;
                  auVar36._28_4_ = auVar157._28_4_;
                  auVar79 = vsubps_avx(auVar79,auVar36);
                  fVar310 = auVar79._0_4_;
                  fVar326 = auVar79._4_4_;
                  fVar327 = auVar79._8_4_;
                  fVar328 = auVar79._12_4_;
                  fVar329 = auVar79._16_4_;
                  fVar330 = auVar79._20_4_;
                  fVar331 = auVar79._24_4_;
                  auVar168._0_4_ = (int)auVar236._0_4_;
                  auVar168._4_4_ = (int)auVar236._4_4_;
                  auVar168._8_4_ = (int)auVar236._8_4_;
                  auVar168._12_4_ = (int)auVar236._12_4_;
                  auVar204._16_4_ = (int)auVar236._16_4_;
                  auVar204._0_16_ = auVar168;
                  auVar204._20_4_ = (int)auVar236._20_4_;
                  auVar204._24_4_ = (int)auVar236._24_4_;
                  auVar204._28_4_ = (int)auVar236._28_4_;
                  auVar239 = vpslld_avx(auVar168,0x17);
                  auVar167 = vpslld_avx(auVar204._16_16_,0x17);
                  auVar231._8_4_ = 0x3f800000;
                  auVar231._0_8_ = 0x3f8000003f800000;
                  auVar231._12_4_ = 0x3f800000;
                  auVar167 = vpaddd_avx(auVar167,auVar231);
                  auVar239 = vpaddd_avx(auVar239,auVar231);
                  auVar270._0_4_ =
                       (fVar310 + fVar73 +
                       fVar310 * fVar310 *
                       (((((fVar310 * 0.00019875691 + 0.0013981999) * fVar310 + 0.008333452) *
                          fVar310 + 0.041665796) * fVar310 + 0.16666666) * fVar310 + fVar166)) *
                       auVar239._0_4_ + fVar73;
                  auVar270._4_4_ =
                       (fVar326 + fVar86 +
                       fVar326 * fVar326 *
                       (((((fVar326 * 0.00019875691 + 0.0013981999) * fVar326 + 0.008333452) *
                          fVar326 + 0.041665796) * fVar326 + 0.16666666) * fVar326 + fVar214)) *
                       auVar239._4_4_ + fVar86;
                  auVar270._8_4_ =
                       (fVar327 + fVar115 +
                       fVar327 * fVar327 *
                       (((((fVar327 * 0.00019875691 + 0.0013981999) * fVar327 + 0.008333452) *
                          fVar327 + 0.041665796) * fVar327 + 0.16666666) * fVar327 + fVar215)) *
                       auVar239._8_4_ + fVar115;
                  auVar270._12_4_ =
                       (fVar328 + fVar116 +
                       fVar328 * fVar328 *
                       (((((fVar328 * 0.00019875691 + 0.0013981999) * fVar328 + 0.008333452) *
                          fVar328 + 0.041665796) * fVar328 + 0.16666666) * fVar328 + fVar216)) *
                       auVar239._12_4_ + fVar116;
                  auVar270._16_4_ =
                       (fVar329 + fVar222 +
                       fVar329 * fVar329 *
                       (((((fVar329 * 0.00019875691 + 0.0013981999) * fVar329 + 0.008333452) *
                          fVar329 + 0.041665796) * fVar329 + 0.16666666) * fVar329 + fVar217)) *
                       auVar167._0_4_ + fVar222;
                  auVar270._20_4_ =
                       (fVar330 + fVar117 +
                       fVar330 * fVar330 *
                       (((((fVar330 * 0.00019875691 + 0.0013981999) * fVar330 + 0.008333452) *
                          fVar330 + 0.041665796) * fVar330 + 0.16666666) * fVar330 + fVar218)) *
                       auVar167._4_4_ + fVar117;
                  auVar270._24_4_ =
                       (fVar331 + fVar219 +
                       fVar331 * fVar331 *
                       (((((fVar331 * 0.00019875691 + 0.0013981999) * fVar331 + 0.008333452) *
                          fVar331 + 0.041665796) * fVar331 + 0.16666666) * fVar331 + fVar220)) *
                       auVar167._8_4_ + fVar219;
                  auVar270._28_4_ =
                       auVar79._28_4_ + fVar221 +
                       in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                       fVar295 + fVar221;
                  auVar80._8_4_ = 0x800000;
                  auVar80._0_8_ = 0x80000000800000;
                  auVar80._12_4_ = 0x800000;
                  auVar80._16_4_ = 0x800000;
                  auVar80._20_4_ = 0x800000;
                  auVar80._24_4_ = 0x800000;
                  auVar80._28_4_ = 0x800000;
                  auVar157 = vmaxps_avx(auVar270,auVar80);
                  auVar167 = vpsrld_avx(auVar157._16_16_,0x17);
                  auVar81._8_4_ = 0x807fffff;
                  auVar81._0_8_ = 0x807fffff807fffff;
                  auVar81._12_4_ = 0x807fffff;
                  auVar81._16_4_ = 0x807fffff;
                  auVar81._20_4_ = 0x807fffff;
                  auVar81._24_4_ = 0x807fffff;
                  auVar81._28_4_ = 0x807fffff;
                  auVar236 = vandps_avx(auVar157,auVar81);
                  auVar203 = vorps_avx(auVar236,auVar294._0_32_);
                  auVar82._8_4_ = 0x3f3504f3;
                  auVar82._0_8_ = 0x3f3504f33f3504f3;
                  auVar82._12_4_ = 0x3f3504f3;
                  auVar82._16_4_ = 0x3f3504f3;
                  auVar82._20_4_ = 0x3f3504f3;
                  auVar82._24_4_ = 0x3f3504f3;
                  auVar82._28_4_ = 0x3f3504f3;
                  auVar79 = vcmpps_avx(auVar82,auVar203,2);
                  auVar236 = vandnps_avx(auVar79,auVar203);
                  fVar310 = auVar203._0_4_ + -1.0 + auVar236._0_4_;
                  fVar326 = auVar203._4_4_ + -1.0 + auVar236._4_4_;
                  fVar327 = auVar203._8_4_ + -1.0 + auVar236._8_4_;
                  fVar328 = auVar203._12_4_ + -1.0 + auVar236._12_4_;
                  fVar329 = auVar203._16_4_ + -1.0 + auVar236._16_4_;
                  fVar330 = auVar203._20_4_ + -1.0 + auVar236._20_4_;
                  fVar331 = auVar203._24_4_ + -1.0 + auVar236._24_4_;
                  auVar167 = vpsubd_avx(auVar167,auVar79._16_16_);
                  auVar239 = vpsrld_avx(auVar157._0_16_,0x17);
                  auVar75._8_4_ = 0xffffff81;
                  auVar75._0_8_ = 0xffffff81ffffff81;
                  auVar75._12_4_ = 0xffffff81;
                  auVar167 = vpaddd_avx(auVar167,auVar75);
                  auVar239 = vpsubd_avx(auVar239,auVar79._0_16_);
                  auVar239 = vpaddd_avx(auVar239,auVar75);
                  auVar158._16_16_ = auVar167;
                  auVar158._0_16_ = auVar239;
                  auVar237 = ZEXT864(0) << 0x20;
                  auVar79 = vcmpps_avx(auVar270,ZEXT832(0) << 0x20,2);
                  auVar157 = vcvtdq2ps_avx(auVar158);
                  auVar37._4_4_ =
                       (fVar326 + auVar157._4_4_ * 0.6931472 +
                       fVar326 * fVar326 *
                       (fVar326 * (fVar326 * (fVar326 * (fVar326 * (fVar326 * (fVar326 * (fVar326 * 
                                                  (fVar326 * (fVar326 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar37._0_4_ =
                       (fVar310 + auVar157._0_4_ * 0.6931472 +
                       fVar310 * fVar310 *
                       (fVar310 * (fVar310 * (fVar310 * (fVar310 * (fVar310 * (fVar310 * (fVar310 * 
                                                  (fVar310 * (fVar310 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar37._8_4_ =
                       (fVar327 + auVar157._8_4_ * 0.6931472 +
                       fVar327 * fVar327 *
                       (fVar327 * (fVar327 * (fVar327 * (fVar327 * (fVar327 * (fVar327 * (fVar327 * 
                                                  (fVar327 * (fVar327 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar37._12_4_ =
                       (fVar328 + auVar157._12_4_ * 0.6931472 +
                       fVar328 * fVar328 *
                       (fVar328 * (fVar328 * (fVar328 * (fVar328 * (fVar328 * (fVar328 * (fVar328 * 
                                                  (fVar328 * (fVar328 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar37._16_4_ =
                       (fVar329 + auVar157._16_4_ * 0.6931472 +
                       fVar329 * fVar329 *
                       (fVar329 * (fVar329 * (fVar329 * (fVar329 * (fVar329 * (fVar329 * (fVar329 * 
                                                  (fVar329 * (fVar329 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar37._20_4_ =
                       (fVar330 + auVar157._20_4_ * 0.6931472 +
                       fVar330 * fVar330 *
                       (fVar330 * (fVar330 * (fVar330 * (fVar330 * (fVar330 * (fVar330 * (fVar330 * 
                                                  (fVar330 * (fVar330 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar37._24_4_ =
                       (fVar331 + auVar157._24_4_ * 0.6931472 +
                       fVar331 * fVar331 *
                       (fVar331 * (fVar331 * (fVar331 * (fVar331 * (fVar331 * (fVar331 * (fVar331 * 
                                                  (fVar331 * (fVar331 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar37._28_4_ = auVar203._28_4_ + -1.0 + auVar236._28_4_ + auVar157._28_4_ + 0.0;
                  auVar205._8_4_ = 0x7fffffff;
                  auVar205._0_8_ = 0x7fffffff7fffffff;
                  auVar205._12_4_ = 0x7fffffff;
                  auVar205._16_4_ = 0x7fffffff;
                  auVar205._20_4_ = 0x7fffffff;
                  auVar205._24_4_ = 0x7fffffff;
                  auVar205._28_4_ = 0x7fffffff;
                  auVar236 = vblendvps_avx(auVar37,auVar205,auVar79);
                  auVar236 = vminps_avx(auVar288,auVar236);
                  auVar79 = vmaxps_avx(auVar291,auVar236);
                  auVar206._0_4_ = auVar79._0_4_ * 1.442695 + fVar166;
                  auVar206._4_4_ = auVar79._4_4_ * 1.442695 + fVar214;
                  auVar206._8_4_ = auVar79._8_4_ * 1.442695 + fVar215;
                  auVar206._12_4_ = auVar79._12_4_ * 1.442695 + fVar216;
                  auVar206._16_4_ = auVar79._16_4_ * 1.442695 + fVar217;
                  auVar206._20_4_ = auVar79._20_4_ * 1.442695 + fVar218;
                  auVar206._24_4_ = auVar79._24_4_ * 1.442695 + fVar220;
                  auVar206._28_4_ = fVar295 + NAN;
                  auVar157 = vroundps_avx(auVar206,1);
                  auVar236 = vcmpps_avx(auVar206,auVar157,1);
                  auVar236 = vandps_avx(auVar236,auVar301);
                  auVar236 = vsubps_avx(auVar157,auVar236);
                  auVar38._4_4_ = auVar236._4_4_ * 0.6931472;
                  auVar38._0_4_ = auVar236._0_4_ * 0.6931472;
                  auVar38._8_4_ = auVar236._8_4_ * 0.6931472;
                  auVar38._12_4_ = auVar236._12_4_ * 0.6931472;
                  auVar38._16_4_ = auVar236._16_4_ * 0.6931472;
                  auVar38._20_4_ = auVar236._20_4_ * 0.6931472;
                  auVar38._24_4_ = auVar236._24_4_ * 0.6931472;
                  auVar38._28_4_ = auVar157._28_4_;
                  auVar79 = vsubps_avx(auVar79,auVar38);
                  fVar310 = auVar79._0_4_;
                  fVar326 = auVar79._4_4_;
                  fVar327 = auVar79._8_4_;
                  fVar328 = auVar79._12_4_;
                  fVar329 = auVar79._16_4_;
                  fVar330 = auVar79._20_4_;
                  fVar331 = auVar79._24_4_;
                  auVar293 = ZEXT3264(auVar301);
                  auVar294 = ZEXT3264(auVar294._0_32_);
                  fVar166 = fVar166 + ((((fVar310 * 0.00019875691 + 0.0013981999) * fVar310 +
                                        0.008333452) * fVar310 + 0.041665796) * fVar310 + 0.16666666
                                      ) * fVar310;
                  fVar214 = fVar214 + ((((fVar326 * 0.00019875691 + 0.0013981999) * fVar326 +
                                        0.008333452) * fVar326 + 0.041665796) * fVar326 + 0.16666666
                                      ) * fVar326;
                  fVar215 = fVar215 + ((((fVar327 * 0.00019875691 + 0.0013981999) * fVar327 +
                                        0.008333452) * fVar327 + 0.041665796) * fVar327 + 0.16666666
                                      ) * fVar327;
                  fVar216 = fVar216 + ((((fVar328 * 0.00019875691 + 0.0013981999) * fVar328 +
                                        0.008333452) * fVar328 + 0.041665796) * fVar328 + 0.16666666
                                      ) * fVar328;
                  fVar217 = fVar217 + ((((fVar329 * 0.00019875691 + 0.0013981999) * fVar329 +
                                        0.008333452) * fVar329 + 0.041665796) * fVar329 + 0.16666666
                                      ) * fVar329;
                  fVar218 = fVar218 + ((((fVar330 * 0.00019875691 + 0.0013981999) * fVar330 +
                                        0.008333452) * fVar330 + 0.041665796) * fVar330 + 0.16666666
                                      ) * fVar330;
                  fVar220 = fVar220 + ((((fVar331 * 0.00019875691 + 0.0013981999) * fVar331 +
                                        0.008333452) * fVar331 + 0.041665796) * fVar331 + 0.16666666
                                      ) * fVar331;
                  in_ZMM7 = ZEXT3264(CONCAT428(fVar295 + auVar270._28_4_ + 0.0013981999 +
                                                         0.008333452 + 0.041665796 + 0.16666666,
                                               CONCAT424(fVar220,CONCAT420(fVar218,CONCAT416(fVar217
                                                  ,CONCAT412(fVar216,CONCAT48(fVar215,CONCAT44(
                                                  fVar214,fVar166))))))));
                  auVar169._0_4_ = (int)auVar236._0_4_;
                  auVar169._4_4_ = (int)auVar236._4_4_;
                  auVar169._8_4_ = (int)auVar236._8_4_;
                  auVar169._12_4_ = (int)auVar236._12_4_;
                  auVar207._16_4_ = (int)auVar236._16_4_;
                  auVar207._0_16_ = auVar169;
                  auVar207._20_4_ = (int)auVar236._20_4_;
                  auVar207._24_4_ = (int)auVar236._24_4_;
                  auVar207._28_4_ = (int)auVar236._28_4_;
                  auVar239 = vpslld_avx(auVar169,0x17);
                  auVar167 = vpslld_avx(auVar207._16_16_,0x17);
                  auVar87._8_4_ = 0x3f800000;
                  auVar87._0_8_ = 0x3f8000003f800000;
                  auVar87._12_4_ = 0x3f800000;
                  auVar167 = vpaddd_avx(auVar167,auVar87);
                  auVar239 = vpaddd_avx(auVar239,auVar87);
                  auVar159._0_4_ =
                       (fVar310 + fVar73 + fVar310 * fVar310 * fVar166) * auVar239._0_4_ + fVar73;
                  auVar159._4_4_ =
                       (fVar326 + fVar86 + fVar326 * fVar326 * fVar214) * auVar239._4_4_ + fVar86;
                  auVar159._8_4_ =
                       (fVar327 + fVar115 + fVar327 * fVar327 * fVar215) * auVar239._8_4_ + fVar115;
                  auVar159._12_4_ =
                       (fVar328 + fVar116 + fVar328 * fVar328 * fVar216) * auVar239._12_4_ + fVar116
                  ;
                  auVar159._16_4_ =
                       (fVar329 + fVar222 + fVar329 * fVar329 * fVar217) * auVar167._0_4_ + fVar222;
                  auVar159._20_4_ =
                       (fVar330 + fVar117 + fVar330 * fVar330 * fVar218) * auVar167._4_4_ + fVar117;
                  auVar159._24_4_ =
                       (fVar331 + fVar219 + fVar331 * fVar331 * fVar220) * auVar167._8_4_ + fVar219;
                  auVar159._28_4_ = auVar79._28_4_ + fVar221 + auVar157._28_4_ + fVar221;
                  auVar301 = vrcpps_avx(auVar159);
                  fVar73 = auVar301._0_4_;
                  fVar86 = auVar301._4_4_;
                  fVar115 = auVar301._8_4_;
                  fVar116 = auVar301._12_4_;
                  fVar222 = auVar301._16_4_;
                  fVar117 = auVar301._20_4_;
                  fVar219 = auVar301._24_4_;
                  auVar39._4_4_ = auVar159._4_4_ * (fVar86 + fVar86);
                  auVar39._0_4_ = auVar159._0_4_ * (fVar73 + fVar73);
                  auVar39._8_4_ = auVar159._8_4_ * (fVar115 + fVar115);
                  auVar39._12_4_ = auVar159._12_4_ * (fVar116 + fVar116);
                  auVar39._16_4_ = auVar159._16_4_ * (fVar222 + fVar222);
                  auVar39._20_4_ = auVar159._20_4_ * (fVar117 + fVar117);
                  auVar39._24_4_ = auVar159._24_4_ * (fVar219 + fVar219);
                  auVar39._28_4_ = auVar159._28_4_;
                  auVar109._8_4_ = 0x40000000;
                  auVar109._0_8_ = 0x4000000040000000;
                  auVar109._12_4_ = 0x40000000;
                  auVar109._16_4_ = 0x40000000;
                  auVar109._20_4_ = 0x40000000;
                  auVar109._24_4_ = 0x40000000;
                  auVar109._28_4_ = 0x40000000;
                  auVar236 = vsubps_avx(auVar109,auVar39);
                  auVar208._0_4_ = fVar73 + fVar73 + -1.0;
                  auVar208._4_4_ = fVar86 + fVar86 + -1.0;
                  auVar208._8_4_ = fVar115 + fVar115 + -1.0;
                  auVar208._12_4_ = fVar116 + fVar116 + -1.0;
                  auVar208._16_4_ = fVar222 + fVar222 + -1.0;
                  auVar208._20_4_ = fVar117 + fVar117 + -1.0;
                  auVar208._24_4_ = fVar219 + fVar219 + -1.0;
                  auVar208._28_4_ = auVar301._28_4_ + auVar301._28_4_ + -1.0;
                  auVar149._0_4_ = auVar208._0_4_ + fVar73 * auVar236._0_4_;
                  auVar149._4_4_ = auVar208._4_4_ + fVar86 * auVar236._4_4_;
                  auVar149._8_4_ = auVar208._8_4_ + fVar115 * auVar236._8_4_;
                  auVar149._12_4_ = auVar208._12_4_ + fVar116 * auVar236._12_4_;
                  auVar149._16_4_ = auVar208._16_4_ + fVar222 * auVar236._16_4_;
                  auVar149._20_4_ = auVar208._20_4_ + fVar117 * auVar236._20_4_;
                  auVar149._24_4_ = auVar208._24_4_ + fVar219 * auVar236._24_4_;
                  goto LAB_002b0c0b;
                case 6:
                  fVar73 = **(float **)(&this->field_0x118 + (long)p_Var55);
                  fVar86 = (*(float **)(&this->field_0x118 + (long)p_Var55))[1];
                  auVar208._4_4_ = fVar86;
                  auVar208._0_4_ = fVar86;
                  auVar208._8_4_ = fVar86;
                  auVar208._12_4_ = fVar86;
                  auVar208._16_4_ = fVar86;
                  auVar208._20_4_ = fVar86;
                  auVar208._24_4_ = fVar86;
                  auVar208._28_4_ = fVar86;
                  auVar161._0_4_ = auVar306._0_4_ * fVar73 + fVar86;
                  auVar161._4_4_ = auVar306._4_4_ * fVar73 + fVar86;
                  auVar161._8_4_ = fVar238 * fVar73 + fVar86;
                  auVar161._12_4_ = fVar279 * fVar73 + fVar86;
                  auVar161._16_4_ = fVar280 * fVar73 + fVar86;
                  auVar161._20_4_ = fVar281 * fVar73 + fVar86;
                  auVar161._24_4_ = fVar282 * fVar73 + fVar86;
                  auVar161._28_4_ = fVar73 + fVar86;
                  auVar236 = vmaxps_avx(auVar161,auVar237._0_32_);
                  auVar301 = vminps_avx(auVar236,auVar301);
                  auVar149 = auVar301._0_28_;
LAB_002b0c0b:
                  in_ZMM3 = ZEXT3264(auVar208);
                  auVar308._0_4_ = auVar306._0_4_ * auVar149._0_4_;
                  auVar308._4_4_ = auVar306._4_4_ * auVar149._4_4_;
                  auVar308._8_4_ = fVar238 * auVar149._8_4_;
                  auVar308._12_4_ = fVar279 * auVar149._12_4_;
                  auVar308._16_4_ = fVar280 * auVar149._16_4_;
                  auVar308._20_4_ = fVar281 * auVar149._20_4_;
                  auVar308._24_4_ = fVar282 * auVar149._24_4_;
                  auVar303 = auVar308._0_32_;
                }
                *(undefined1 (*) [32])pAVar66 = auVar303;
                pAVar66 = pAVar66 + 0x20;
                uVar68 = uVar68 + 1;
                iVar53 = iVar53 + 1;
              } while (uVar68 != local_c8.w);
            }
            iVar61 = iVar61 + 1;
          } while (iVar61 != local_c8.h);
        }
        local_1a0 = local_1a0 + 1;
      } while (local_1a0 != local_c8.c);
    }
    if (((iVar16 == 8) && (local_154 == 4)) && (0 < (long)local_c8.c)) {
      p_Var55 = local_70[-3];
      iVar60 = *(int *)(&this->field_0xdc + (long)p_Var55);
      iVar54 = *(int *)(&this->field_0xe0 + (long)p_Var55);
      iVar17 = *(int *)(&this->field_0xe4 + (long)p_Var55);
      iVar70 = *(int *)(&this->field_0xe8 + (long)p_Var55);
      uVar20 = *(undefined4 *)(&this->field_0x114 + (long)p_Var55);
      lVar65 = *(long *)(&this->field_0x1a8 + (long)p_Var55);
      uVar18 = *(uint *)(&this->field_0xd4 + (long)p_Var55);
      uVar19 = *(uint *)(&this->field_0xd8 + (long)p_Var55);
      local_1a0 = 0;
      auVar293 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar232._8_4_ = 0x3f000000;
      auVar232._0_8_ = 0x3f0000003f000000;
      auVar232._12_4_ = 0x3f000000;
      auVar237 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      do {
        if (0 < local_c8.h) {
          iVar51 = bottom_blob->w;
          iVar52 = bottom_blob->h;
          pAVar66 = (Allocator *)
                    ((long)local_c8.data +
                    local_c8.cstep * local_1a0 *
                    CONCAT44(local_c8.elemsize._4_4_,(int)local_c8.elemsize));
          uVar21 = bottom_blob->c;
          iVar61 = 0;
          do {
            if (0 < local_c8.w) {
              uVar68 = 0;
              iVar53 = (1 - uVar18) * iVar60;
              do {
                if (lVar65 == 0) {
                  auVar89 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar89 = *(undefined1 (*) [16])(lVar65 + local_1a0 * 0x10);
                }
                auVar294 = ZEXT1664(auVar89);
                if (0 < (int)uVar21) {
                  pvVar72 = (void *)((this->weight_data_tm).cstep * local_1a0 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar24 = bottom_blob->data;
                  uVar63 = 0;
                  do {
                    if (0 < (int)uVar19) {
                      uVar71 = 0;
                      uVar69 = 0;
                      do {
                        iVar47 = (((int)uVar69 - uVar19) + 1) * iVar54 + iVar61;
                        if ((((-1 < iVar47) && (iVar48 = iVar47 / iVar70, iVar47 % iVar70 == 0)) &&
                            (0 < (int)uVar18)) && (iVar48 < iVar52)) {
                          lVar58 = (long)iVar48 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar63;
                          uVar62 = uVar71;
                          uVar67 = (ulong)uVar18;
                          iVar47 = iVar53;
                          do {
                            if (((-1 < iVar47) && (iVar48 = iVar47 / iVar17, iVar47 % iVar17 == 0))
                               && (iVar48 < iVar51)) {
                              lVar56 = (long)(iVar48 << 3);
                              fVar73 = *(float *)((long)pvVar24 + lVar56 * 4 + lVar58);
                              fVar86 = *(float *)((long)pvVar24 + lVar56 * 4 + lVar58 + 4);
                              fVar115 = *(float *)((long)pvVar24 + lVar56 * 4 + lVar58 + 8);
                              fVar116 = *(float *)((long)pvVar24 + lVar56 * 4 + lVar58 + 0xc);
                              fVar222 = *(float *)((long)pvVar24 + lVar56 * 4 + lVar58 + 0x10);
                              fVar117 = *(float *)((long)pvVar24 + lVar56 * 4 + lVar58 + 0x14);
                              fVar219 = *(float *)((long)pvVar24 + lVar56 * 4 + lVar58 + 0x18);
                              fVar221 = *(float *)((long)pvVar24 + lVar56 * 4 + lVar58 + 0x1c);
                              uVar57 = uVar62 & 0xffffffff;
                              pfVar1 = (float *)((long)pvVar72 + uVar57 * 4);
                              pfVar2 = (float *)((long)pvVar72 + uVar57 * 4 + 0x10);
                              pfVar3 = (float *)((long)pvVar72 + uVar57 * 4 + 0x20);
                              pfVar4 = (float *)((long)pvVar72 + uVar57 * 4 + 0x30);
                              pfVar5 = (float *)((long)pvVar72 + uVar57 * 4 + 0x40);
                              in_ZMM7 = ZEXT1664(CONCAT412(fVar222 * pfVar5[3],
                                                           CONCAT48(fVar222 * pfVar5[2],
                                                                    CONCAT44(fVar222 * pfVar5[1],
                                                                             fVar222 * *pfVar5))));
                              pfVar6 = (float *)((long)pvVar72 + uVar57 * 4 + 0x50);
                              pfVar7 = (float *)((long)pvVar72 + uVar57 * 4 + 0x60);
                              pfVar8 = (float *)((long)pvVar72 + uVar57 * 4 + 0x70);
                              in_ZMM3 = ZEXT1664(CONCAT412(fVar221 * pfVar8[3],
                                                           CONCAT48(fVar221 * pfVar8[2],
                                                                    CONCAT44(fVar221 * pfVar8[1],
                                                                             fVar221 * *pfVar8))));
                              auVar294 = ZEXT1664(CONCAT412(fVar73 * pfVar1[3] + auVar294._12_4_ +
                                                            fVar86 * pfVar2[3] + fVar115 * pfVar3[3]
                                                            + fVar116 * pfVar4[3] +
                                                              fVar222 * pfVar5[3] +
                                                              fVar117 * pfVar6[3] +
                                                            fVar219 * pfVar7[3] +
                                                            fVar221 * pfVar8[3],
                                                            CONCAT48(fVar73 * pfVar1[2] +
                                                                     auVar294._8_4_ +
                                                                     fVar86 * pfVar2[2] +
                                                                     fVar115 * pfVar3[2] +
                                                                     fVar116 * pfVar4[2] +
                                                                     fVar222 * pfVar5[2] +
                                                                     fVar117 * pfVar6[2] +
                                                                     fVar219 * pfVar7[2] +
                                                                     fVar221 * pfVar8[2],
                                                                     CONCAT44(fVar73 * pfVar1[1] +
                                                                              auVar294._4_4_ +
                                                                              fVar86 * pfVar2[1] +
                                                                              fVar115 * pfVar3[1] +
                                                                              fVar116 * pfVar4[1] +
                                                                              fVar222 * pfVar5[1] +
                                                                              fVar117 * pfVar6[1] +
                                                                              fVar219 * pfVar7[1] +
                                                                              fVar221 * pfVar8[1],
                                                                              fVar73 * *pfVar1 +
                                                                              auVar294._0_4_ +
                                                                              fVar86 * *pfVar2 +
                                                                              fVar115 * *pfVar3 +
                                                                              fVar116 * *pfVar4 +
                                                                              fVar222 * *pfVar5 +
                                                                              fVar117 * *pfVar6 +
                                                                              fVar219 * *pfVar7 +
                                                                              fVar221 * *pfVar8))));
                            }
                            uVar62 = uVar62 + 0x20;
                            iVar47 = iVar47 + iVar60;
                            uVar67 = uVar67 - 1;
                          } while (uVar67 != 0);
                        }
                        uVar69 = uVar69 + 1;
                        uVar71 = uVar71 + (ulong)uVar18 * 0x20;
                      } while (uVar69 != uVar19);
                    }
                    auVar89 = auVar294._0_16_;
                    pvVar72 = (void *)((long)pvVar72 + (long)(int)(uVar18 * uVar19 * 0x20) * 4);
                    uVar63 = uVar63 + 1;
                  } while (uVar63 != uVar21);
                }
                auVar239 = auVar293._0_16_;
                auVar167 = auVar237._0_16_;
                fVar73 = auVar237._0_4_;
                fVar86 = auVar237._4_4_;
                fVar115 = auVar237._8_4_;
                fVar116 = auVar237._12_4_;
                fVar222 = auVar89._4_4_;
                fVar117 = auVar89._8_4_;
                fVar219 = auVar89._12_4_;
                switch(uVar20) {
                case 1:
                  auVar89 = vmaxps_avx(auVar239,auVar89);
                  break;
                case 2:
                  auVar167 = vmaxps_avx(auVar239,auVar89);
                  in_ZMM7 = ZEXT1664(auVar167);
                  auVar239 = vminps_avx(auVar239,auVar89);
                  fVar73 = **(float **)(&this->field_0x118 + (long)p_Var55);
                  auVar89._0_4_ = fVar73 * auVar239._0_4_ + auVar167._0_4_;
                  auVar89._4_4_ = fVar73 * auVar239._4_4_ + auVar167._4_4_;
                  auVar89._8_4_ = fVar73 * auVar239._8_4_ + auVar167._8_4_;
                  auVar89._12_4_ = fVar73 * auVar239._12_4_ + auVar167._12_4_;
                  break;
                case 3:
                  uVar9 = **(undefined4 **)(&this->field_0x118 + (long)p_Var55);
                  auVar246._4_4_ = uVar9;
                  auVar246._0_4_ = uVar9;
                  auVar246._8_4_ = uVar9;
                  auVar246._12_4_ = uVar9;
                  in_ZMM7 = ZEXT1664(auVar246);
                  uVar9 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var55))[1];
                  auVar313._4_4_ = uVar9;
                  auVar313._0_4_ = uVar9;
                  auVar313._8_4_ = uVar9;
                  auVar313._12_4_ = uVar9;
                  auVar167 = vmaxps_avx(auVar89,auVar246);
                  auVar89 = vminps_avx(auVar313,auVar167);
                  break;
                case 4:
                  auVar90._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
                  auVar90._8_4_ = -fVar117;
                  auVar90._12_4_ = -fVar219;
                  auVar123._8_4_ = 0x42b0c0a5;
                  auVar123._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar123._12_4_ = 0x42b0c0a5;
                  auVar239 = vminps_avx(auVar90,auVar123);
                  auVar124._8_4_ = 0xc2b0c0a5;
                  auVar124._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar124._12_4_ = 0xc2b0c0a5;
                  auVar283 = vmaxps_avx(auVar239,auVar124);
                  auVar247._0_4_ = auVar283._0_4_ * 1.442695 + 0.5;
                  auVar247._4_4_ = auVar283._4_4_ * 1.442695 + 0.5;
                  auVar247._8_4_ = auVar283._8_4_ * 1.442695 + 0.5;
                  auVar247._12_4_ = auVar283._12_4_ * 1.442695 + 0.5;
                  auVar314._0_4_ = (int)auVar247._0_4_;
                  auVar314._4_4_ = (int)auVar247._4_4_;
                  auVar314._8_4_ = (int)auVar247._8_4_;
                  auVar314._12_4_ = (int)auVar247._12_4_;
                  auVar297 = vcvtdq2ps_avx(auVar314);
                  auVar239 = vcmpps_avx(auVar247,auVar297,1);
                  auVar239 = vandps_avx(auVar239,auVar167);
                  auVar239 = vsubps_avx(auVar297,auVar239);
                  fVar222 = auVar239._0_4_ * -0.6931472 + auVar283._0_4_;
                  fVar117 = auVar239._4_4_ * -0.6931472 + auVar283._4_4_;
                  fVar219 = auVar239._8_4_ * -0.6931472 + auVar283._8_4_;
                  fVar221 = auVar239._12_4_ * -0.6931472 + auVar283._12_4_;
                  auVar248._0_4_ = (int)auVar239._0_4_;
                  auVar248._4_4_ = (int)auVar239._4_4_;
                  auVar248._8_4_ = (int)auVar239._8_4_;
                  auVar248._12_4_ = (int)auVar239._12_4_;
                  auVar239 = vpslld_avx(auVar248,0x17);
                  auVar239 = vpaddd_avx(auVar239,auVar167);
                  auVar91._0_4_ =
                       (fVar222 * fVar222 *
                        (((((fVar222 * 0.00019875691 + 0.0013981999) * fVar222 + 0.008333452) *
                           fVar222 + 0.041665796) * fVar222 + 0.16666666) * fVar222 + 0.5) +
                       fVar222 + fVar73) * auVar239._0_4_ + fVar73;
                  auVar91._4_4_ =
                       (fVar117 * fVar117 *
                        (((((fVar117 * 0.00019875691 + 0.0013981999) * fVar117 + 0.008333452) *
                           fVar117 + 0.041665796) * fVar117 + 0.16666666) * fVar117 + 0.5) +
                       fVar117 + fVar86) * auVar239._4_4_ + fVar86;
                  auVar91._8_4_ =
                       (fVar219 * fVar219 *
                        (((((fVar219 * 0.00019875691 + 0.0013981999) * fVar219 + 0.008333452) *
                           fVar219 + 0.041665796) * fVar219 + 0.16666666) * fVar219 + 0.5) +
                       fVar219 + fVar115) * auVar239._8_4_ + fVar115;
                  auVar91._12_4_ =
                       (fVar221 * fVar221 *
                        (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) *
                           fVar221 + 0.041665796) * fVar221 + 0.16666666) * fVar221 + 0.5) +
                       fVar221 + fVar116) * auVar239._12_4_ + fVar116;
                  auVar239 = vrcpps_avx(auVar91);
                  in_ZMM7 = ZEXT1664(auVar239);
                  fVar73 = auVar239._0_4_;
                  auVar92._0_4_ = auVar91._0_4_ * fVar73;
                  fVar86 = auVar239._4_4_;
                  auVar92._4_4_ = auVar91._4_4_ * fVar86;
                  fVar115 = auVar239._8_4_;
                  auVar92._8_4_ = auVar91._8_4_ * fVar115;
                  fVar116 = auVar239._12_4_;
                  auVar92._12_4_ = auVar91._12_4_ * fVar116;
                  auVar167 = vsubps_avx(auVar167,auVar92);
                  auVar89._0_4_ = fVar73 + fVar73 * auVar167._0_4_;
                  auVar89._4_4_ = fVar86 + fVar86 * auVar167._4_4_;
                  auVar89._8_4_ = fVar115 + fVar115 * auVar167._8_4_;
                  auVar89._12_4_ = fVar116 + fVar116 * auVar167._12_4_;
                  break;
                case 5:
                  auVar223._8_4_ = 0x42b0c0a5;
                  auVar223._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar223._12_4_ = 0x42b0c0a5;
                  auVar239 = vminps_avx(auVar89,auVar223);
                  auVar284._8_4_ = 0xc2b0c0a5;
                  auVar284._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar284._12_4_ = 0xc2b0c0a5;
                  auVar283 = vmaxps_avx(auVar284,auVar239);
                  auVar296._0_4_ = auVar283._0_4_ * 1.442695 + 0.5;
                  auVar296._4_4_ = auVar283._4_4_ * 1.442695 + 0.5;
                  auVar296._8_4_ = auVar283._8_4_ * 1.442695 + 0.5;
                  auVar296._12_4_ = auVar283._12_4_ * 1.442695 + 0.5;
                  auVar311._0_4_ = (int)auVar296._0_4_;
                  auVar311._4_4_ = (int)auVar296._4_4_;
                  auVar311._8_4_ = (int)auVar296._8_4_;
                  auVar311._12_4_ = (int)auVar296._12_4_;
                  auVar297 = vcvtdq2ps_avx(auVar311);
                  auVar239 = vcmpps_avx(auVar296,auVar297,1);
                  auVar239 = vandps_avx(auVar239,auVar167);
                  auVar239 = vsubps_avx(auVar297,auVar239);
                  auVar312._0_4_ = auVar239._0_4_ * 0.6931472;
                  auVar312._4_4_ = auVar239._4_4_ * 0.6931472;
                  auVar312._8_4_ = auVar239._8_4_ * 0.6931472;
                  auVar312._12_4_ = auVar239._12_4_ * 0.6931472;
                  auVar297 = vsubps_avx(auVar283,auVar312);
                  fVar221 = auVar297._0_4_;
                  fVar166 = auVar297._4_4_;
                  fVar214 = auVar297._8_4_;
                  fVar215 = auVar297._12_4_;
                  auVar242._0_4_ = (int)auVar239._0_4_;
                  auVar242._4_4_ = (int)auVar239._4_4_;
                  auVar242._8_4_ = (int)auVar239._8_4_;
                  auVar242._12_4_ = (int)auVar239._12_4_;
                  auVar239 = vpslld_avx(auVar242,0x17);
                  auVar239 = vpaddd_avx(auVar239,auVar167);
                  auVar243._0_4_ =
                       (fVar221 + fVar73 +
                       fVar221 * fVar221 *
                       (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) *
                          fVar221 + 0.041665796) * fVar221 + 0.16666666) * fVar221 + 0.5)) *
                       auVar239._0_4_ + fVar73;
                  auVar243._4_4_ =
                       (fVar166 + fVar86 +
                       fVar166 * fVar166 *
                       (((((fVar166 * 0.00019875691 + 0.0013981999) * fVar166 + 0.008333452) *
                          fVar166 + 0.041665796) * fVar166 + 0.16666666) * fVar166 + 0.5)) *
                       auVar239._4_4_ + fVar86;
                  auVar243._8_4_ =
                       (fVar214 + fVar115 +
                       fVar214 * fVar214 *
                       (((((fVar214 * 0.00019875691 + 0.0013981999) * fVar214 + 0.008333452) *
                          fVar214 + 0.041665796) * fVar214 + 0.16666666) * fVar214 + 0.5)) *
                       auVar239._8_4_ + fVar115;
                  auVar243._12_4_ =
                       (fVar215 + fVar116 +
                       fVar215 * fVar215 *
                       (((((fVar215 * 0.00019875691 + 0.0013981999) * fVar215 + 0.008333452) *
                          fVar215 + 0.041665796) * fVar215 + 0.16666666) * fVar215 + 0.5)) *
                       auVar239._12_4_ + fVar116;
                  auVar118._8_4_ = 0x800000;
                  auVar118._0_8_ = 0x80000000800000;
                  auVar118._12_4_ = 0x800000;
                  auVar239 = vmaxps_avx(auVar243,auVar118);
                  auVar297 = vpsrld_avx(auVar239,0x17);
                  auVar170._8_4_ = 0xffffff82;
                  auVar170._0_8_ = 0xffffff82ffffff82;
                  auVar170._12_4_ = 0xffffff82;
                  auVar297 = vpaddd_avx(auVar297,auVar170);
                  auVar171._8_4_ = 0x807fffff;
                  auVar171._0_8_ = 0x807fffff807fffff;
                  auVar171._12_4_ = 0x807fffff;
                  auVar239 = vandps_avx(auVar239,auVar171);
                  auVar74 = vorps_avx(auVar239,auVar232);
                  auVar283 = vcvtdq2ps_avx(auVar297);
                  auVar172._8_4_ = 0x3f3504f3;
                  auVar172._0_8_ = 0x3f3504f33f3504f3;
                  auVar172._12_4_ = 0x3f3504f3;
                  auVar297 = vcmpps_avx(auVar74,auVar172,1);
                  auVar239 = vandps_avx(auVar297,auVar74);
                  fVar221 = auVar74._0_4_ + -1.0 + auVar239._0_4_;
                  fVar166 = auVar74._4_4_ + -1.0 + auVar239._4_4_;
                  fVar214 = auVar74._8_4_ + -1.0 + auVar239._8_4_;
                  fVar215 = auVar74._12_4_ + -1.0 + auVar239._12_4_;
                  auVar239 = vandps_avx(auVar297,auVar167);
                  auVar297 = vsubps_avx(auVar283,auVar239);
                  auVar239 = vcmpps_avx(auVar243,_DAT_0053f030,2);
                  auVar119._0_4_ =
                       (fVar221 * fVar221 *
                        (((((((((fVar221 * 0.070376836 + -0.1151461) * fVar221 + 0.116769984) *
                               fVar221 + -0.12420141) * fVar221 + 0.14249323) * fVar221 +
                            -0.16668057) * fVar221 + 0.20000714) * fVar221 + -0.24999994) * fVar221
                         + 0.3333333) * fVar221 + -0.5) + auVar297._0_4_ * 0.6931472 + fVar221) *
                       -2.0;
                  auVar119._4_4_ =
                       (fVar166 * fVar166 *
                        (((((((((fVar166 * 0.070376836 + -0.1151461) * fVar166 + 0.116769984) *
                               fVar166 + -0.12420141) * fVar166 + 0.14249323) * fVar166 +
                            -0.16668057) * fVar166 + 0.20000714) * fVar166 + -0.24999994) * fVar166
                         + 0.3333333) * fVar166 + -0.5) + auVar297._4_4_ * 0.6931472 + fVar166) *
                       -2.0;
                  auVar119._8_4_ =
                       (fVar214 * fVar214 *
                        (((((((((fVar214 * 0.070376836 + -0.1151461) * fVar214 + 0.116769984) *
                               fVar214 + -0.12420141) * fVar214 + 0.14249323) * fVar214 +
                            -0.16668057) * fVar214 + 0.20000714) * fVar214 + -0.24999994) * fVar214
                         + 0.3333333) * fVar214 + -0.5) + auVar297._8_4_ * 0.6931472 + fVar214) *
                       -2.0;
                  auVar119._12_4_ =
                       (fVar215 * fVar215 *
                        (((((((((fVar215 * 0.070376836 + -0.1151461) * fVar215 + 0.116769984) *
                               fVar215 + -0.12420141) * fVar215 + 0.14249323) * fVar215 +
                            -0.16668057) * fVar215 + 0.20000714) * fVar215 + -0.24999994) * fVar215
                         + 0.3333333) * fVar215 + -0.5) + auVar297._12_4_ * 0.6931472 + fVar215) *
                       -2.0;
                  auVar173._8_4_ = 0x7fffffff;
                  auVar173._0_8_ = 0x7fffffff7fffffff;
                  auVar173._12_4_ = 0x7fffffff;
                  auVar239 = vblendvps_avx(auVar119,auVar173,auVar239);
                  auVar174._8_4_ = 0x42b0c0a5;
                  auVar174._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar174._12_4_ = 0x42b0c0a5;
                  auVar239 = vminps_avx(auVar239,auVar174);
                  auVar175._8_4_ = 0xc2b0c0a5;
                  auVar175._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar175._12_4_ = 0xc2b0c0a5;
                  auVar283 = vmaxps_avx(auVar239,auVar175);
                  auVar176._0_4_ = auVar283._0_4_ * 1.442695 + 0.5;
                  auVar176._4_4_ = auVar283._4_4_ * 1.442695 + 0.5;
                  auVar176._8_4_ = auVar283._8_4_ * 1.442695 + 0.5;
                  auVar176._12_4_ = auVar283._12_4_ * 1.442695 + 0.5;
                  auVar244._0_4_ = (int)auVar176._0_4_;
                  auVar244._4_4_ = (int)auVar176._4_4_;
                  auVar244._8_4_ = (int)auVar176._8_4_;
                  auVar244._12_4_ = (int)auVar176._12_4_;
                  auVar297 = vcvtdq2ps_avx(auVar244);
                  auVar239 = vcmpps_avx(auVar176,auVar297,1);
                  auVar239 = vandps_avx(auVar239,auVar167);
                  auVar239 = vsubps_avx(auVar297,auVar239);
                  auVar245._0_4_ = auVar239._0_4_ * 0.6931472;
                  auVar245._4_4_ = auVar239._4_4_ * 0.6931472;
                  auVar245._8_4_ = auVar239._8_4_ * 0.6931472;
                  auVar245._12_4_ = auVar239._12_4_ * 0.6931472;
                  auVar237 = ZEXT1664(auVar167);
                  auVar297 = vsubps_avx(auVar283,auVar245);
                  fVar221 = auVar297._0_4_;
                  fVar166 = auVar297._4_4_;
                  fVar214 = auVar297._8_4_;
                  fVar215 = auVar297._12_4_;
                  auVar293 = ZEXT864(0) << 0x20;
                  auVar177._0_4_ = (int)auVar239._0_4_;
                  auVar177._4_4_ = (int)auVar239._4_4_;
                  auVar177._8_4_ = (int)auVar239._8_4_;
                  auVar177._12_4_ = (int)auVar239._12_4_;
                  auVar239 = vpslld_avx(auVar177,0x17);
                  auVar167 = vpaddd_avx(auVar239,auVar167);
                  auVar120._0_4_ =
                       (fVar221 + fVar73 +
                       (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) *
                          fVar221 + 0.041665796) * fVar221 + 0.16666666) * fVar221 + 0.5) *
                       fVar221 * fVar221) * auVar167._0_4_ + fVar73;
                  auVar120._4_4_ =
                       (fVar166 + fVar86 +
                       (((((fVar166 * 0.00019875691 + 0.0013981999) * fVar166 + 0.008333452) *
                          fVar166 + 0.041665796) * fVar166 + 0.16666666) * fVar166 + 0.5) *
                       fVar166 * fVar166) * auVar167._4_4_ + fVar86;
                  auVar120._8_4_ =
                       (fVar214 + fVar115 +
                       (((((fVar214 * 0.00019875691 + 0.0013981999) * fVar214 + 0.008333452) *
                          fVar214 + 0.041665796) * fVar214 + 0.16666666) * fVar214 + 0.5) *
                       fVar214 * fVar214) * auVar167._8_4_ + fVar115;
                  auVar120._12_4_ =
                       (fVar215 + fVar116 +
                       (((((fVar215 * 0.00019875691 + 0.0013981999) * fVar215 + 0.008333452) *
                          fVar215 + 0.041665796) * fVar215 + 0.16666666) * fVar215 + 0.5) *
                       fVar215 * fVar215) * auVar167._12_4_ + fVar116;
                  auVar167 = vrcpps_avx(auVar120);
                  fVar73 = auVar167._0_4_;
                  fVar221 = fVar73 + fVar73;
                  fVar86 = auVar167._4_4_;
                  fVar166 = fVar86 + fVar86;
                  fVar115 = auVar167._8_4_;
                  fVar214 = fVar115 + fVar115;
                  fVar116 = auVar167._12_4_;
                  fVar215 = fVar116 + fVar116;
                  in_ZMM7 = ZEXT1664(CONCAT412(fVar215,CONCAT48(fVar214,CONCAT44(fVar166,fVar221))))
                  ;
                  auVar121._0_4_ = auVar120._0_4_ * fVar221;
                  auVar121._4_4_ = auVar120._4_4_ * fVar166;
                  auVar121._8_4_ = auVar120._8_4_ * fVar214;
                  auVar121._12_4_ = auVar120._12_4_ * fVar215;
                  auVar224._8_4_ = 0x40000000;
                  auVar224._0_8_ = 0x4000000040000000;
                  auVar224._12_4_ = 0x40000000;
                  auVar167 = vsubps_avx(auVar224,auVar121);
                  auVar178._0_4_ = fVar221 + -1.0;
                  auVar178._4_4_ = fVar166 + -1.0;
                  auVar178._8_4_ = fVar214 + -1.0;
                  auVar178._12_4_ = fVar215 + -1.0;
                  auVar122._0_4_ = auVar178._0_4_ + fVar73 * auVar167._0_4_;
                  auVar122._4_4_ = auVar178._4_4_ + fVar86 * auVar167._4_4_;
                  auVar122._8_4_ = auVar178._8_4_ + fVar115 * auVar167._8_4_;
                  auVar122._12_4_ = auVar178._12_4_ + fVar116 * auVar167._12_4_;
                  goto LAB_002b1464;
                case 6:
                  fVar73 = **(float **)(&this->field_0x118 + (long)p_Var55);
                  fVar86 = (*(float **)(&this->field_0x118 + (long)p_Var55))[1];
                  auVar178._4_4_ = fVar86;
                  auVar178._0_4_ = fVar86;
                  auVar178._8_4_ = fVar86;
                  auVar178._12_4_ = fVar86;
                  auVar125._0_4_ = fVar73 * auVar89._0_4_ + fVar86;
                  auVar125._4_4_ = fVar73 * fVar222 + fVar86;
                  auVar125._8_4_ = fVar73 * fVar117 + fVar86;
                  auVar125._12_4_ = fVar73 * fVar219 + fVar86;
                  auVar239 = vmaxps_avx(auVar239,auVar125);
                  auVar122 = vminps_avx(auVar239,auVar167);
LAB_002b1464:
                  in_ZMM3 = ZEXT1664(auVar178);
                  auVar89._0_4_ = auVar122._0_4_ * auVar89._0_4_;
                  auVar89._4_4_ = auVar122._4_4_ * fVar222;
                  auVar89._8_4_ = auVar122._8_4_ * fVar117;
                  auVar89._12_4_ = auVar122._12_4_ * fVar219;
                }
                *(undefined1 (*) [16])pAVar66 = auVar89;
                pAVar66 = pAVar66 + 0x10;
                uVar68 = uVar68 + 1;
                iVar53 = iVar53 + 1;
              } while (uVar68 != local_c8.w);
            }
            iVar61 = iVar61 + 1;
          } while (iVar61 != local_c8.h);
        }
        local_1a0 = local_1a0 + 1;
      } while (local_1a0 != local_c8.c);
    }
    if (((iVar16 == 1) && (local_154 == 8)) && (0 < (long)local_c8.c)) {
      p_Var55 = local_70[-3];
      iVar60 = *(int *)(&this->field_0xdc + (long)p_Var55);
      iVar54 = *(int *)(&this->field_0xe0 + (long)p_Var55);
      iVar17 = *(int *)(&this->field_0xe4 + (long)p_Var55);
      iVar70 = *(int *)(&this->field_0xe8 + (long)p_Var55);
      uVar20 = *(undefined4 *)(&this->field_0x114 + (long)p_Var55);
      lVar65 = *(long *)(&this->field_0x1a8 + (long)p_Var55);
      uVar18 = *(uint *)(&this->field_0xd4 + (long)p_Var55);
      uVar19 = *(uint *)(&this->field_0xd8 + (long)p_Var55);
      local_1a0 = 0;
      auVar237 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar294 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar293 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar289._8_4_ = 0x42b0c0a5;
      auVar289._0_8_ = 0x42b0c0a542b0c0a5;
      auVar289._12_4_ = 0x42b0c0a5;
      auVar289._16_4_ = 0x42b0c0a5;
      auVar289._20_4_ = 0x42b0c0a5;
      auVar289._24_4_ = 0x42b0c0a5;
      auVar289._28_4_ = 0x42b0c0a5;
      auVar292._8_4_ = 0xc2b0c0a5;
      auVar292._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar292._12_4_ = 0xc2b0c0a5;
      auVar292._16_4_ = 0xc2b0c0a5;
      auVar292._20_4_ = 0xc2b0c0a5;
      auVar292._24_4_ = 0xc2b0c0a5;
      auVar292._28_4_ = 0xc2b0c0a5;
      do {
        if (0 < local_c8.h) {
          iVar51 = bottom_blob->w;
          iVar52 = bottom_blob->h;
          pAVar66 = (Allocator *)
                    ((long)local_c8.data +
                    local_c8.cstep * local_1a0 *
                    CONCAT44(local_c8.elemsize._4_4_,(int)local_c8.elemsize));
          uVar21 = bottom_blob->c;
          iVar61 = 0;
          do {
            if (0 < local_c8.w) {
              uVar68 = 0;
              iVar53 = (1 - uVar18) * iVar60;
              do {
                if (lVar65 == 0) {
                  auVar306 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar306 = ZEXT3264(*(undefined1 (*) [32])(lVar65 + local_1a0 * 0x20));
                }
                if (0 < (int)uVar21) {
                  pvVar72 = (void *)((this->weight_data_tm).cstep * local_1a0 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  uVar63 = 0;
                  do {
                    if (0 < (int)uVar19) {
                      uVar71 = 0;
                      uVar69 = 0;
                      do {
                        iVar47 = (((int)uVar69 - uVar19) + 1) * iVar54 + iVar61;
                        if ((((-1 < iVar47) && (iVar48 = iVar47 / iVar70, iVar47 % iVar70 == 0)) &&
                            (iVar48 < iVar52)) && (0 < (int)uVar18)) {
                          uVar62 = uVar71;
                          uVar67 = (ulong)uVar18;
                          iVar47 = iVar53;
                          do {
                            if (((-1 < iVar47) && (iVar49 = iVar47 / iVar17, iVar47 % iVar17 == 0))
                               && (iVar49 < iVar51)) {
                              fVar73 = *(float *)((long)bottom_blob->data +
                                                 (long)iVar49 * 4 +
                                                 (long)iVar48 *
                                                 (long)bottom_blob->w * bottom_blob->elemsize +
                                                 bottom_blob->cstep * bottom_blob->elemsize * uVar63
                                                 );
                              pfVar1 = (float *)((long)pvVar72 + (uVar62 & 0xffffffff) * 4);
                              auVar306 = ZEXT3264(CONCAT428(auVar306._28_4_ + fVar73,
                                                            CONCAT424(auVar306._24_4_ +
                                                                      fVar73 * pfVar1[6],
                                                                      CONCAT420(auVar306._20_4_ +
                                                                                fVar73 * pfVar1[5],
                                                                                CONCAT416(auVar306.
                                                  _16_4_ + fVar73 * pfVar1[4],
                                                  CONCAT412(auVar306._12_4_ + fVar73 * pfVar1[3],
                                                            CONCAT48(auVar306._8_4_ +
                                                                     fVar73 * pfVar1[2],
                                                                     CONCAT44(auVar306._4_4_ +
                                                                              fVar73 * pfVar1[1],
                                                                              auVar306._0_4_ +
                                                                              fVar73 * *pfVar1))))))
                                                  ));
                            }
                            uVar62 = uVar62 + 8;
                            iVar47 = iVar47 + iVar60;
                            uVar67 = uVar67 - 1;
                          } while (uVar67 != 0);
                        }
                        uVar69 = uVar69 + 1;
                        uVar71 = uVar71 + (ulong)uVar18 * 8;
                      } while (uVar69 != uVar19);
                    }
                    pvVar72 = (void *)((long)pvVar72 + (long)(int)(uVar18 * uVar19 * 8) * 4);
                    uVar63 = uVar63 + 1;
                  } while (uVar63 != uVar21);
                }
                auVar305 = auVar306._0_32_;
                fVar238 = auVar306._8_4_;
                fVar279 = auVar306._12_4_;
                fVar280 = auVar306._16_4_;
                fVar281 = auVar306._20_4_;
                fVar282 = auVar306._24_4_;
                fVar166 = auVar294._0_4_;
                fVar214 = auVar294._4_4_;
                fVar215 = auVar294._8_4_;
                fVar216 = auVar294._12_4_;
                fVar217 = auVar294._16_4_;
                fVar218 = auVar294._20_4_;
                fVar220 = auVar294._24_4_;
                fVar295 = auVar294._28_4_;
                auVar301 = auVar293._0_32_;
                fVar73 = auVar293._0_4_;
                fVar86 = auVar293._4_4_;
                fVar115 = auVar293._8_4_;
                fVar116 = auVar293._12_4_;
                fVar222 = auVar293._16_4_;
                fVar117 = auVar293._20_4_;
                fVar219 = auVar293._24_4_;
                fVar221 = auVar293._28_4_;
                auVar309._28_36_ = auVar306._28_36_;
                switch(uVar20) {
                case 1:
                  auVar305 = vmaxps_avx(auVar305,auVar237._0_32_);
                  break;
                case 2:
                  auVar301 = vmaxps_avx(auVar305,ZEXT1632(ZEXT816(0) << 0x40));
                  in_ZMM7 = ZEXT3264(auVar301);
                  auVar237 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar236 = vminps_avx(auVar305,ZEXT1632(ZEXT816(0) << 0x40));
                  fVar73 = **(float **)(&this->field_0x118 + (long)p_Var55);
                  auVar305._0_4_ = fVar73 * auVar236._0_4_ + auVar301._0_4_;
                  auVar305._4_4_ = fVar73 * auVar236._4_4_ + auVar301._4_4_;
                  auVar305._8_4_ = fVar73 * auVar236._8_4_ + auVar301._8_4_;
                  auVar305._12_4_ = fVar73 * auVar236._12_4_ + auVar301._12_4_;
                  auVar305._16_4_ = fVar73 * auVar236._16_4_ + auVar301._16_4_;
                  auVar305._20_4_ = fVar73 * auVar236._20_4_ + auVar301._20_4_;
                  auVar305._24_4_ = fVar73 * auVar236._24_4_ + auVar301._24_4_;
                  auVar305._28_4_ = auVar236._28_4_ + auVar301._28_4_;
                  break;
                case 3:
                  uVar9 = **(undefined4 **)(&this->field_0x118 + (long)p_Var55);
                  auVar276._4_4_ = uVar9;
                  auVar276._0_4_ = uVar9;
                  auVar276._8_4_ = uVar9;
                  auVar276._12_4_ = uVar9;
                  auVar276._16_4_ = uVar9;
                  auVar276._20_4_ = uVar9;
                  auVar276._24_4_ = uVar9;
                  auVar276._28_4_ = uVar9;
                  uVar9 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var55))[1];
                  auVar325._4_4_ = uVar9;
                  auVar325._0_4_ = uVar9;
                  auVar325._8_4_ = uVar9;
                  auVar325._12_4_ = uVar9;
                  auVar325._16_4_ = uVar9;
                  auVar325._20_4_ = uVar9;
                  auVar325._24_4_ = uVar9;
                  auVar325._28_4_ = uVar9;
                  auVar301 = vmaxps_avx(auVar305,auVar276);
                  in_ZMM7 = ZEXT3264(auVar301);
                  auVar305 = vminps_avx(auVar325,auVar301);
                  break;
                case 4:
                  auVar277._0_8_ = auVar306._0_8_ ^ 0x8000000080000000;
                  auVar277._8_4_ = -fVar238;
                  auVar277._12_4_ = -fVar279;
                  auVar277._16_4_ = -fVar280;
                  auVar277._20_4_ = -fVar281;
                  auVar277._24_4_ = -fVar282;
                  auVar277._28_4_ = -auVar306._28_4_;
                  auVar113._8_4_ = 0x42b0c0a5;
                  auVar113._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar113._12_4_ = 0x42b0c0a5;
                  auVar113._16_4_ = 0x42b0c0a5;
                  auVar113._20_4_ = 0x42b0c0a5;
                  auVar113._24_4_ = 0x42b0c0a5;
                  auVar113._28_4_ = 0x42b0c0a5;
                  auVar236 = vminps_avx(auVar277,auVar113);
                  auVar114._8_4_ = 0xc2b0c0a5;
                  auVar114._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar114._12_4_ = 0xc2b0c0a5;
                  auVar114._16_4_ = 0xc2b0c0a5;
                  auVar114._20_4_ = 0xc2b0c0a5;
                  auVar114._24_4_ = 0xc2b0c0a5;
                  auVar114._28_4_ = 0xc2b0c0a5;
                  auVar79 = vmaxps_avx(auVar236,auVar114);
                  auVar304._0_4_ = auVar79._0_4_ * 1.442695 + fVar166;
                  auVar304._4_4_ = auVar79._4_4_ * 1.442695 + fVar214;
                  auVar304._8_4_ = auVar79._8_4_ * 1.442695 + fVar215;
                  auVar304._12_4_ = auVar79._12_4_ * 1.442695 + fVar216;
                  auVar304._16_4_ = auVar79._16_4_ * 1.442695 + fVar217;
                  auVar304._20_4_ = auVar79._20_4_ * 1.442695 + fVar218;
                  auVar304._24_4_ = auVar79._24_4_ * 1.442695 + fVar220;
                  auVar304._28_4_ = auVar306._28_4_ + fVar295;
                  auVar157 = vroundps_avx(auVar304,1);
                  auVar236 = vcmpps_avx(auVar304,auVar157,1);
                  auVar236 = vandps_avx(auVar236,auVar301);
                  auVar236 = vsubps_avx(auVar157,auVar236);
                  fVar238 = auVar236._0_4_ * -0.6931472 + auVar79._0_4_;
                  fVar279 = auVar236._4_4_ * -0.6931472 + auVar79._4_4_;
                  fVar280 = auVar236._8_4_ * -0.6931472 + auVar79._8_4_;
                  fVar281 = auVar236._12_4_ * -0.6931472 + auVar79._12_4_;
                  fVar282 = auVar236._16_4_ * -0.6931472 + auVar79._16_4_;
                  fVar310 = auVar236._20_4_ * -0.6931472 + auVar79._20_4_;
                  fVar326 = auVar236._24_4_ * -0.6931472 + auVar79._24_4_;
                  auVar249._0_4_ = (int)auVar236._0_4_;
                  auVar249._4_4_ = (int)auVar236._4_4_;
                  auVar249._8_4_ = (int)auVar236._8_4_;
                  auVar249._12_4_ = (int)auVar236._12_4_;
                  auVar278._16_4_ = (int)auVar236._16_4_;
                  auVar278._0_16_ = auVar249;
                  auVar278._20_4_ = (int)auVar236._20_4_;
                  auVar278._24_4_ = (int)auVar236._24_4_;
                  auVar278._28_4_ = (int)auVar236._28_4_;
                  auVar239 = vpslld_avx(auVar249,0x17);
                  auVar167 = vpslld_avx(auVar278._16_16_,0x17);
                  auVar94._8_4_ = 0x3f800000;
                  auVar94._0_8_ = 0x3f8000003f800000;
                  auVar94._12_4_ = 0x3f800000;
                  auVar167 = vpaddd_avx(auVar167,auVar94);
                  auVar239 = vpaddd_avx(auVar239,auVar94);
                  auVar164._0_4_ =
                       (fVar238 + fVar73 +
                       fVar238 * fVar238 *
                       (fVar166 +
                       ((((fVar238 * 0.00019875691 + 0.0013981999) * fVar238 + 0.008333452) *
                         fVar238 + 0.041665796) * fVar238 + 0.16666666) * fVar238)) * auVar239._0_4_
                       + fVar73;
                  auVar164._4_4_ =
                       (fVar279 + fVar86 +
                       fVar279 * fVar279 *
                       (fVar214 +
                       ((((fVar279 * 0.00019875691 + 0.0013981999) * fVar279 + 0.008333452) *
                         fVar279 + 0.041665796) * fVar279 + 0.16666666) * fVar279)) * auVar239._4_4_
                       + fVar86;
                  auVar164._8_4_ =
                       (fVar280 + fVar115 +
                       fVar280 * fVar280 *
                       (fVar215 +
                       ((((fVar280 * 0.00019875691 + 0.0013981999) * fVar280 + 0.008333452) *
                         fVar280 + 0.041665796) * fVar280 + 0.16666666) * fVar280)) * auVar239._8_4_
                       + fVar115;
                  auVar164._12_4_ =
                       (fVar281 + fVar116 +
                       fVar281 * fVar281 *
                       (fVar216 +
                       ((((fVar281 * 0.00019875691 + 0.0013981999) * fVar281 + 0.008333452) *
                         fVar281 + 0.041665796) * fVar281 + 0.16666666) * fVar281)) *
                       auVar239._12_4_ + fVar116;
                  auVar164._16_4_ =
                       (fVar282 + fVar222 +
                       fVar282 * fVar282 *
                       (fVar217 +
                       ((((fVar282 * 0.00019875691 + 0.0013981999) * fVar282 + 0.008333452) *
                         fVar282 + 0.041665796) * fVar282 + 0.16666666) * fVar282)) * auVar167._0_4_
                       + fVar222;
                  auVar164._20_4_ =
                       (fVar310 + fVar117 +
                       fVar310 * fVar310 *
                       (fVar218 +
                       ((((fVar310 * 0.00019875691 + 0.0013981999) * fVar310 + 0.008333452) *
                         fVar310 + 0.041665796) * fVar310 + 0.16666666) * fVar310)) * auVar167._4_4_
                       + fVar117;
                  auVar164._24_4_ =
                       (fVar326 + fVar219 +
                       fVar326 * fVar326 *
                       (fVar220 +
                       ((((fVar326 * 0.00019875691 + 0.0013981999) * fVar326 + 0.008333452) *
                         fVar326 + 0.041665796) * fVar326 + 0.16666666) * fVar326)) * auVar167._8_4_
                       + fVar219;
                  auVar164._28_4_ =
                       auVar157._28_4_ + auVar79._28_4_ + fVar221 + fVar295 + -0.47508308 + fVar221;
                  auVar236 = vrcpps_avx(auVar164);
                  in_ZMM7 = ZEXT3264(auVar236);
                  fVar73 = auVar236._0_4_;
                  fVar86 = auVar236._4_4_;
                  auVar45._4_4_ = auVar164._4_4_ * fVar86;
                  auVar45._0_4_ = auVar164._0_4_ * fVar73;
                  fVar115 = auVar236._8_4_;
                  auVar45._8_4_ = auVar164._8_4_ * fVar115;
                  fVar116 = auVar236._12_4_;
                  auVar45._12_4_ = auVar164._12_4_ * fVar116;
                  fVar222 = auVar236._16_4_;
                  auVar45._16_4_ = auVar164._16_4_ * fVar222;
                  fVar117 = auVar236._20_4_;
                  auVar45._20_4_ = auVar164._20_4_ * fVar117;
                  fVar219 = auVar236._24_4_;
                  auVar45._24_4_ = auVar164._24_4_ * fVar219;
                  auVar45._28_4_ = auVar164._28_4_;
                  auVar301 = vsubps_avx(auVar301,auVar45);
                  auVar305._0_4_ = fVar73 + fVar73 * auVar301._0_4_;
                  auVar305._4_4_ = fVar86 + fVar86 * auVar301._4_4_;
                  auVar305._8_4_ = fVar115 + fVar115 * auVar301._8_4_;
                  auVar305._12_4_ = fVar116 + fVar116 * auVar301._12_4_;
                  auVar305._16_4_ = fVar222 + fVar222 * auVar301._16_4_;
                  auVar305._20_4_ = fVar117 + fVar117 * auVar301._20_4_;
                  auVar305._24_4_ = fVar219 + fVar219 * auVar301._24_4_;
                  auVar305._28_4_ = auVar236._28_4_ + auVar301._28_4_;
                  break;
                case 5:
                  auVar236 = vminps_avx(auVar305,auVar289);
                  auVar79 = vmaxps_avx(auVar292,auVar236);
                  auVar274._0_4_ = fVar166 + auVar79._0_4_ * 1.442695;
                  auVar274._4_4_ = fVar214 + auVar79._4_4_ * 1.442695;
                  auVar274._8_4_ = fVar215 + auVar79._8_4_ * 1.442695;
                  auVar274._12_4_ = fVar216 + auVar79._12_4_ * 1.442695;
                  auVar274._16_4_ = fVar217 + auVar79._16_4_ * 1.442695;
                  auVar274._20_4_ = fVar218 + auVar79._20_4_ * 1.442695;
                  auVar274._24_4_ = fVar220 + auVar79._24_4_ * 1.442695;
                  auVar274._28_4_ = fVar295 + in_ZMM7._28_4_;
                  auVar157 = vroundps_avx(auVar274,1);
                  auVar236 = vcmpps_avx(auVar274,auVar157,1);
                  auVar236 = vandps_avx(auVar236,auVar301);
                  auVar236 = vsubps_avx(auVar157,auVar236);
                  auVar41._4_4_ = auVar236._4_4_ * 0.6931472;
                  auVar41._0_4_ = auVar236._0_4_ * 0.6931472;
                  auVar41._8_4_ = auVar236._8_4_ * 0.6931472;
                  auVar41._12_4_ = auVar236._12_4_ * 0.6931472;
                  auVar41._16_4_ = auVar236._16_4_ * 0.6931472;
                  auVar41._20_4_ = auVar236._20_4_ * 0.6931472;
                  auVar41._24_4_ = auVar236._24_4_ * 0.6931472;
                  auVar41._28_4_ = auVar157._28_4_;
                  auVar79 = vsubps_avx(auVar79,auVar41);
                  fVar310 = auVar79._0_4_;
                  fVar326 = auVar79._4_4_;
                  fVar327 = auVar79._8_4_;
                  fVar328 = auVar79._12_4_;
                  fVar329 = auVar79._16_4_;
                  fVar330 = auVar79._20_4_;
                  fVar331 = auVar79._24_4_;
                  auVar179._0_4_ = (int)auVar236._0_4_;
                  auVar179._4_4_ = (int)auVar236._4_4_;
                  auVar179._8_4_ = (int)auVar236._8_4_;
                  auVar179._12_4_ = (int)auVar236._12_4_;
                  auVar209._16_4_ = (int)auVar236._16_4_;
                  auVar209._0_16_ = auVar179;
                  auVar209._20_4_ = (int)auVar236._20_4_;
                  auVar209._24_4_ = (int)auVar236._24_4_;
                  auVar209._28_4_ = (int)auVar236._28_4_;
                  auVar239 = vpslld_avx(auVar179,0x17);
                  auVar167 = vpslld_avx(auVar209._16_16_,0x17);
                  auVar233._8_4_ = 0x3f800000;
                  auVar233._0_8_ = 0x3f8000003f800000;
                  auVar233._12_4_ = 0x3f800000;
                  auVar167 = vpaddd_avx(auVar167,auVar233);
                  auVar239 = vpaddd_avx(auVar239,auVar233);
                  auVar275._0_4_ =
                       (fVar310 + fVar73 +
                       fVar310 * fVar310 *
                       (((((fVar310 * 0.00019875691 + 0.0013981999) * fVar310 + 0.008333452) *
                          fVar310 + 0.041665796) * fVar310 + 0.16666666) * fVar310 + fVar166)) *
                       auVar239._0_4_ + fVar73;
                  auVar275._4_4_ =
                       (fVar326 + fVar86 +
                       fVar326 * fVar326 *
                       (((((fVar326 * 0.00019875691 + 0.0013981999) * fVar326 + 0.008333452) *
                          fVar326 + 0.041665796) * fVar326 + 0.16666666) * fVar326 + fVar214)) *
                       auVar239._4_4_ + fVar86;
                  auVar275._8_4_ =
                       (fVar327 + fVar115 +
                       fVar327 * fVar327 *
                       (((((fVar327 * 0.00019875691 + 0.0013981999) * fVar327 + 0.008333452) *
                          fVar327 + 0.041665796) * fVar327 + 0.16666666) * fVar327 + fVar215)) *
                       auVar239._8_4_ + fVar115;
                  auVar275._12_4_ =
                       (fVar328 + fVar116 +
                       fVar328 * fVar328 *
                       (((((fVar328 * 0.00019875691 + 0.0013981999) * fVar328 + 0.008333452) *
                          fVar328 + 0.041665796) * fVar328 + 0.16666666) * fVar328 + fVar216)) *
                       auVar239._12_4_ + fVar116;
                  auVar275._16_4_ =
                       (fVar329 + fVar222 +
                       fVar329 * fVar329 *
                       (((((fVar329 * 0.00019875691 + 0.0013981999) * fVar329 + 0.008333452) *
                          fVar329 + 0.041665796) * fVar329 + 0.16666666) * fVar329 + fVar217)) *
                       auVar167._0_4_ + fVar222;
                  auVar275._20_4_ =
                       (fVar330 + fVar117 +
                       fVar330 * fVar330 *
                       (((((fVar330 * 0.00019875691 + 0.0013981999) * fVar330 + 0.008333452) *
                          fVar330 + 0.041665796) * fVar330 + 0.16666666) * fVar330 + fVar218)) *
                       auVar167._4_4_ + fVar117;
                  auVar275._24_4_ =
                       (fVar331 + fVar219 +
                       fVar331 * fVar331 *
                       (((((fVar331 * 0.00019875691 + 0.0013981999) * fVar331 + 0.008333452) *
                          fVar331 + 0.041665796) * fVar331 + 0.16666666) * fVar331 + fVar220)) *
                       auVar167._8_4_ + fVar219;
                  auVar275._28_4_ =
                       auVar79._28_4_ + fVar221 +
                       in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                       fVar295 + fVar221;
                  auVar83._8_4_ = 0x800000;
                  auVar83._0_8_ = 0x80000000800000;
                  auVar83._12_4_ = 0x800000;
                  auVar83._16_4_ = 0x800000;
                  auVar83._20_4_ = 0x800000;
                  auVar83._24_4_ = 0x800000;
                  auVar83._28_4_ = 0x800000;
                  auVar157 = vmaxps_avx(auVar275,auVar83);
                  auVar167 = vpsrld_avx(auVar157._16_16_,0x17);
                  auVar84._8_4_ = 0x807fffff;
                  auVar84._0_8_ = 0x807fffff807fffff;
                  auVar84._12_4_ = 0x807fffff;
                  auVar84._16_4_ = 0x807fffff;
                  auVar84._20_4_ = 0x807fffff;
                  auVar84._24_4_ = 0x807fffff;
                  auVar84._28_4_ = 0x807fffff;
                  auVar236 = vandps_avx(auVar157,auVar84);
                  auVar203 = vorps_avx(auVar236,auVar294._0_32_);
                  auVar85._8_4_ = 0x3f3504f3;
                  auVar85._0_8_ = 0x3f3504f33f3504f3;
                  auVar85._12_4_ = 0x3f3504f3;
                  auVar85._16_4_ = 0x3f3504f3;
                  auVar85._20_4_ = 0x3f3504f3;
                  auVar85._24_4_ = 0x3f3504f3;
                  auVar85._28_4_ = 0x3f3504f3;
                  auVar79 = vcmpps_avx(auVar85,auVar203,2);
                  auVar236 = vandnps_avx(auVar79,auVar203);
                  fVar310 = auVar203._0_4_ + -1.0 + auVar236._0_4_;
                  fVar326 = auVar203._4_4_ + -1.0 + auVar236._4_4_;
                  fVar327 = auVar203._8_4_ + -1.0 + auVar236._8_4_;
                  fVar328 = auVar203._12_4_ + -1.0 + auVar236._12_4_;
                  fVar329 = auVar203._16_4_ + -1.0 + auVar236._16_4_;
                  fVar330 = auVar203._20_4_ + -1.0 + auVar236._20_4_;
                  fVar331 = auVar203._24_4_ + -1.0 + auVar236._24_4_;
                  auVar167 = vpsubd_avx(auVar167,auVar79._16_16_);
                  auVar239 = vpsrld_avx(auVar157._0_16_,0x17);
                  auVar76._8_4_ = 0xffffff81;
                  auVar76._0_8_ = 0xffffff81ffffff81;
                  auVar76._12_4_ = 0xffffff81;
                  auVar167 = vpaddd_avx(auVar167,auVar76);
                  auVar239 = vpsubd_avx(auVar239,auVar79._0_16_);
                  auVar239 = vpaddd_avx(auVar239,auVar76);
                  auVar162._16_16_ = auVar167;
                  auVar162._0_16_ = auVar239;
                  auVar237 = ZEXT864(0) << 0x20;
                  auVar79 = vcmpps_avx(auVar275,ZEXT832(0) << 0x20,2);
                  auVar157 = vcvtdq2ps_avx(auVar162);
                  auVar42._4_4_ =
                       (fVar326 + auVar157._4_4_ * 0.6931472 +
                       fVar326 * fVar326 *
                       (fVar326 * (fVar326 * (fVar326 * (fVar326 * (fVar326 * (fVar326 * (fVar326 * 
                                                  (fVar326 * (fVar326 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar42._0_4_ =
                       (fVar310 + auVar157._0_4_ * 0.6931472 +
                       fVar310 * fVar310 *
                       (fVar310 * (fVar310 * (fVar310 * (fVar310 * (fVar310 * (fVar310 * (fVar310 * 
                                                  (fVar310 * (fVar310 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar42._8_4_ =
                       (fVar327 + auVar157._8_4_ * 0.6931472 +
                       fVar327 * fVar327 *
                       (fVar327 * (fVar327 * (fVar327 * (fVar327 * (fVar327 * (fVar327 * (fVar327 * 
                                                  (fVar327 * (fVar327 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar42._12_4_ =
                       (fVar328 + auVar157._12_4_ * 0.6931472 +
                       fVar328 * fVar328 *
                       (fVar328 * (fVar328 * (fVar328 * (fVar328 * (fVar328 * (fVar328 * (fVar328 * 
                                                  (fVar328 * (fVar328 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar42._16_4_ =
                       (fVar329 + auVar157._16_4_ * 0.6931472 +
                       fVar329 * fVar329 *
                       (fVar329 * (fVar329 * (fVar329 * (fVar329 * (fVar329 * (fVar329 * (fVar329 * 
                                                  (fVar329 * (fVar329 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar42._20_4_ =
                       (fVar330 + auVar157._20_4_ * 0.6931472 +
                       fVar330 * fVar330 *
                       (fVar330 * (fVar330 * (fVar330 * (fVar330 * (fVar330 * (fVar330 * (fVar330 * 
                                                  (fVar330 * (fVar330 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar42._24_4_ =
                       (fVar331 + auVar157._24_4_ * 0.6931472 +
                       fVar331 * fVar331 *
                       (fVar331 * (fVar331 * (fVar331 * (fVar331 * (fVar331 * (fVar331 * (fVar331 * 
                                                  (fVar331 * (fVar331 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar42._28_4_ = auVar203._28_4_ + -1.0 + auVar236._28_4_ + auVar157._28_4_ + 0.0;
                  auVar210._8_4_ = 0x7fffffff;
                  auVar210._0_8_ = 0x7fffffff7fffffff;
                  auVar210._12_4_ = 0x7fffffff;
                  auVar210._16_4_ = 0x7fffffff;
                  auVar210._20_4_ = 0x7fffffff;
                  auVar210._24_4_ = 0x7fffffff;
                  auVar210._28_4_ = 0x7fffffff;
                  auVar236 = vblendvps_avx(auVar42,auVar210,auVar79);
                  auVar236 = vminps_avx(auVar289,auVar236);
                  auVar79 = vmaxps_avx(auVar292,auVar236);
                  auVar211._0_4_ = auVar79._0_4_ * 1.442695 + fVar166;
                  auVar211._4_4_ = auVar79._4_4_ * 1.442695 + fVar214;
                  auVar211._8_4_ = auVar79._8_4_ * 1.442695 + fVar215;
                  auVar211._12_4_ = auVar79._12_4_ * 1.442695 + fVar216;
                  auVar211._16_4_ = auVar79._16_4_ * 1.442695 + fVar217;
                  auVar211._20_4_ = auVar79._20_4_ * 1.442695 + fVar218;
                  auVar211._24_4_ = auVar79._24_4_ * 1.442695 + fVar220;
                  auVar211._28_4_ = fVar295 + NAN;
                  auVar157 = vroundps_avx(auVar211,1);
                  auVar236 = vcmpps_avx(auVar211,auVar157,1);
                  auVar236 = vandps_avx(auVar236,auVar301);
                  auVar236 = vsubps_avx(auVar157,auVar236);
                  auVar43._4_4_ = auVar236._4_4_ * 0.6931472;
                  auVar43._0_4_ = auVar236._0_4_ * 0.6931472;
                  auVar43._8_4_ = auVar236._8_4_ * 0.6931472;
                  auVar43._12_4_ = auVar236._12_4_ * 0.6931472;
                  auVar43._16_4_ = auVar236._16_4_ * 0.6931472;
                  auVar43._20_4_ = auVar236._20_4_ * 0.6931472;
                  auVar43._24_4_ = auVar236._24_4_ * 0.6931472;
                  auVar43._28_4_ = auVar157._28_4_;
                  auVar79 = vsubps_avx(auVar79,auVar43);
                  fVar310 = auVar79._0_4_;
                  fVar326 = auVar79._4_4_;
                  fVar327 = auVar79._8_4_;
                  fVar328 = auVar79._12_4_;
                  fVar329 = auVar79._16_4_;
                  fVar330 = auVar79._20_4_;
                  fVar331 = auVar79._24_4_;
                  auVar293 = ZEXT3264(auVar301);
                  auVar294 = ZEXT3264(auVar294._0_32_);
                  fVar166 = fVar166 + ((((fVar310 * 0.00019875691 + 0.0013981999) * fVar310 +
                                        0.008333452) * fVar310 + 0.041665796) * fVar310 + 0.16666666
                                      ) * fVar310;
                  fVar214 = fVar214 + ((((fVar326 * 0.00019875691 + 0.0013981999) * fVar326 +
                                        0.008333452) * fVar326 + 0.041665796) * fVar326 + 0.16666666
                                      ) * fVar326;
                  fVar215 = fVar215 + ((((fVar327 * 0.00019875691 + 0.0013981999) * fVar327 +
                                        0.008333452) * fVar327 + 0.041665796) * fVar327 + 0.16666666
                                      ) * fVar327;
                  fVar216 = fVar216 + ((((fVar328 * 0.00019875691 + 0.0013981999) * fVar328 +
                                        0.008333452) * fVar328 + 0.041665796) * fVar328 + 0.16666666
                                      ) * fVar328;
                  fVar217 = fVar217 + ((((fVar329 * 0.00019875691 + 0.0013981999) * fVar329 +
                                        0.008333452) * fVar329 + 0.041665796) * fVar329 + 0.16666666
                                      ) * fVar329;
                  fVar218 = fVar218 + ((((fVar330 * 0.00019875691 + 0.0013981999) * fVar330 +
                                        0.008333452) * fVar330 + 0.041665796) * fVar330 + 0.16666666
                                      ) * fVar330;
                  fVar220 = fVar220 + ((((fVar331 * 0.00019875691 + 0.0013981999) * fVar331 +
                                        0.008333452) * fVar331 + 0.041665796) * fVar331 + 0.16666666
                                      ) * fVar331;
                  in_ZMM7 = ZEXT3264(CONCAT428(fVar295 + auVar275._28_4_ + 0.0013981999 +
                                                         0.008333452 + 0.041665796 + 0.16666666,
                                               CONCAT424(fVar220,CONCAT420(fVar218,CONCAT416(fVar217
                                                  ,CONCAT412(fVar216,CONCAT48(fVar215,CONCAT44(
                                                  fVar214,fVar166))))))));
                  auVar180._0_4_ = (int)auVar236._0_4_;
                  auVar180._4_4_ = (int)auVar236._4_4_;
                  auVar180._8_4_ = (int)auVar236._8_4_;
                  auVar180._12_4_ = (int)auVar236._12_4_;
                  auVar212._16_4_ = (int)auVar236._16_4_;
                  auVar212._0_16_ = auVar180;
                  auVar212._20_4_ = (int)auVar236._20_4_;
                  auVar212._24_4_ = (int)auVar236._24_4_;
                  auVar212._28_4_ = (int)auVar236._28_4_;
                  auVar239 = vpslld_avx(auVar180,0x17);
                  auVar167 = vpslld_avx(auVar212._16_16_,0x17);
                  auVar93._8_4_ = 0x3f800000;
                  auVar93._0_8_ = 0x3f8000003f800000;
                  auVar93._12_4_ = 0x3f800000;
                  auVar167 = vpaddd_avx(auVar167,auVar93);
                  auVar239 = vpaddd_avx(auVar239,auVar93);
                  auVar163._0_4_ =
                       (fVar310 + fVar73 + fVar310 * fVar310 * fVar166) * auVar239._0_4_ + fVar73;
                  auVar163._4_4_ =
                       (fVar326 + fVar86 + fVar326 * fVar326 * fVar214) * auVar239._4_4_ + fVar86;
                  auVar163._8_4_ =
                       (fVar327 + fVar115 + fVar327 * fVar327 * fVar215) * auVar239._8_4_ + fVar115;
                  auVar163._12_4_ =
                       (fVar328 + fVar116 + fVar328 * fVar328 * fVar216) * auVar239._12_4_ + fVar116
                  ;
                  auVar163._16_4_ =
                       (fVar329 + fVar222 + fVar329 * fVar329 * fVar217) * auVar167._0_4_ + fVar222;
                  auVar163._20_4_ =
                       (fVar330 + fVar117 + fVar330 * fVar330 * fVar218) * auVar167._4_4_ + fVar117;
                  auVar163._24_4_ =
                       (fVar331 + fVar219 + fVar331 * fVar331 * fVar220) * auVar167._8_4_ + fVar219;
                  auVar163._28_4_ = auVar79._28_4_ + fVar221 + auVar157._28_4_ + fVar221;
                  auVar301 = vrcpps_avx(auVar163);
                  fVar73 = auVar301._0_4_;
                  fVar86 = auVar301._4_4_;
                  fVar115 = auVar301._8_4_;
                  fVar116 = auVar301._12_4_;
                  fVar222 = auVar301._16_4_;
                  fVar117 = auVar301._20_4_;
                  fVar219 = auVar301._24_4_;
                  auVar44._4_4_ = auVar163._4_4_ * (fVar86 + fVar86);
                  auVar44._0_4_ = auVar163._0_4_ * (fVar73 + fVar73);
                  auVar44._8_4_ = auVar163._8_4_ * (fVar115 + fVar115);
                  auVar44._12_4_ = auVar163._12_4_ * (fVar116 + fVar116);
                  auVar44._16_4_ = auVar163._16_4_ * (fVar222 + fVar222);
                  auVar44._20_4_ = auVar163._20_4_ * (fVar117 + fVar117);
                  auVar44._24_4_ = auVar163._24_4_ * (fVar219 + fVar219);
                  auVar44._28_4_ = auVar163._28_4_;
                  auVar112._8_4_ = 0x40000000;
                  auVar112._0_8_ = 0x4000000040000000;
                  auVar112._12_4_ = 0x40000000;
                  auVar112._16_4_ = 0x40000000;
                  auVar112._20_4_ = 0x40000000;
                  auVar112._24_4_ = 0x40000000;
                  auVar112._28_4_ = 0x40000000;
                  auVar236 = vsubps_avx(auVar112,auVar44);
                  auVar213._0_4_ = fVar73 + fVar73 + -1.0;
                  auVar213._4_4_ = fVar86 + fVar86 + -1.0;
                  auVar213._8_4_ = fVar115 + fVar115 + -1.0;
                  auVar213._12_4_ = fVar116 + fVar116 + -1.0;
                  auVar213._16_4_ = fVar222 + fVar222 + -1.0;
                  auVar213._20_4_ = fVar117 + fVar117 + -1.0;
                  auVar213._24_4_ = fVar219 + fVar219 + -1.0;
                  auVar213._28_4_ = auVar301._28_4_ + auVar301._28_4_ + -1.0;
                  auVar150._0_4_ = auVar213._0_4_ + fVar73 * auVar236._0_4_;
                  auVar150._4_4_ = auVar213._4_4_ + fVar86 * auVar236._4_4_;
                  auVar150._8_4_ = auVar213._8_4_ + fVar115 * auVar236._8_4_;
                  auVar150._12_4_ = auVar213._12_4_ + fVar116 * auVar236._12_4_;
                  auVar150._16_4_ = auVar213._16_4_ + fVar222 * auVar236._16_4_;
                  auVar150._20_4_ = auVar213._20_4_ + fVar117 * auVar236._20_4_;
                  auVar150._24_4_ = auVar213._24_4_ + fVar219 * auVar236._24_4_;
                  goto LAB_002b1cb2;
                case 6:
                  fVar73 = **(float **)(&this->field_0x118 + (long)p_Var55);
                  fVar86 = (*(float **)(&this->field_0x118 + (long)p_Var55))[1];
                  auVar213._4_4_ = fVar86;
                  auVar213._0_4_ = fVar86;
                  auVar213._8_4_ = fVar86;
                  auVar213._12_4_ = fVar86;
                  auVar213._16_4_ = fVar86;
                  auVar213._20_4_ = fVar86;
                  auVar213._24_4_ = fVar86;
                  auVar213._28_4_ = fVar86;
                  auVar165._0_4_ = auVar306._0_4_ * fVar73 + fVar86;
                  auVar165._4_4_ = auVar306._4_4_ * fVar73 + fVar86;
                  auVar165._8_4_ = fVar238 * fVar73 + fVar86;
                  auVar165._12_4_ = fVar279 * fVar73 + fVar86;
                  auVar165._16_4_ = fVar280 * fVar73 + fVar86;
                  auVar165._20_4_ = fVar281 * fVar73 + fVar86;
                  auVar165._24_4_ = fVar282 * fVar73 + fVar86;
                  auVar165._28_4_ = fVar73 + fVar86;
                  auVar236 = vmaxps_avx(auVar165,auVar237._0_32_);
                  auVar301 = vminps_avx(auVar236,auVar301);
                  auVar150 = auVar301._0_28_;
LAB_002b1cb2:
                  in_ZMM3 = ZEXT3264(auVar213);
                  auVar309._0_4_ = auVar306._0_4_ * auVar150._0_4_;
                  auVar309._4_4_ = auVar306._4_4_ * auVar150._4_4_;
                  auVar309._8_4_ = fVar238 * auVar150._8_4_;
                  auVar309._12_4_ = fVar279 * auVar150._12_4_;
                  auVar309._16_4_ = fVar280 * auVar150._16_4_;
                  auVar309._20_4_ = fVar281 * auVar150._20_4_;
                  auVar309._24_4_ = fVar282 * auVar150._24_4_;
                  auVar305 = auVar309._0_32_;
                }
                *(undefined1 (*) [32])pAVar66 = auVar305;
                pAVar66 = pAVar66 + 0x20;
                uVar68 = uVar68 + 1;
                iVar53 = iVar53 + 1;
              } while (uVar68 != local_c8.w);
            }
            iVar61 = iVar61 + 1;
          } while (iVar61 != local_c8.h);
        }
        local_1a0 = local_1a0 + 1;
      } while (local_1a0 != local_c8.c);
    }
    if (((iVar16 == 8) && (local_154 == 1)) && (local_40 = (long)local_c8.c, 0 < local_40)) {
      p_Var55 = local_70[-3];
      iVar60 = *(int *)(&this->field_0xdc + (long)p_Var55);
      iVar54 = *(int *)(&this->field_0xe0 + (long)p_Var55);
      iVar17 = *(int *)(&this->field_0xe4 + (long)p_Var55);
      iVar70 = *(int *)(&this->field_0xe8 + (long)p_Var55);
      uVar20 = *(undefined4 *)(&this->field_0x114 + (long)p_Var55);
      lVar65 = *(long *)(&this->field_0x1a8 + (long)p_Var55);
      uVar18 = *(uint *)(&this->field_0xd4 + (long)p_Var55);
      uVar19 = *(uint *)(&this->field_0xd8 + (long)p_Var55);
      local_48 = CONCAT44(local_c8.elemsize._4_4_,(int)local_c8.elemsize) * local_c8.cstep;
      local_50 = (Allocator *)local_c8.data;
      iVar51 = bottom_blob->w;
      iVar52 = bottom_blob->h;
      uVar21 = bottom_blob->c;
      local_1a0 = 0;
      do {
        if (0 < iVar15) {
          sVar25 = (this->weight_data_tm).cstep;
          sVar26 = (this->weight_data_tm).elemsize;
          local_178 = local_50 + local_48 * local_1a0;
          pvVar72 = (this->weight_data_tm).data;
          iVar61 = 0;
          do {
            if (0 < iVar14) {
              iVar47 = bottom_blob->w;
              pvVar24 = bottom_blob->data;
              sVar27 = bottom_blob->elemsize;
              sVar28 = bottom_blob->cstep;
              pfVar1 = *(float **)(&this->field_0x118 + (long)p_Var55);
              uVar68 = 0;
              iVar53 = (1 - uVar18) * iVar60;
              do {
                if (lVar65 == 0) {
                  fVar73 = 0.0;
                }
                else {
                  fVar73 = *(float *)(lVar65 + local_1a0 * 4);
                }
                if ((int)uVar21 < 1) {
                  fVar86 = 0.0;
                  fVar115 = 0.0;
                  fVar116 = 0.0;
                  fVar222 = 0.0;
                  fVar117 = 0.0;
                  fVar219 = 0.0;
                  fVar221 = 0.0;
                  fVar166 = 0.0;
                }
                else {
                  fVar86 = 0.0;
                  fVar115 = 0.0;
                  fVar116 = 0.0;
                  fVar222 = 0.0;
                  fVar117 = 0.0;
                  fVar219 = 0.0;
                  fVar221 = 0.0;
                  fVar166 = 0.0;
                  uVar63 = 0;
                  pvVar64 = (void *)(sVar25 * local_1a0 * sVar26 + (long)pvVar72);
                  do {
                    if (0 < (int)uVar19) {
                      uVar71 = 0;
                      uVar69 = 0;
                      do {
                        iVar48 = (((int)uVar69 - uVar19) + 1) * iVar54 + iVar61;
                        if ((((-1 < iVar48) && (iVar49 = iVar48 / iVar70, iVar48 % iVar70 == 0)) &&
                            (0 < (int)uVar18)) && (iVar49 < iVar52)) {
                          uVar62 = (ulong)uVar18;
                          uVar67 = uVar71;
                          iVar48 = iVar53;
                          do {
                            if (((-1 < iVar48) && (iVar50 = iVar48 / iVar17, iVar48 % iVar17 == 0))
                               && (iVar50 < iVar51)) {
                              pfVar2 = (float *)((long)pvVar64 + (uVar67 & 0xffffffff) * 4);
                              pfVar3 = (float *)((long)pvVar24 +
                                                (long)(iVar50 << 3) * 4 +
                                                (long)iVar49 * (long)iVar47 * sVar27 +
                                                sVar28 * sVar27 * uVar63);
                              fVar86 = *pfVar2 * *pfVar3 + fVar86;
                              fVar115 = pfVar2[1] * pfVar3[1] + fVar115;
                              fVar116 = pfVar2[2] * pfVar3[2] + fVar116;
                              fVar222 = pfVar2[3] * pfVar3[3] + fVar222;
                              fVar117 = pfVar2[4] * pfVar3[4] + fVar117;
                              fVar219 = pfVar2[5] * pfVar3[5] + fVar219;
                              fVar221 = pfVar2[6] * pfVar3[6] + fVar221;
                              fVar166 = pfVar2[7] + fVar166;
                            }
                            uVar67 = uVar67 + 8;
                            iVar48 = iVar48 + iVar60;
                            uVar62 = uVar62 - 1;
                          } while (uVar62 != 0);
                        }
                        uVar69 = uVar69 + 1;
                        uVar71 = uVar71 + (ulong)uVar18 * 8;
                      } while (uVar69 != uVar19);
                    }
                    pvVar64 = (void *)((long)pvVar64 + (long)(int)(uVar18 * uVar19 * 8) * 4);
                    uVar63 = uVar63 + 1;
                  } while (uVar63 != uVar21);
                }
                auVar95._0_4_ = fVar117 + fVar86;
                auVar95._4_4_ = fVar219 + fVar115;
                auVar95._8_4_ = fVar221 + fVar116;
                auVar95._12_4_ = fVar166 + fVar222;
                auVar167 = vshufpd_avx(auVar95,auVar95,1);
                auVar96._0_4_ = auVar167._0_4_ + auVar95._0_4_;
                auVar96._4_4_ = auVar167._4_4_ + auVar95._4_4_;
                auVar96._8_4_ = auVar167._8_4_ + auVar95._8_4_;
                auVar96._12_4_ = auVar167._12_4_ + auVar95._12_4_;
                auVar167 = vmovshdup_avx(auVar96);
                fVar73 = auVar167._0_4_ + fVar73 + auVar96._0_4_;
                auVar167 = ZEXT416((uint)fVar73);
                fVar86 = fVar73;
                switch(uVar20) {
                case 1:
                  auVar167 = vmaxss_avx(ZEXT416((uint)fVar73),ZEXT416(0));
                  fVar86 = auVar167._0_4_;
                  break;
                case 2:
                  auVar77._0_12_ = ZEXT812(0);
                  auVar77._12_4_ = 0;
                  auVar167 = vcmpss_avx(auVar77,auVar167,1);
                  auVar127._8_4_ = 0x3f800000;
                  auVar127._0_8_ = 0x3f8000003f800000;
                  auVar127._12_4_ = 0x3f800000;
                  auVar167 = vblendvps_avx(ZEXT416((uint)*pfVar1),auVar127,auVar167);
                  fVar86 = auVar167._0_4_;
LAB_002b2133:
                  fVar86 = fVar86 * fVar73;
                  break;
                case 3:
                  auVar167 = vmaxss_avx(auVar167,ZEXT416((uint)*pfVar1));
                  fVar86 = auVar167._0_4_;
                  if (pfVar1[1] < auVar167._0_4_) {
                    fVar86 = pfVar1[1];
                  }
                  break;
                case 4:
                  auVar167 = vminss_avx(auVar167,ZEXT416(0x42b0c0a5));
                  auVar97._0_8_ = auVar167._0_8_ ^ 0x8000000080000000;
                  auVar97._8_4_ = auVar167._8_4_ ^ 0x80000000;
                  auVar97._12_4_ = auVar167._12_4_ ^ 0x80000000;
                  auVar167 = vcmpss_avx(auVar167,ZEXT416(0xc2b0c0a5),1);
                  auVar126._8_4_ = 0x42b0c0a5;
                  auVar126._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar126._12_4_ = 0x42b0c0a5;
                  auVar167 = vblendvps_avx(auVar97,auVar126,auVar167);
                  fVar73 = expf(auVar167._0_4_);
                  fVar86 = 1.0 / (fVar73 + 1.0);
                  break;
                case 5:
                  fVar86 = expf(fVar73);
                  fVar86 = logf(fVar86 + 1.0);
                  fVar86 = tanhf(fVar86);
                  fVar86 = fVar86 * fVar73;
                  break;
                case 6:
                  fVar115 = *pfVar1;
                  fVar116 = -pfVar1[1] / fVar115;
                  fVar86 = 0.0;
                  if ((fVar116 <= fVar73) && (fVar86 = fVar73, fVar73 <= fVar116 + 1.0 / fVar115)) {
                    fVar86 = fVar115 * fVar73 + pfVar1[1];
                    goto LAB_002b2133;
                  }
                }
                *(float *)local_178 = fVar86;
                local_178 = local_178 + 4;
                uVar68 = uVar68 + 1;
                iVar53 = iVar53 + 1;
              } while (uVar68 != iVar14);
            }
            iVar61 = iVar61 + 1;
          } while (iVar61 != iVar15);
        }
        local_1a0 = local_1a0 + 1;
      } while (local_1a0 != local_40);
    }
    iVar15 = local_c8.h;
    iVar14 = local_c8.w;
    if (((iVar16 == 4) && (local_154 == 4)) && (0 < (long)local_c8.c)) {
      p_Var55 = local_70[-3];
      iVar60 = *(int *)(&this->field_0xdc + (long)p_Var55);
      iVar54 = *(int *)(&this->field_0xe0 + (long)p_Var55);
      iVar17 = *(int *)(&this->field_0xe4 + (long)p_Var55);
      iVar70 = *(int *)(&this->field_0xe8 + (long)p_Var55);
      uVar20 = *(undefined4 *)(&this->field_0x114 + (long)p_Var55);
      lVar65 = *(long *)(&this->field_0x1a8 + (long)p_Var55);
      uVar18 = *(uint *)(&this->field_0xd4 + (long)p_Var55);
      uVar19 = *(uint *)(&this->field_0xd8 + (long)p_Var55);
      local_1a0 = 0;
      auVar234._8_4_ = 0x3f000000;
      auVar234._0_8_ = 0x3f0000003f000000;
      auVar234._12_4_ = 0x3f000000;
      auVar237 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      do {
        if (0 < local_c8.h) {
          iVar51 = bottom_blob->w;
          iVar52 = bottom_blob->h;
          pAVar66 = (Allocator *)
                    ((long)local_c8.data +
                    local_c8.cstep * local_1a0 *
                    CONCAT44(local_c8.elemsize._4_4_,(int)local_c8.elemsize));
          uVar21 = bottom_blob->c;
          iVar61 = 0;
          do {
            if (0 < local_c8.w) {
              uVar68 = 0;
              iVar53 = (1 - uVar18) * iVar60;
              do {
                if (lVar65 == 0) {
                  auVar98 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar98 = *(undefined1 (*) [16])(lVar65 + local_1a0 * 0x10);
                }
                auVar293 = ZEXT1664(auVar98);
                if (0 < (int)uVar21) {
                  pvVar72 = (void *)((this->weight_data_tm).cstep * local_1a0 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar24 = bottom_blob->data;
                  uVar63 = 0;
                  do {
                    if (0 < (int)uVar19) {
                      uVar69 = 0;
                      uVar71 = 0;
                      do {
                        iVar47 = (((int)uVar71 - uVar19) + 1) * iVar54 + iVar61;
                        if (((-1 < iVar47) && (iVar48 = iVar47 / iVar70, iVar47 % iVar70 == 0)) &&
                           ((0 < (int)uVar18 && (iVar48 < iVar52)))) {
                          lVar58 = (long)iVar48 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar63;
                          uVar62 = uVar69;
                          uVar67 = (ulong)uVar18;
                          iVar47 = iVar53;
                          do {
                            if (((-1 < iVar47) && (iVar48 = iVar47 / iVar17, iVar47 % iVar17 == 0))
                               && (iVar48 < iVar51)) {
                              lVar56 = (long)(iVar48 << 2);
                              fVar73 = *(float *)((long)pvVar24 + lVar56 * 4 + lVar58);
                              fVar86 = *(float *)((long)pvVar24 + lVar56 * 4 + lVar58 + 4);
                              fVar115 = *(float *)((long)pvVar24 + lVar56 * 4 + lVar58 + 8);
                              fVar116 = *(float *)((long)pvVar24 + lVar56 * 4 + lVar58 + 0xc);
                              uVar57 = uVar62 & 0xffffffff;
                              pfVar1 = (float *)((long)pvVar72 + uVar57 * 4);
                              pfVar2 = (float *)((long)pvVar72 + uVar57 * 4 + 0x10);
                              pfVar3 = (float *)((long)pvVar72 + uVar57 * 4 + 0x20);
                              pfVar4 = (float *)((long)pvVar72 + uVar57 * 4 + 0x30);
                              auVar293 = ZEXT1664(CONCAT412(fVar73 * pfVar1[3] + auVar293._12_4_ +
                                                            fVar86 * pfVar2[3] + fVar115 * pfVar3[3]
                                                            + fVar116 * pfVar4[3],
                                                            CONCAT48(fVar73 * pfVar1[2] +
                                                                     auVar293._8_4_ +
                                                                     fVar86 * pfVar2[2] +
                                                                     fVar115 * pfVar3[2] +
                                                                     fVar116 * pfVar4[2],
                                                                     CONCAT44(fVar73 * pfVar1[1] +
                                                                              auVar293._4_4_ +
                                                                              fVar86 * pfVar2[1] +
                                                                              fVar115 * pfVar3[1] +
                                                                              fVar116 * pfVar4[1],
                                                                              fVar73 * *pfVar1 +
                                                                              auVar293._0_4_ +
                                                                              fVar86 * *pfVar2 +
                                                                              fVar115 * *pfVar3 +
                                                                              fVar116 * *pfVar4))));
                            }
                            uVar62 = uVar62 + 0x10;
                            iVar47 = iVar47 + iVar60;
                            uVar67 = uVar67 - 1;
                          } while (uVar67 != 0);
                        }
                        uVar71 = uVar71 + 1;
                        uVar69 = uVar69 + (ulong)uVar18 * 0x10;
                      } while (uVar71 != uVar19);
                    }
                    auVar98 = auVar293._0_16_;
                    pvVar72 = (void *)((long)pvVar72 + (long)(int)(uVar18 * uVar19 * 0x10) * 4);
                    uVar63 = uVar63 + 1;
                  } while (uVar63 != uVar21);
                }
                auVar167 = auVar237._0_16_;
                fVar73 = auVar237._0_4_;
                fVar86 = auVar237._4_4_;
                fVar115 = auVar237._8_4_;
                fVar116 = auVar237._12_4_;
                fVar222 = auVar98._4_4_;
                fVar117 = auVar98._8_4_;
                fVar219 = auVar98._12_4_;
                switch(uVar20) {
                case 1:
                  auVar98 = vmaxps_avx(auVar98,_DAT_0053f030);
                  break;
                case 2:
                  auVar167 = vmaxps_avx(auVar98,ZEXT816(0) << 0x40);
                  auVar239 = vminps_avx(auVar98,ZEXT816(0) << 0x40);
                  fVar73 = **(float **)(&this->field_0x118 + (long)p_Var55);
                  auVar98._0_4_ = fVar73 * auVar239._0_4_ + auVar167._0_4_;
                  auVar98._4_4_ = fVar73 * auVar239._4_4_ + auVar167._4_4_;
                  auVar98._8_4_ = fVar73 * auVar239._8_4_ + auVar167._8_4_;
                  auVar98._12_4_ = fVar73 * auVar239._12_4_ + auVar167._12_4_;
                  break;
                case 3:
                  uVar9 = **(undefined4 **)(&this->field_0x118 + (long)p_Var55);
                  auVar254._4_4_ = uVar9;
                  auVar254._0_4_ = uVar9;
                  auVar254._8_4_ = uVar9;
                  auVar254._12_4_ = uVar9;
                  uVar9 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var55))[1];
                  auVar317._4_4_ = uVar9;
                  auVar317._0_4_ = uVar9;
                  auVar317._8_4_ = uVar9;
                  auVar317._12_4_ = uVar9;
                  auVar167 = vmaxps_avx(auVar98,auVar254);
                  auVar98 = vminps_avx(auVar317,auVar167);
                  break;
                case 4:
                  auVar99._0_8_ = auVar98._0_8_ ^ 0x8000000080000000;
                  auVar99._8_4_ = -fVar117;
                  auVar99._12_4_ = -fVar219;
                  auVar133._8_4_ = 0x42b0c0a5;
                  auVar133._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar133._12_4_ = 0x42b0c0a5;
                  auVar239 = vminps_avx(auVar99,auVar133);
                  auVar134._8_4_ = 0xc2b0c0a5;
                  auVar134._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar134._12_4_ = 0xc2b0c0a5;
                  auVar283 = vmaxps_avx(auVar239,auVar134);
                  auVar255._0_4_ = auVar283._0_4_ * 1.442695 + 0.5;
                  auVar255._4_4_ = auVar283._4_4_ * 1.442695 + 0.5;
                  auVar255._8_4_ = auVar283._8_4_ * 1.442695 + 0.5;
                  auVar255._12_4_ = auVar283._12_4_ * 1.442695 + 0.5;
                  auVar318._0_4_ = (int)auVar255._0_4_;
                  auVar318._4_4_ = (int)auVar255._4_4_;
                  auVar318._8_4_ = (int)auVar255._8_4_;
                  auVar318._12_4_ = (int)auVar255._12_4_;
                  auVar297 = vcvtdq2ps_avx(auVar318);
                  auVar239 = vcmpps_avx(auVar255,auVar297,1);
                  auVar239 = vandps_avx(auVar239,auVar167);
                  auVar239 = vsubps_avx(auVar297,auVar239);
                  fVar222 = auVar239._0_4_ * -0.6931472 + auVar283._0_4_;
                  fVar117 = auVar239._4_4_ * -0.6931472 + auVar283._4_4_;
                  fVar219 = auVar239._8_4_ * -0.6931472 + auVar283._8_4_;
                  fVar221 = auVar239._12_4_ * -0.6931472 + auVar283._12_4_;
                  auVar256._0_4_ = (int)auVar239._0_4_;
                  auVar256._4_4_ = (int)auVar239._4_4_;
                  auVar256._8_4_ = (int)auVar239._8_4_;
                  auVar256._12_4_ = (int)auVar239._12_4_;
                  auVar239 = vpslld_avx(auVar256,0x17);
                  auVar239 = vpaddd_avx(auVar239,auVar167);
                  auVar100._0_4_ =
                       (fVar222 * fVar222 *
                        (((((fVar222 * 0.00019875691 + 0.0013981999) * fVar222 + 0.008333452) *
                           fVar222 + 0.041665796) * fVar222 + 0.16666666) * fVar222 + 0.5) +
                       fVar222 + fVar73) * auVar239._0_4_ + fVar73;
                  auVar100._4_4_ =
                       (fVar117 * fVar117 *
                        (((((fVar117 * 0.00019875691 + 0.0013981999) * fVar117 + 0.008333452) *
                           fVar117 + 0.041665796) * fVar117 + 0.16666666) * fVar117 + 0.5) +
                       fVar117 + fVar86) * auVar239._4_4_ + fVar86;
                  auVar100._8_4_ =
                       (fVar219 * fVar219 *
                        (((((fVar219 * 0.00019875691 + 0.0013981999) * fVar219 + 0.008333452) *
                           fVar219 + 0.041665796) * fVar219 + 0.16666666) * fVar219 + 0.5) +
                       fVar219 + fVar115) * auVar239._8_4_ + fVar115;
                  auVar100._12_4_ =
                       (fVar221 * fVar221 *
                        (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) *
                           fVar221 + 0.041665796) * fVar221 + 0.16666666) * fVar221 + 0.5) +
                       fVar221 + fVar116) * auVar239._12_4_ + fVar116;
                  auVar239 = vrcpps_avx(auVar100);
                  fVar73 = auVar239._0_4_;
                  auVar101._0_4_ = auVar100._0_4_ * fVar73;
                  fVar86 = auVar239._4_4_;
                  auVar101._4_4_ = auVar100._4_4_ * fVar86;
                  fVar115 = auVar239._8_4_;
                  auVar101._8_4_ = auVar100._8_4_ * fVar115;
                  fVar116 = auVar239._12_4_;
                  auVar101._12_4_ = auVar100._12_4_ * fVar116;
                  auVar167 = vsubps_avx(auVar167,auVar101);
                  auVar98._0_4_ = fVar73 + fVar73 * auVar167._0_4_;
                  auVar98._4_4_ = fVar86 + fVar86 * auVar167._4_4_;
                  auVar98._8_4_ = fVar115 + fVar115 * auVar167._8_4_;
                  auVar98._12_4_ = fVar116 + fVar116 * auVar167._12_4_;
                  break;
                case 5:
                  auVar225._8_4_ = 0x42b0c0a5;
                  auVar225._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar225._12_4_ = 0x42b0c0a5;
                  auVar239 = vminps_avx(auVar98,auVar225);
                  auVar285._8_4_ = 0xc2b0c0a5;
                  auVar285._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar285._12_4_ = 0xc2b0c0a5;
                  auVar283 = vmaxps_avx(auVar285,auVar239);
                  auVar298._0_4_ = auVar283._0_4_ * 1.442695 + 0.5;
                  auVar298._4_4_ = auVar283._4_4_ * 1.442695 + 0.5;
                  auVar298._8_4_ = auVar283._8_4_ * 1.442695 + 0.5;
                  auVar298._12_4_ = auVar283._12_4_ * 1.442695 + 0.5;
                  auVar315._0_4_ = (int)auVar298._0_4_;
                  auVar315._4_4_ = (int)auVar298._4_4_;
                  auVar315._8_4_ = (int)auVar298._8_4_;
                  auVar315._12_4_ = (int)auVar298._12_4_;
                  auVar297 = vcvtdq2ps_avx(auVar315);
                  auVar239 = vcmpps_avx(auVar298,auVar297,1);
                  auVar239 = vandps_avx(auVar239,auVar167);
                  auVar239 = vsubps_avx(auVar297,auVar239);
                  auVar316._0_4_ = auVar239._0_4_ * 0.6931472;
                  auVar316._4_4_ = auVar239._4_4_ * 0.6931472;
                  auVar316._8_4_ = auVar239._8_4_ * 0.6931472;
                  auVar316._12_4_ = auVar239._12_4_ * 0.6931472;
                  auVar297 = vsubps_avx(auVar283,auVar316);
                  fVar221 = auVar297._0_4_;
                  fVar166 = auVar297._4_4_;
                  fVar214 = auVar297._8_4_;
                  fVar215 = auVar297._12_4_;
                  auVar250._0_4_ = (int)auVar239._0_4_;
                  auVar250._4_4_ = (int)auVar239._4_4_;
                  auVar250._8_4_ = (int)auVar239._8_4_;
                  auVar250._12_4_ = (int)auVar239._12_4_;
                  auVar239 = vpslld_avx(auVar250,0x17);
                  auVar239 = vpaddd_avx(auVar239,auVar167);
                  auVar251._0_4_ =
                       (fVar221 + fVar73 +
                       fVar221 * fVar221 *
                       (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) *
                          fVar221 + 0.041665796) * fVar221 + 0.16666666) * fVar221 + 0.5)) *
                       auVar239._0_4_ + fVar73;
                  auVar251._4_4_ =
                       (fVar166 + fVar86 +
                       fVar166 * fVar166 *
                       (((((fVar166 * 0.00019875691 + 0.0013981999) * fVar166 + 0.008333452) *
                          fVar166 + 0.041665796) * fVar166 + 0.16666666) * fVar166 + 0.5)) *
                       auVar239._4_4_ + fVar86;
                  auVar251._8_4_ =
                       (fVar214 + fVar115 +
                       fVar214 * fVar214 *
                       (((((fVar214 * 0.00019875691 + 0.0013981999) * fVar214 + 0.008333452) *
                          fVar214 + 0.041665796) * fVar214 + 0.16666666) * fVar214 + 0.5)) *
                       auVar239._8_4_ + fVar115;
                  auVar251._12_4_ =
                       (fVar215 + fVar116 +
                       fVar215 * fVar215 *
                       (((((fVar215 * 0.00019875691 + 0.0013981999) * fVar215 + 0.008333452) *
                          fVar215 + 0.041665796) * fVar215 + 0.16666666) * fVar215 + 0.5)) *
                       auVar239._12_4_ + fVar116;
                  auVar128._8_4_ = 0x800000;
                  auVar128._0_8_ = 0x80000000800000;
                  auVar128._12_4_ = 0x800000;
                  auVar239 = vmaxps_avx(auVar251,auVar128);
                  auVar297 = vpsrld_avx(auVar239,0x17);
                  auVar181._8_4_ = 0xffffff82;
                  auVar181._0_8_ = 0xffffff82ffffff82;
                  auVar181._12_4_ = 0xffffff82;
                  auVar297 = vpaddd_avx(auVar297,auVar181);
                  auVar182._8_4_ = 0x807fffff;
                  auVar182._0_8_ = 0x807fffff807fffff;
                  auVar182._12_4_ = 0x807fffff;
                  auVar239 = vandps_avx(auVar239,auVar182);
                  auVar74 = vorps_avx(auVar239,auVar234);
                  auVar283 = vcvtdq2ps_avx(auVar297);
                  auVar183._8_4_ = 0x3f3504f3;
                  auVar183._0_8_ = 0x3f3504f33f3504f3;
                  auVar183._12_4_ = 0x3f3504f3;
                  auVar297 = vcmpps_avx(auVar74,auVar183,1);
                  auVar239 = vandps_avx(auVar297,auVar74);
                  fVar221 = auVar74._0_4_ + -1.0 + auVar239._0_4_;
                  fVar166 = auVar74._4_4_ + -1.0 + auVar239._4_4_;
                  fVar214 = auVar74._8_4_ + -1.0 + auVar239._8_4_;
                  fVar215 = auVar74._12_4_ + -1.0 + auVar239._12_4_;
                  auVar239 = vandps_avx(auVar297,auVar167);
                  auVar297 = vsubps_avx(auVar283,auVar239);
                  auVar239 = vcmpps_avx(auVar251,_DAT_0053f030,2);
                  auVar129._0_4_ =
                       (fVar221 * fVar221 *
                        (((((((((fVar221 * 0.070376836 + -0.1151461) * fVar221 + 0.116769984) *
                               fVar221 + -0.12420141) * fVar221 + 0.14249323) * fVar221 +
                            -0.16668057) * fVar221 + 0.20000714) * fVar221 + -0.24999994) * fVar221
                         + 0.3333333) * fVar221 + -0.5) + auVar297._0_4_ * 0.6931472 + fVar221) *
                       -2.0;
                  auVar129._4_4_ =
                       (fVar166 * fVar166 *
                        (((((((((fVar166 * 0.070376836 + -0.1151461) * fVar166 + 0.116769984) *
                               fVar166 + -0.12420141) * fVar166 + 0.14249323) * fVar166 +
                            -0.16668057) * fVar166 + 0.20000714) * fVar166 + -0.24999994) * fVar166
                         + 0.3333333) * fVar166 + -0.5) + auVar297._4_4_ * 0.6931472 + fVar166) *
                       -2.0;
                  auVar129._8_4_ =
                       (fVar214 * fVar214 *
                        (((((((((fVar214 * 0.070376836 + -0.1151461) * fVar214 + 0.116769984) *
                               fVar214 + -0.12420141) * fVar214 + 0.14249323) * fVar214 +
                            -0.16668057) * fVar214 + 0.20000714) * fVar214 + -0.24999994) * fVar214
                         + 0.3333333) * fVar214 + -0.5) + auVar297._8_4_ * 0.6931472 + fVar214) *
                       -2.0;
                  auVar129._12_4_ =
                       (fVar215 * fVar215 *
                        (((((((((fVar215 * 0.070376836 + -0.1151461) * fVar215 + 0.116769984) *
                               fVar215 + -0.12420141) * fVar215 + 0.14249323) * fVar215 +
                            -0.16668057) * fVar215 + 0.20000714) * fVar215 + -0.24999994) * fVar215
                         + 0.3333333) * fVar215 + -0.5) + auVar297._12_4_ * 0.6931472 + fVar215) *
                       -2.0;
                  auVar184._8_4_ = 0x7fffffff;
                  auVar184._0_8_ = 0x7fffffff7fffffff;
                  auVar184._12_4_ = 0x7fffffff;
                  auVar239 = vblendvps_avx(auVar129,auVar184,auVar239);
                  auVar185._8_4_ = 0x42b0c0a5;
                  auVar185._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar185._12_4_ = 0x42b0c0a5;
                  auVar239 = vminps_avx(auVar239,auVar185);
                  auVar186._8_4_ = 0xc2b0c0a5;
                  auVar186._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar186._12_4_ = 0xc2b0c0a5;
                  auVar283 = vmaxps_avx(auVar239,auVar186);
                  auVar187._0_4_ = auVar283._0_4_ * 1.442695 + 0.5;
                  auVar187._4_4_ = auVar283._4_4_ * 1.442695 + 0.5;
                  auVar187._8_4_ = auVar283._8_4_ * 1.442695 + 0.5;
                  auVar187._12_4_ = auVar283._12_4_ * 1.442695 + 0.5;
                  auVar252._0_4_ = (int)auVar187._0_4_;
                  auVar252._4_4_ = (int)auVar187._4_4_;
                  auVar252._8_4_ = (int)auVar187._8_4_;
                  auVar252._12_4_ = (int)auVar187._12_4_;
                  auVar297 = vcvtdq2ps_avx(auVar252);
                  auVar239 = vcmpps_avx(auVar187,auVar297,1);
                  auVar239 = vandps_avx(auVar239,auVar167);
                  auVar239 = vsubps_avx(auVar297,auVar239);
                  auVar253._0_4_ = auVar239._0_4_ * 0.6931472;
                  auVar253._4_4_ = auVar239._4_4_ * 0.6931472;
                  auVar253._8_4_ = auVar239._8_4_ * 0.6931472;
                  auVar253._12_4_ = auVar239._12_4_ * 0.6931472;
                  auVar237 = ZEXT1664(auVar167);
                  auVar297 = vsubps_avx(auVar283,auVar253);
                  fVar221 = auVar297._0_4_;
                  fVar166 = auVar297._4_4_;
                  fVar214 = auVar297._8_4_;
                  fVar215 = auVar297._12_4_;
                  auVar188._0_4_ = (int)auVar239._0_4_;
                  auVar188._4_4_ = (int)auVar239._4_4_;
                  auVar188._8_4_ = (int)auVar239._8_4_;
                  auVar188._12_4_ = (int)auVar239._12_4_;
                  auVar239 = vpslld_avx(auVar188,0x17);
                  auVar167 = vpaddd_avx(auVar239,auVar167);
                  auVar130._0_4_ =
                       (fVar221 + fVar73 +
                       (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) *
                          fVar221 + 0.041665796) * fVar221 + 0.16666666) * fVar221 + 0.5) *
                       fVar221 * fVar221) * auVar167._0_4_ + fVar73;
                  auVar130._4_4_ =
                       (fVar166 + fVar86 +
                       (((((fVar166 * 0.00019875691 + 0.0013981999) * fVar166 + 0.008333452) *
                          fVar166 + 0.041665796) * fVar166 + 0.16666666) * fVar166 + 0.5) *
                       fVar166 * fVar166) * auVar167._4_4_ + fVar86;
                  auVar130._8_4_ =
                       (fVar214 + fVar115 +
                       (((((fVar214 * 0.00019875691 + 0.0013981999) * fVar214 + 0.008333452) *
                          fVar214 + 0.041665796) * fVar214 + 0.16666666) * fVar214 + 0.5) *
                       fVar214 * fVar214) * auVar167._8_4_ + fVar115;
                  auVar130._12_4_ =
                       (fVar215 + fVar116 +
                       (((((fVar215 * 0.00019875691 + 0.0013981999) * fVar215 + 0.008333452) *
                          fVar215 + 0.041665796) * fVar215 + 0.16666666) * fVar215 + 0.5) *
                       fVar215 * fVar215) * auVar167._12_4_ + fVar116;
                  auVar167 = vrcpps_avx(auVar130);
                  fVar73 = auVar167._0_4_;
                  fVar86 = auVar167._4_4_;
                  fVar115 = auVar167._8_4_;
                  fVar116 = auVar167._12_4_;
                  auVar131._0_4_ = auVar130._0_4_ * (fVar73 + fVar73);
                  auVar131._4_4_ = auVar130._4_4_ * (fVar86 + fVar86);
                  auVar131._8_4_ = auVar130._8_4_ * (fVar115 + fVar115);
                  auVar131._12_4_ = auVar130._12_4_ * (fVar116 + fVar116);
                  auVar226._8_4_ = 0x40000000;
                  auVar226._0_8_ = 0x4000000040000000;
                  auVar226._12_4_ = 0x40000000;
                  auVar167 = vsubps_avx(auVar226,auVar131);
                  auVar132._0_4_ = fVar73 + fVar73 + -1.0 + fVar73 * auVar167._0_4_;
                  auVar132._4_4_ = fVar86 + fVar86 + -1.0 + fVar86 * auVar167._4_4_;
                  auVar132._8_4_ = fVar115 + fVar115 + -1.0 + fVar115 * auVar167._8_4_;
                  auVar132._12_4_ = fVar116 + fVar116 + -1.0 + fVar116 * auVar167._12_4_;
                  goto LAB_002b2998;
                case 6:
                  fVar73 = **(float **)(&this->field_0x118 + (long)p_Var55);
                  fVar86 = (*(float **)(&this->field_0x118 + (long)p_Var55))[1];
                  auVar135._0_4_ = fVar73 * auVar98._0_4_ + fVar86;
                  auVar135._4_4_ = fVar73 * fVar222 + fVar86;
                  auVar135._8_4_ = fVar73 * fVar117 + fVar86;
                  auVar135._12_4_ = fVar73 * fVar219 + fVar86;
                  auVar239 = vmaxps_avx(auVar135,_DAT_0053f030);
                  auVar132 = vminps_avx(auVar239,auVar167);
LAB_002b2998:
                  auVar98._0_4_ = auVar132._0_4_ * auVar98._0_4_;
                  auVar98._4_4_ = auVar132._4_4_ * fVar222;
                  auVar98._8_4_ = auVar132._8_4_ * fVar117;
                  auVar98._12_4_ = auVar132._12_4_ * fVar219;
                }
                *(undefined1 (*) [16])pAVar66 = auVar98;
                pAVar66 = pAVar66 + 0x10;
                uVar68 = uVar68 + 1;
                iVar53 = iVar53 + 1;
              } while (uVar68 != local_c8.w);
            }
            iVar61 = iVar61 + 1;
          } while (iVar61 != local_c8.h);
        }
        local_1a0 = local_1a0 + 1;
      } while (local_1a0 != local_c8.c);
    }
    if (((iVar16 == 1) && (local_154 == 4)) && (0 < (long)local_c8.c)) {
      p_Var55 = local_70[-3];
      iVar60 = *(int *)(&this->field_0xdc + (long)p_Var55);
      iVar54 = *(int *)(&this->field_0xe0 + (long)p_Var55);
      iVar17 = *(int *)(&this->field_0xe4 + (long)p_Var55);
      iVar70 = *(int *)(&this->field_0xe8 + (long)p_Var55);
      uVar20 = *(undefined4 *)(&this->field_0x114 + (long)p_Var55);
      lVar65 = *(long *)(&this->field_0x1a8 + (long)p_Var55);
      uVar18 = *(uint *)(&this->field_0xd4 + (long)p_Var55);
      uVar19 = *(uint *)(&this->field_0xd8 + (long)p_Var55);
      local_1a0 = 0;
      auVar235._8_4_ = 0x3f000000;
      auVar235._0_8_ = 0x3f0000003f000000;
      auVar235._12_4_ = 0x3f000000;
      auVar237 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      do {
        if (0 < local_c8.h) {
          iVar51 = bottom_blob->w;
          iVar52 = bottom_blob->h;
          pAVar66 = (Allocator *)
                    ((long)local_c8.data +
                    local_c8.cstep * local_1a0 *
                    CONCAT44(local_c8.elemsize._4_4_,(int)local_c8.elemsize));
          uVar21 = bottom_blob->c;
          iVar61 = 0;
          do {
            if (0 < local_c8.w) {
              uVar68 = 0;
              iVar53 = (1 - uVar18) * iVar60;
              do {
                if (lVar65 == 0) {
                  auVar102 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar102 = *(undefined1 (*) [16])(lVar65 + local_1a0 * 0x10);
                }
                auVar293 = ZEXT1664(auVar102);
                if (0 < (int)uVar21) {
                  pvVar72 = (void *)((this->weight_data_tm).cstep * local_1a0 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  uVar63 = 0;
                  do {
                    if (0 < (int)uVar19) {
                      uVar71 = 0;
                      uVar69 = 0;
                      do {
                        iVar47 = (((int)uVar69 - uVar19) + 1) * iVar54 + iVar61;
                        if (((-1 < iVar47) && (iVar48 = iVar47 / iVar70, iVar47 % iVar70 == 0)) &&
                           ((iVar48 < iVar52 && (0 < (int)uVar18)))) {
                          uVar62 = uVar71;
                          uVar67 = (ulong)uVar18;
                          iVar47 = iVar53;
                          do {
                            if (((-1 < iVar47) && (iVar49 = iVar47 / iVar17, iVar47 % iVar17 == 0))
                               && (iVar49 < iVar51)) {
                              fVar73 = *(float *)((long)bottom_blob->data +
                                                 (long)iVar49 * 4 +
                                                 (long)iVar48 *
                                                 (long)bottom_blob->w * bottom_blob->elemsize +
                                                 bottom_blob->cstep * bottom_blob->elemsize * uVar63
                                                 );
                              pfVar1 = (float *)((long)pvVar72 + (uVar62 & 0xffffffff) * 4);
                              auVar293 = ZEXT1664(CONCAT412(fVar73 * pfVar1[3] + auVar293._12_4_,
                                                            CONCAT48(fVar73 * pfVar1[2] +
                                                                     auVar293._8_4_,
                                                                     CONCAT44(fVar73 * pfVar1[1] +
                                                                              auVar293._4_4_,
                                                                              fVar73 * *pfVar1 +
                                                                              auVar293._0_4_))));
                            }
                            uVar62 = uVar62 + 4;
                            iVar47 = iVar47 + iVar60;
                            uVar67 = uVar67 - 1;
                          } while (uVar67 != 0);
                        }
                        uVar69 = uVar69 + 1;
                        uVar71 = uVar71 + (ulong)uVar18 * 4;
                      } while (uVar69 != uVar19);
                    }
                    auVar102 = auVar293._0_16_;
                    pvVar72 = (void *)((long)pvVar72 + (long)(int)(uVar18 * uVar19 * 4) * 4);
                    uVar63 = uVar63 + 1;
                  } while (uVar63 != uVar21);
                }
                auVar167 = auVar237._0_16_;
                fVar73 = auVar237._0_4_;
                fVar86 = auVar237._4_4_;
                fVar115 = auVar237._8_4_;
                fVar116 = auVar237._12_4_;
                fVar222 = auVar102._4_4_;
                fVar117 = auVar102._8_4_;
                fVar219 = auVar102._12_4_;
                switch(uVar20) {
                case 1:
                  auVar102 = vmaxps_avx(auVar102,_DAT_0053f030);
                  break;
                case 2:
                  auVar167 = vmaxps_avx(auVar102,ZEXT816(0) << 0x40);
                  auVar239 = vminps_avx(auVar102,ZEXT816(0) << 0x40);
                  fVar73 = **(float **)(&this->field_0x118 + (long)p_Var55);
                  auVar102._0_4_ = fVar73 * auVar239._0_4_ + auVar167._0_4_;
                  auVar102._4_4_ = fVar73 * auVar239._4_4_ + auVar167._4_4_;
                  auVar102._8_4_ = fVar73 * auVar239._8_4_ + auVar167._8_4_;
                  auVar102._12_4_ = fVar73 * auVar239._12_4_ + auVar167._12_4_;
                  break;
                case 3:
                  uVar9 = **(undefined4 **)(&this->field_0x118 + (long)p_Var55);
                  auVar261._4_4_ = uVar9;
                  auVar261._0_4_ = uVar9;
                  auVar261._8_4_ = uVar9;
                  auVar261._12_4_ = uVar9;
                  uVar9 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var55))[1];
                  auVar321._4_4_ = uVar9;
                  auVar321._0_4_ = uVar9;
                  auVar321._8_4_ = uVar9;
                  auVar321._12_4_ = uVar9;
                  auVar167 = vmaxps_avx(auVar102,auVar261);
                  auVar102 = vminps_avx(auVar321,auVar167);
                  break;
                case 4:
                  auVar103._0_8_ = auVar102._0_8_ ^ 0x8000000080000000;
                  auVar103._8_4_ = -fVar117;
                  auVar103._12_4_ = -fVar219;
                  auVar141._8_4_ = 0x42b0c0a5;
                  auVar141._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar141._12_4_ = 0x42b0c0a5;
                  auVar239 = vminps_avx(auVar103,auVar141);
                  auVar142._8_4_ = 0xc2b0c0a5;
                  auVar142._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar142._12_4_ = 0xc2b0c0a5;
                  auVar283 = vmaxps_avx(auVar239,auVar142);
                  auVar262._0_4_ = auVar283._0_4_ * 1.442695 + 0.5;
                  auVar262._4_4_ = auVar283._4_4_ * 1.442695 + 0.5;
                  auVar262._8_4_ = auVar283._8_4_ * 1.442695 + 0.5;
                  auVar262._12_4_ = auVar283._12_4_ * 1.442695 + 0.5;
                  auVar322._0_4_ = (int)auVar262._0_4_;
                  auVar322._4_4_ = (int)auVar262._4_4_;
                  auVar322._8_4_ = (int)auVar262._8_4_;
                  auVar322._12_4_ = (int)auVar262._12_4_;
                  auVar297 = vcvtdq2ps_avx(auVar322);
                  auVar239 = vcmpps_avx(auVar262,auVar297,1);
                  auVar239 = vandps_avx(auVar239,auVar167);
                  auVar239 = vsubps_avx(auVar297,auVar239);
                  fVar222 = auVar239._0_4_ * -0.6931472 + auVar283._0_4_;
                  fVar117 = auVar239._4_4_ * -0.6931472 + auVar283._4_4_;
                  fVar219 = auVar239._8_4_ * -0.6931472 + auVar283._8_4_;
                  fVar221 = auVar239._12_4_ * -0.6931472 + auVar283._12_4_;
                  auVar263._0_4_ = (int)auVar239._0_4_;
                  auVar263._4_4_ = (int)auVar239._4_4_;
                  auVar263._8_4_ = (int)auVar239._8_4_;
                  auVar263._12_4_ = (int)auVar239._12_4_;
                  auVar239 = vpslld_avx(auVar263,0x17);
                  auVar239 = vpaddd_avx(auVar239,auVar167);
                  auVar104._0_4_ =
                       (fVar222 * fVar222 *
                        (((((fVar222 * 0.00019875691 + 0.0013981999) * fVar222 + 0.008333452) *
                           fVar222 + 0.041665796) * fVar222 + 0.16666666) * fVar222 + 0.5) +
                       fVar222 + fVar73) * auVar239._0_4_ + fVar73;
                  auVar104._4_4_ =
                       (fVar117 * fVar117 *
                        (((((fVar117 * 0.00019875691 + 0.0013981999) * fVar117 + 0.008333452) *
                           fVar117 + 0.041665796) * fVar117 + 0.16666666) * fVar117 + 0.5) +
                       fVar117 + fVar86) * auVar239._4_4_ + fVar86;
                  auVar104._8_4_ =
                       (fVar219 * fVar219 *
                        (((((fVar219 * 0.00019875691 + 0.0013981999) * fVar219 + 0.008333452) *
                           fVar219 + 0.041665796) * fVar219 + 0.16666666) * fVar219 + 0.5) +
                       fVar219 + fVar115) * auVar239._8_4_ + fVar115;
                  auVar104._12_4_ =
                       (fVar221 * fVar221 *
                        (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) *
                           fVar221 + 0.041665796) * fVar221 + 0.16666666) * fVar221 + 0.5) +
                       fVar221 + fVar116) * auVar239._12_4_ + fVar116;
                  auVar239 = vrcpps_avx(auVar104);
                  fVar73 = auVar239._0_4_;
                  auVar105._0_4_ = auVar104._0_4_ * fVar73;
                  fVar86 = auVar239._4_4_;
                  auVar105._4_4_ = auVar104._4_4_ * fVar86;
                  fVar115 = auVar239._8_4_;
                  auVar105._8_4_ = auVar104._8_4_ * fVar115;
                  fVar116 = auVar239._12_4_;
                  auVar105._12_4_ = auVar104._12_4_ * fVar116;
                  auVar167 = vsubps_avx(auVar167,auVar105);
                  auVar102._0_4_ = fVar73 + fVar73 * auVar167._0_4_;
                  auVar102._4_4_ = fVar86 + fVar86 * auVar167._4_4_;
                  auVar102._8_4_ = fVar115 + fVar115 * auVar167._8_4_;
                  auVar102._12_4_ = fVar116 + fVar116 * auVar167._12_4_;
                  break;
                case 5:
                  auVar227._8_4_ = 0x42b0c0a5;
                  auVar227._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar227._12_4_ = 0x42b0c0a5;
                  auVar239 = vminps_avx(auVar102,auVar227);
                  auVar286._8_4_ = 0xc2b0c0a5;
                  auVar286._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar286._12_4_ = 0xc2b0c0a5;
                  auVar283 = vmaxps_avx(auVar286,auVar239);
                  auVar299._0_4_ = auVar283._0_4_ * 1.442695 + 0.5;
                  auVar299._4_4_ = auVar283._4_4_ * 1.442695 + 0.5;
                  auVar299._8_4_ = auVar283._8_4_ * 1.442695 + 0.5;
                  auVar299._12_4_ = auVar283._12_4_ * 1.442695 + 0.5;
                  auVar319._0_4_ = (int)auVar299._0_4_;
                  auVar319._4_4_ = (int)auVar299._4_4_;
                  auVar319._8_4_ = (int)auVar299._8_4_;
                  auVar319._12_4_ = (int)auVar299._12_4_;
                  auVar297 = vcvtdq2ps_avx(auVar319);
                  auVar239 = vcmpps_avx(auVar299,auVar297,1);
                  auVar239 = vandps_avx(auVar239,auVar167);
                  auVar239 = vsubps_avx(auVar297,auVar239);
                  auVar320._0_4_ = auVar239._0_4_ * 0.6931472;
                  auVar320._4_4_ = auVar239._4_4_ * 0.6931472;
                  auVar320._8_4_ = auVar239._8_4_ * 0.6931472;
                  auVar320._12_4_ = auVar239._12_4_ * 0.6931472;
                  auVar297 = vsubps_avx(auVar283,auVar320);
                  fVar221 = auVar297._0_4_;
                  fVar166 = auVar297._4_4_;
                  fVar214 = auVar297._8_4_;
                  fVar215 = auVar297._12_4_;
                  auVar257._0_4_ = (int)auVar239._0_4_;
                  auVar257._4_4_ = (int)auVar239._4_4_;
                  auVar257._8_4_ = (int)auVar239._8_4_;
                  auVar257._12_4_ = (int)auVar239._12_4_;
                  auVar239 = vpslld_avx(auVar257,0x17);
                  auVar239 = vpaddd_avx(auVar239,auVar167);
                  auVar258._0_4_ =
                       (fVar221 + fVar73 +
                       fVar221 * fVar221 *
                       (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) *
                          fVar221 + 0.041665796) * fVar221 + 0.16666666) * fVar221 + 0.5)) *
                       auVar239._0_4_ + fVar73;
                  auVar258._4_4_ =
                       (fVar166 + fVar86 +
                       fVar166 * fVar166 *
                       (((((fVar166 * 0.00019875691 + 0.0013981999) * fVar166 + 0.008333452) *
                          fVar166 + 0.041665796) * fVar166 + 0.16666666) * fVar166 + 0.5)) *
                       auVar239._4_4_ + fVar86;
                  auVar258._8_4_ =
                       (fVar214 + fVar115 +
                       fVar214 * fVar214 *
                       (((((fVar214 * 0.00019875691 + 0.0013981999) * fVar214 + 0.008333452) *
                          fVar214 + 0.041665796) * fVar214 + 0.16666666) * fVar214 + 0.5)) *
                       auVar239._8_4_ + fVar115;
                  auVar258._12_4_ =
                       (fVar215 + fVar116 +
                       fVar215 * fVar215 *
                       (((((fVar215 * 0.00019875691 + 0.0013981999) * fVar215 + 0.008333452) *
                          fVar215 + 0.041665796) * fVar215 + 0.16666666) * fVar215 + 0.5)) *
                       auVar239._12_4_ + fVar116;
                  auVar136._8_4_ = 0x800000;
                  auVar136._0_8_ = 0x80000000800000;
                  auVar136._12_4_ = 0x800000;
                  auVar239 = vmaxps_avx(auVar258,auVar136);
                  auVar297 = vpsrld_avx(auVar239,0x17);
                  auVar189._8_4_ = 0xffffff82;
                  auVar189._0_8_ = 0xffffff82ffffff82;
                  auVar189._12_4_ = 0xffffff82;
                  auVar297 = vpaddd_avx(auVar297,auVar189);
                  auVar190._8_4_ = 0x807fffff;
                  auVar190._0_8_ = 0x807fffff807fffff;
                  auVar190._12_4_ = 0x807fffff;
                  auVar239 = vandps_avx(auVar239,auVar190);
                  auVar74 = vorps_avx(auVar239,auVar235);
                  auVar283 = vcvtdq2ps_avx(auVar297);
                  auVar191._8_4_ = 0x3f3504f3;
                  auVar191._0_8_ = 0x3f3504f33f3504f3;
                  auVar191._12_4_ = 0x3f3504f3;
                  auVar297 = vcmpps_avx(auVar74,auVar191,1);
                  auVar239 = vandps_avx(auVar297,auVar74);
                  fVar221 = auVar74._0_4_ + -1.0 + auVar239._0_4_;
                  fVar166 = auVar74._4_4_ + -1.0 + auVar239._4_4_;
                  fVar214 = auVar74._8_4_ + -1.0 + auVar239._8_4_;
                  fVar215 = auVar74._12_4_ + -1.0 + auVar239._12_4_;
                  auVar239 = vandps_avx(auVar297,auVar167);
                  auVar297 = vsubps_avx(auVar283,auVar239);
                  auVar239 = vcmpps_avx(auVar258,_DAT_0053f030,2);
                  auVar137._0_4_ =
                       (fVar221 * fVar221 *
                        (((((((((fVar221 * 0.070376836 + -0.1151461) * fVar221 + 0.116769984) *
                               fVar221 + -0.12420141) * fVar221 + 0.14249323) * fVar221 +
                            -0.16668057) * fVar221 + 0.20000714) * fVar221 + -0.24999994) * fVar221
                         + 0.3333333) * fVar221 + -0.5) + auVar297._0_4_ * 0.6931472 + fVar221) *
                       -2.0;
                  auVar137._4_4_ =
                       (fVar166 * fVar166 *
                        (((((((((fVar166 * 0.070376836 + -0.1151461) * fVar166 + 0.116769984) *
                               fVar166 + -0.12420141) * fVar166 + 0.14249323) * fVar166 +
                            -0.16668057) * fVar166 + 0.20000714) * fVar166 + -0.24999994) * fVar166
                         + 0.3333333) * fVar166 + -0.5) + auVar297._4_4_ * 0.6931472 + fVar166) *
                       -2.0;
                  auVar137._8_4_ =
                       (fVar214 * fVar214 *
                        (((((((((fVar214 * 0.070376836 + -0.1151461) * fVar214 + 0.116769984) *
                               fVar214 + -0.12420141) * fVar214 + 0.14249323) * fVar214 +
                            -0.16668057) * fVar214 + 0.20000714) * fVar214 + -0.24999994) * fVar214
                         + 0.3333333) * fVar214 + -0.5) + auVar297._8_4_ * 0.6931472 + fVar214) *
                       -2.0;
                  auVar137._12_4_ =
                       (fVar215 * fVar215 *
                        (((((((((fVar215 * 0.070376836 + -0.1151461) * fVar215 + 0.116769984) *
                               fVar215 + -0.12420141) * fVar215 + 0.14249323) * fVar215 +
                            -0.16668057) * fVar215 + 0.20000714) * fVar215 + -0.24999994) * fVar215
                         + 0.3333333) * fVar215 + -0.5) + auVar297._12_4_ * 0.6931472 + fVar215) *
                       -2.0;
                  auVar192._8_4_ = 0x7fffffff;
                  auVar192._0_8_ = 0x7fffffff7fffffff;
                  auVar192._12_4_ = 0x7fffffff;
                  auVar239 = vblendvps_avx(auVar137,auVar192,auVar239);
                  auVar193._8_4_ = 0x42b0c0a5;
                  auVar193._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar193._12_4_ = 0x42b0c0a5;
                  auVar239 = vminps_avx(auVar239,auVar193);
                  auVar194._8_4_ = 0xc2b0c0a5;
                  auVar194._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar194._12_4_ = 0xc2b0c0a5;
                  auVar283 = vmaxps_avx(auVar239,auVar194);
                  auVar195._0_4_ = auVar283._0_4_ * 1.442695 + 0.5;
                  auVar195._4_4_ = auVar283._4_4_ * 1.442695 + 0.5;
                  auVar195._8_4_ = auVar283._8_4_ * 1.442695 + 0.5;
                  auVar195._12_4_ = auVar283._12_4_ * 1.442695 + 0.5;
                  auVar259._0_4_ = (int)auVar195._0_4_;
                  auVar259._4_4_ = (int)auVar195._4_4_;
                  auVar259._8_4_ = (int)auVar195._8_4_;
                  auVar259._12_4_ = (int)auVar195._12_4_;
                  auVar297 = vcvtdq2ps_avx(auVar259);
                  auVar239 = vcmpps_avx(auVar195,auVar297,1);
                  auVar239 = vandps_avx(auVar239,auVar167);
                  auVar239 = vsubps_avx(auVar297,auVar239);
                  auVar260._0_4_ = auVar239._0_4_ * 0.6931472;
                  auVar260._4_4_ = auVar239._4_4_ * 0.6931472;
                  auVar260._8_4_ = auVar239._8_4_ * 0.6931472;
                  auVar260._12_4_ = auVar239._12_4_ * 0.6931472;
                  auVar237 = ZEXT1664(auVar167);
                  auVar297 = vsubps_avx(auVar283,auVar260);
                  fVar221 = auVar297._0_4_;
                  fVar166 = auVar297._4_4_;
                  fVar214 = auVar297._8_4_;
                  fVar215 = auVar297._12_4_;
                  auVar196._0_4_ = (int)auVar239._0_4_;
                  auVar196._4_4_ = (int)auVar239._4_4_;
                  auVar196._8_4_ = (int)auVar239._8_4_;
                  auVar196._12_4_ = (int)auVar239._12_4_;
                  auVar239 = vpslld_avx(auVar196,0x17);
                  auVar167 = vpaddd_avx(auVar239,auVar167);
                  auVar138._0_4_ =
                       (fVar221 + fVar73 +
                       (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) *
                          fVar221 + 0.041665796) * fVar221 + 0.16666666) * fVar221 + 0.5) *
                       fVar221 * fVar221) * auVar167._0_4_ + fVar73;
                  auVar138._4_4_ =
                       (fVar166 + fVar86 +
                       (((((fVar166 * 0.00019875691 + 0.0013981999) * fVar166 + 0.008333452) *
                          fVar166 + 0.041665796) * fVar166 + 0.16666666) * fVar166 + 0.5) *
                       fVar166 * fVar166) * auVar167._4_4_ + fVar86;
                  auVar138._8_4_ =
                       (fVar214 + fVar115 +
                       (((((fVar214 * 0.00019875691 + 0.0013981999) * fVar214 + 0.008333452) *
                          fVar214 + 0.041665796) * fVar214 + 0.16666666) * fVar214 + 0.5) *
                       fVar214 * fVar214) * auVar167._8_4_ + fVar115;
                  auVar138._12_4_ =
                       (fVar215 + fVar116 +
                       (((((fVar215 * 0.00019875691 + 0.0013981999) * fVar215 + 0.008333452) *
                          fVar215 + 0.041665796) * fVar215 + 0.16666666) * fVar215 + 0.5) *
                       fVar215 * fVar215) * auVar167._12_4_ + fVar116;
                  auVar167 = vrcpps_avx(auVar138);
                  fVar73 = auVar167._0_4_;
                  fVar86 = auVar167._4_4_;
                  fVar115 = auVar167._8_4_;
                  fVar116 = auVar167._12_4_;
                  auVar139._0_4_ = auVar138._0_4_ * (fVar73 + fVar73);
                  auVar139._4_4_ = auVar138._4_4_ * (fVar86 + fVar86);
                  auVar139._8_4_ = auVar138._8_4_ * (fVar115 + fVar115);
                  auVar139._12_4_ = auVar138._12_4_ * (fVar116 + fVar116);
                  auVar228._8_4_ = 0x40000000;
                  auVar228._0_8_ = 0x4000000040000000;
                  auVar228._12_4_ = 0x40000000;
                  auVar167 = vsubps_avx(auVar228,auVar139);
                  auVar140._0_4_ = fVar73 + fVar73 + -1.0 + fVar73 * auVar167._0_4_;
                  auVar140._4_4_ = fVar86 + fVar86 + -1.0 + fVar86 * auVar167._4_4_;
                  auVar140._8_4_ = fVar115 + fVar115 + -1.0 + fVar115 * auVar167._8_4_;
                  auVar140._12_4_ = fVar116 + fVar116 + -1.0 + fVar116 * auVar167._12_4_;
                  goto LAB_002b314f;
                case 6:
                  fVar73 = **(float **)(&this->field_0x118 + (long)p_Var55);
                  fVar86 = (*(float **)(&this->field_0x118 + (long)p_Var55))[1];
                  auVar143._0_4_ = fVar73 * auVar102._0_4_ + fVar86;
                  auVar143._4_4_ = fVar73 * fVar222 + fVar86;
                  auVar143._8_4_ = fVar73 * fVar117 + fVar86;
                  auVar143._12_4_ = fVar73 * fVar219 + fVar86;
                  auVar239 = vmaxps_avx(auVar143,_DAT_0053f030);
                  auVar140 = vminps_avx(auVar239,auVar167);
LAB_002b314f:
                  auVar102._0_4_ = auVar140._0_4_ * auVar102._0_4_;
                  auVar102._4_4_ = auVar140._4_4_ * fVar222;
                  auVar102._8_4_ = auVar140._8_4_ * fVar117;
                  auVar102._12_4_ = auVar140._12_4_ * fVar219;
                }
                *(undefined1 (*) [16])pAVar66 = auVar102;
                pAVar66 = pAVar66 + 0x10;
                uVar68 = uVar68 + 1;
                iVar53 = iVar53 + 1;
              } while (uVar68 != local_c8.w);
            }
            iVar61 = iVar61 + 1;
          } while (iVar61 != local_c8.h);
        }
        local_1a0 = local_1a0 + 1;
      } while (local_1a0 != local_c8.c);
    }
    if (((iVar16 == 4) && (local_154 == 1)) && (local_40 = (long)local_c8.c, 0 < local_40)) {
      p_Var55 = local_70[-3];
      iVar60 = *(int *)(&this->field_0xdc + (long)p_Var55);
      iVar54 = *(int *)(&this->field_0xe0 + (long)p_Var55);
      iVar17 = *(int *)(&this->field_0xe4 + (long)p_Var55);
      iVar70 = *(int *)(&this->field_0xe8 + (long)p_Var55);
      uVar20 = *(undefined4 *)(&this->field_0x114 + (long)p_Var55);
      lVar65 = *(long *)(&this->field_0x1a8 + (long)p_Var55);
      uVar18 = *(uint *)(&this->field_0xd4 + (long)p_Var55);
      uVar19 = *(uint *)(&this->field_0xd8 + (long)p_Var55);
      local_48 = CONCAT44(local_c8.elemsize._4_4_,(int)local_c8.elemsize) * local_c8.cstep;
      local_50 = (Allocator *)local_c8.data;
      iVar51 = bottom_blob->w;
      iVar52 = bottom_blob->h;
      uVar21 = bottom_blob->c;
      local_1a0 = 0;
      do {
        if (0 < iVar15) {
          sVar25 = (this->weight_data_tm).cstep;
          sVar26 = (this->weight_data_tm).elemsize;
          local_178 = local_50 + local_48 * local_1a0;
          pvVar72 = (this->weight_data_tm).data;
          iVar61 = 0;
          do {
            if (0 < iVar14) {
              iVar47 = bottom_blob->w;
              pvVar24 = bottom_blob->data;
              sVar27 = bottom_blob->elemsize;
              sVar28 = bottom_blob->cstep;
              pfVar1 = *(float **)(&this->field_0x118 + (long)p_Var55);
              uVar68 = 0;
              iVar53 = (1 - uVar18) * iVar60;
              do {
                if (lVar65 == 0) {
                  fVar73 = 0.0;
                }
                else {
                  fVar73 = *(float *)(lVar65 + local_1a0 * 4);
                }
                if ((int)uVar21 < 1) {
                  auVar167 = SUB6416(ZEXT864(0),0);
                }
                else {
                  auVar237 = ZEXT864(0);
                  uVar63 = 0;
                  pvVar64 = (void *)(sVar25 * local_1a0 * sVar26 + (long)pvVar72);
                  do {
                    if (0 < (int)uVar19) {
                      uVar71 = 0;
                      uVar69 = 0;
                      do {
                        iVar48 = (((int)uVar69 - uVar19) + 1) * iVar54 + iVar61;
                        if (((-1 < iVar48) && (iVar49 = iVar48 / iVar70, iVar48 % iVar70 == 0)) &&
                           ((0 < (int)uVar18 && (iVar49 < iVar52)))) {
                          uVar62 = (ulong)uVar18;
                          uVar67 = uVar71;
                          iVar48 = iVar53;
                          do {
                            if (((-1 < iVar48) && (iVar50 = iVar48 / iVar17, iVar48 % iVar17 == 0))
                               && (iVar50 < iVar51)) {
                              pfVar2 = (float *)((long)pvVar64 + (uVar67 & 0xffffffff) * 4);
                              pfVar3 = (float *)((long)pvVar24 +
                                                (long)(iVar50 << 2) * 4 +
                                                (long)iVar49 * (long)iVar47 * sVar27 +
                                                sVar28 * sVar27 * uVar63);
                              auVar237 = ZEXT1664(CONCAT412(pfVar2[3] * pfVar3[3] + auVar237._12_4_,
                                                            CONCAT48(pfVar2[2] * pfVar3[2] +
                                                                     auVar237._8_4_,
                                                                     CONCAT44(pfVar2[1] * pfVar3[1]
                                                                              + auVar237._4_4_,
                                                                              *pfVar2 * *pfVar3 +
                                                                              auVar237._0_4_))));
                            }
                            uVar67 = uVar67 + 4;
                            iVar48 = iVar48 + iVar60;
                            uVar62 = uVar62 - 1;
                          } while (uVar62 != 0);
                        }
                        uVar69 = uVar69 + 1;
                        uVar71 = uVar71 + (ulong)uVar18 * 4;
                      } while (uVar69 != uVar19);
                    }
                    auVar167 = auVar237._0_16_;
                    pvVar64 = (void *)((long)pvVar64 + (long)(int)(uVar18 * uVar19 * 4) * 4);
                    uVar63 = uVar63 + 1;
                  } while (uVar63 != uVar21);
                }
                auVar239 = vshufpd_avx(auVar167,auVar167,1);
                auVar106._0_4_ = auVar239._0_4_ + auVar167._0_4_;
                auVar106._4_4_ = auVar239._4_4_ + auVar167._4_4_;
                auVar106._8_4_ = auVar239._8_4_ + auVar167._8_4_;
                auVar106._12_4_ = auVar239._12_4_ + auVar167._12_4_;
                auVar167 = vmovshdup_avx(auVar106);
                fVar73 = auVar167._0_4_ + fVar73 + auVar106._0_4_;
                auVar167 = ZEXT416((uint)fVar73);
                fVar86 = fVar73;
                switch(uVar20) {
                case 1:
                  auVar167 = vmaxss_avx(ZEXT416((uint)fVar73),ZEXT416(0));
                  fVar86 = auVar167._0_4_;
                  break;
                case 2:
                  auVar78._0_12_ = ZEXT812(0);
                  auVar78._12_4_ = 0;
                  auVar167 = vcmpss_avx(auVar78,auVar167,1);
                  auVar145._8_4_ = 0x3f800000;
                  auVar145._0_8_ = 0x3f8000003f800000;
                  auVar145._12_4_ = 0x3f800000;
                  auVar167 = vblendvps_avx(ZEXT416((uint)*pfVar1),auVar145,auVar167);
                  fVar86 = auVar167._0_4_;
LAB_002b35b5:
                  fVar86 = fVar86 * fVar73;
                  break;
                case 3:
                  auVar167 = vmaxss_avx(auVar167,ZEXT416((uint)*pfVar1));
                  fVar86 = auVar167._0_4_;
                  if (pfVar1[1] < auVar167._0_4_) {
                    fVar86 = pfVar1[1];
                  }
                  break;
                case 4:
                  auVar167 = vminss_avx(auVar167,ZEXT416(0x42b0c0a5));
                  auVar107._0_8_ = auVar167._0_8_ ^ 0x8000000080000000;
                  auVar107._8_4_ = auVar167._8_4_ ^ 0x80000000;
                  auVar107._12_4_ = auVar167._12_4_ ^ 0x80000000;
                  auVar167 = vcmpss_avx(auVar167,ZEXT416(0xc2b0c0a5),1);
                  auVar144._8_4_ = 0x42b0c0a5;
                  auVar144._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar144._12_4_ = 0x42b0c0a5;
                  auVar167 = vblendvps_avx(auVar107,auVar144,auVar167);
                  fVar73 = expf(auVar167._0_4_);
                  fVar86 = 1.0 / (fVar73 + 1.0);
                  break;
                case 5:
                  fVar86 = expf(fVar73);
                  fVar86 = logf(fVar86 + 1.0);
                  fVar86 = tanhf(fVar86);
                  fVar86 = fVar86 * fVar73;
                  break;
                case 6:
                  fVar115 = *pfVar1;
                  fVar116 = -pfVar1[1] / fVar115;
                  fVar86 = 0.0;
                  if ((fVar116 <= fVar73) && (fVar86 = fVar73, fVar73 <= fVar116 + 1.0 / fVar115)) {
                    fVar86 = fVar115 * fVar73 + pfVar1[1];
                    goto LAB_002b35b5;
                  }
                }
                *(float *)local_178 = fVar86;
                local_178 = local_178 + 4;
                uVar68 = uVar68 + 1;
                iVar53 = iVar53 + 1;
              } while (uVar68 != iVar14);
            }
            iVar61 = iVar61 + 1;
          } while (iVar61 != iVar15);
        }
        local_1a0 = local_1a0 + 1;
      } while (local_1a0 != local_40);
    }
    iVar15 = local_c8.h;
    iVar14 = local_c8.w;
    pvVar72 = local_c8.data;
    if (((iVar16 == 1) && (local_154 == 1)) &&
       (pp_Var29 = this->_vptr_Deconvolution_x86_avx,
       0 < *(int *)(&this->field_0xd0 + (long)pp_Var29[-3]))) {
      iVar60 = (int)local_78 * (int)local_68;
      lVar65 = local_c8.cstep * CONCAT44(local_c8.elemsize._4_4_,(int)local_c8.elemsize);
      iVar16 = bottom_blob->w;
      local_78 = CONCAT44(local_78._4_4_,bottom_blob->h);
      uVar18 = bottom_blob->c;
      uVar63 = (ulong)(uint)local_c8.w;
      lVar58 = (long)local_c8.w;
      local_5c = -local_5c;
      local_178 = (Allocator *)0x0;
      do {
        if (0 < iVar15) {
          local_128 = (Allocator *)((long)pvVar72 + lVar65 * (long)local_178);
          pp_Var30 = this->_vptr_Deconvolution_x86_avx;
          sVar25 = (this->weight_data_tm).cstep;
          sVar26 = (this->weight_data_tm).elemsize;
          pvVar24 = (this->weight_data_tm).data;
          iVar54 = 0;
          do {
            if (0 < iVar14) {
              iVar17 = bottom_blob->w;
              pvVar64 = bottom_blob->data;
              sVar27 = bottom_blob->elemsize;
              sVar28 = bottom_blob->cstep;
              pp_Var31 = this->_vptr_Deconvolution_x86_avx;
              local_68 = CONCAT44(local_68._4_4_,local_5c);
              uVar69 = 0;
              do {
                p_Var55 = pp_Var30[-3];
                if (*(int *)(&this->field_0x10c + (long)p_Var55) == 0) {
                  auVar237 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar237 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var55) +
                                              (long)local_178 * 4));
                }
                auVar167 = auVar237._0_16_;
                if (0 < (int)uVar18) {
                  p_Var55 = pp_Var31[-3];
                  uVar71 = 0;
                  local_140 = (void *)(sVar25 * sVar26 * (long)local_178 + (long)pvVar24);
                  do {
                    if (0 < *(int *)(&this->field_0xd8 + (long)p_Var55)) {
                      iVar70 = 0;
                      do {
                        iVar51 = *(int *)(&this->field_0xe0 + (long)p_Var55) * iVar70 +
                                 (iVar54 - iVar59);
                        if (((-1 < iVar51) &&
                            (iVar52 = iVar51 / *(int *)(&this->field_0xe8 + (long)p_Var55),
                            iVar51 % *(int *)(&this->field_0xe8 + (long)p_Var55) == 0)) &&
                           (iVar52 < (int)local_78)) {
                          iVar51 = *(int *)(&this->field_0xd4 + (long)p_Var55);
                          if (0 < (long)iVar51) {
                            lVar56 = 0;
                            iVar61 = (int)local_68;
                            do {
                              if (((-1 < iVar61) &&
                                  (iVar53 = iVar61 / *(int *)(&this->field_0xe4 + (long)p_Var55),
                                  iVar61 % *(int *)(&this->field_0xe4 + (long)p_Var55) == 0)) &&
                                 (iVar53 < iVar16)) {
                                auVar237 = ZEXT464((uint)(*(float *)((long)local_140 +
                                                                    lVar56 * 4 +
                                                                    (ulong)(uint)(iVar51 * iVar70) *
                                                                    4) *
                                                          *(float *)((long)pvVar64 +
                                                                    (long)iVar53 * 4 +
                                                                    (long)iVar52 *
                                                                    (long)iVar17 * sVar27 +
                                                                    sVar28 * sVar27 * uVar71) +
                                                         auVar237._0_4_));
                              }
                              lVar56 = lVar56 + 1;
                              iVar61 = iVar61 + *(int *)(&this->field_0xdc + (long)p_Var55);
                            } while (iVar51 != lVar56);
                          }
                        }
                        iVar70 = iVar70 + 1;
                      } while (iVar70 != *(int *)(&this->field_0xd8 + (long)p_Var55));
                    }
                    auVar167 = auVar237._0_16_;
                    uVar71 = uVar71 + 1;
                    local_140 = (void *)((long)local_140 + (long)iVar60 * 4);
                  } while (uVar71 != uVar18);
                }
                p_Var55 = pp_Var30[-3];
                fVar86 = auVar167._0_4_;
                fVar73 = fVar86;
                switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var55)) {
                case 1:
                  auVar167 = vmaxss_avx(auVar167,ZEXT416(0));
                  fVar73 = auVar167._0_4_;
                  break;
                case 2:
                  auVar167 = vcmpss_avx(ZEXT816(0) << 0x40,auVar167,1);
                  auVar147._8_4_ = 0x3f800000;
                  auVar147._0_8_ = 0x3f8000003f800000;
                  auVar147._12_4_ = 0x3f800000;
                  auVar167 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var55)),
                                           auVar147,auVar167);
                  fVar73 = auVar167._0_4_ * fVar86;
                  break;
                case 3:
                  fVar86 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var55))[1];
                  auVar167 = vmaxss_avx(auVar167,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                    (long)p_Var55)));
                  fVar73 = auVar167._0_4_;
                  if (fVar86 < auVar167._0_4_) {
                    fVar73 = fVar86;
                  }
                  break;
                case 4:
                  auVar167 = vminss_avx(auVar167,ZEXT416(0x42b0c0a5));
                  auVar108._0_8_ = auVar167._0_8_ ^ 0x8000000080000000;
                  auVar108._8_4_ = auVar167._8_4_ ^ 0x80000000;
                  auVar108._12_4_ = auVar167._12_4_ ^ 0x80000000;
                  auVar167 = vcmpss_avx(auVar167,ZEXT416(0xc2b0c0a5),1);
                  auVar146._8_4_ = 0x42b0c0a5;
                  auVar146._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar146._12_4_ = 0x42b0c0a5;
                  auVar167 = vblendvps_avx(auVar108,auVar146,auVar167);
                  fVar73 = expf(auVar167._0_4_);
                  fVar73 = 1.0 / (fVar73 + 1.0);
                  break;
                case 5:
                  fVar73 = expf(fVar86);
                  fVar73 = logf(fVar73 + 1.0);
                  fVar73 = tanhf(fVar73);
                  fVar73 = fVar73 * fVar86;
                  break;
                case 6:
                  fVar115 = **(float **)(&this->field_0x118 + (long)p_Var55);
                  fVar116 = (*(float **)(&this->field_0x118 + (long)p_Var55))[1];
                  fVar222 = -fVar116 / fVar115;
                  fVar73 = 0.0;
                  if ((fVar222 <= fVar86) && (fVar73 = fVar86, fVar86 <= fVar222 + 1.0 / fVar115)) {
                    fVar73 = (fVar115 * fVar86 + fVar116) * fVar86;
                  }
                }
                *(float *)(local_128 + uVar69 * 4) = fVar73;
                uVar69 = uVar69 + 1;
                local_68 = CONCAT44(local_68._4_4_,(int)local_68 + 1);
              } while (uVar69 != uVar63);
            }
            local_128 = local_128 + lVar58 * 4;
            iVar54 = iVar54 + 1;
          } while (iVar54 != iVar15);
        }
        local_178 = (Allocator *)((long)local_178 + 1);
      } while ((long)local_178 < (long)*(int *)(&this->field_0xd0 + (long)pp_Var29[-3]));
    }
    pMVar46 = local_58;
    Deconvolution::cut_padding
              ((Deconvolution *)
               ((long)&this->_vptr_Deconvolution_x86_avx +
               (long)this->_vptr_Deconvolution_x86_avx[-3]),&local_c8,local_58,local_38);
    iVar60 = -100;
    if ((pMVar46->data != (void *)0x0) && (iVar60 = -100, (long)pMVar46->c * pMVar46->cstep != 0)) {
      iVar60 = 0;
    }
  }
  piVar23 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
  if (piVar23 != (int *)0x0) {
    LOCK();
    *piVar23 = *piVar23 + -1;
    UNLOCK();
    if (*piVar23 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_c8.data != (Allocator *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_c8.allocator + 0x18))();
      }
    }
  }
  return iVar60;
}

Assistant:

int Deconvolution_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX__

    if (elempack == 4 && out_elempack == 4)
    {
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}